

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void __thiscall
embree::SceneGraphFlattener::convertInstances
          (SceneGraphFlattener *this,
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *group,Ref<embree::SceneGraph::Node> *node,
          vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
          *spaces)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  float fVar6;
  undefined8 uVar7;
  Vector VVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  Node *pNVar11;
  size_t sVar12;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar13;
  Ref<embree::SceneGraph::Node> *pRVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  byte bVar56;
  undefined4 uVar57;
  BBox1f this_00;
  long *plVar58;
  long lVar59;
  undefined8 uVar60;
  ulong uVar61;
  ostream *poVar62;
  pointer pTVar63;
  runtime_error *prVar64;
  pointer pTVar66;
  byte bVar67;
  ulong uVar68;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  ulong extraout_RDX_14;
  ulong extraout_RDX_15;
  ulong extraout_RDX_16;
  ulong extraout_RDX_17;
  ulong extraout_RDX_18;
  ulong extraout_RDX_19;
  ulong extraout_RDX_20;
  ulong extraout_RDX_21;
  ulong extraout_RDX_22;
  size_t i;
  ulong uVar69;
  Ref<embree::SceneGraph::Node> *pRVar70;
  undefined8 *puVar71;
  long lVar72;
  size_t i_3;
  uint uVar73;
  int iVar74;
  uint uVar75;
  int iVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float local_178;
  float local_168;
  float fStack_164;
  undefined1 local_148 [16];
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> local_138;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  float fStack_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
  *local_78;
  Ref<embree::SceneGraph::Node> *local_70;
  vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
  *local_68;
  SceneGraphFlattener *local_60;
  ulong local_58;
  Node *local_50;
  undefined1 local_48 [16];
  pointer local_38;
  undefined7 uVar65;
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  
  pNVar11 = node->ptr;
  local_78 = spaces;
  local_68 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
              *)group;
  local_60 = this;
  if (pNVar11->closed == true) {
    this_00 = (BBox1f)SceneGraph::MultiTransformNode::operator_new(0x88);
    local_50 = node->ptr;
    if (local_50 != (Node *)0x0) {
      (*(local_50->super_RefCount)._vptr_RefCount[2])();
    }
    lookupGeometries((SceneGraphFlattener *)local_48,&local_60->node);
    SceneGraph::MultiTransformNode::MultiTransformNode
              ((MultiTransformNode *)this_00,local_78,(Ref<embree::SceneGraph::Node> *)local_48);
    local_148._0_8_ = this_00;
    (**(code **)(*(long *)this_00 + 0x10))(this_00);
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
    ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
              (local_68,(Ref<embree::SceneGraph::Node> *)local_148);
    if ((BBox1f)local_148._0_8_ != (BBox1f)0x0) {
      (**(code **)(*(long *)local_148._0_8_ + 0x18))();
    }
    if ((Node *)local_48._0_8_ != (Node *)0x0) {
      (*((RefCount *)local_48._0_8_)->_vptr_RefCount[3])();
    }
    if (local_50 != (Node *)0x0) {
      (*(local_50->super_RefCount)._vptr_RefCount[3])();
    }
  }
  else {
    plVar58 = (long *)__dynamic_cast(pNVar11,&SceneGraph::Node::typeinfo,
                                     &SceneGraph::TransformNode::typeinfo,0);
    if (plVar58 == (long *)0x0) {
      plVar58 = (long *)__dynamic_cast(pNVar11,&SceneGraph::Node::typeinfo,
                                       &SceneGraph::MultiTransformNode::typeinfo,0);
      if (plVar58 == (long *)0x0) {
        plVar58 = (long *)__dynamic_cast(pNVar11,&SceneGraph::Node::typeinfo,
                                         &SceneGraph::GroupNode::typeinfo,0);
        if (plVar58 != (long *)0x0) {
          (**(code **)(*plVar58 + 0x10))(plVar58);
          pRVar14 = (Ref<embree::SceneGraph::Node> *)plVar58[0xe];
          for (pRVar70 = (Ref<embree::SceneGraph::Node> *)plVar58[0xd]; pRVar70 != pRVar14;
              pRVar70 = pRVar70 + 1) {
            convertInstances(local_60,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                       *)local_68,pRVar70,local_78);
          }
          (**(code **)(*plVar58 + 0x18))(plVar58);
        }
      }
      else {
        (**(code **)(*plVar58 + 0x10))(plVar58);
        pTVar66 = (local_78->
                  super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pTVar63 = (local_78->
                  super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        local_70 = (Ref<embree::SceneGraph::Node> *)plVar58;
        if ((long)pTVar63 - (long)pTVar66 != plVar58[0xe] - plVar58[0xd]) {
          prVar64 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar64,"number of transformations does not match");
          __cxa_throw(prVar64,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_48._0_8_ = (Node *)0x0;
        local_48._8_8_ = (pointer)0x0;
        local_38 = (pointer)0x0;
        uVar69 = 0;
        while( true ) {
          pRVar70 = local_70;
          lVar59 = 0x30;
          uVar68 = ((long)pTVar63 - (long)pTVar66) % 0x30;
          if ((ulong)(((long)pTVar63 - (long)pTVar66) / 0x30) <= uVar69) break;
          pTVar63 = pTVar66 + uVar69;
          puVar71 = (undefined8 *)(*(long *)(local_70 + 0xd) + uVar69 * 0x30);
          sVar12 = pTVar66[uVar69].spaces.size_active;
          local_58 = uVar69;
          if (sVar12 == 1) {
            fVar77 = (pTVar63->time_range).lower;
            fVar79 = (pTVar63->time_range).upper;
            fVar101 = (float)*puVar71;
            fVar103 = (float)((ulong)*puVar71 >> 0x20);
            uVar73 = -(uint)(fVar77 < fVar101);
            uVar75 = -(uint)(fVar79 < fVar103);
            local_148._0_8_ =
                 CONCAT44(~uVar75 & (uint)fVar103,~uVar73 & (uint)fVar77) |
                 CONCAT44((uint)fVar79 & uVar75,(uint)fVar101 & uVar73);
            sVar12 = puVar71[2];
            uVar60 = &local_138;
            local_138.l.vy.field_0._0_8_ =
                 (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
            local_138.l.vx.field_0._0_8_ = 0;
            local_138.l.vx.field_0._8_8_ = 0;
            if (sVar12 != 0) {
              uVar60 = alignedMalloc(sVar12 << 6,0x10);
              uVar68 = extraout_RDX_11;
              local_138.l.vx.field_0._8_8_ = sVar12;
              local_138.l.vy.field_0._0_8_ = uVar60;
            }
            local_138.l.vy.field_0._8_1_ = 0;
            local_138.l.vx.field_0._0_8_ = local_138.l.vx.field_0._8_8_;
            for (uVar69 = 0; uVar73 = (uint)uVar68, uVar69 < (ulong)puVar71[2]; uVar69 = uVar69 + 1)
            {
              pAVar13 = (pTVar63->spaces).items;
              lVar72 = puVar71[4];
              bVar10 = pTVar63->quaternion;
              bVar56 = *(byte *)(puVar71 + 5);
              local_138.l.vy.field_0._8_1_ = 0;
              fVar77 = (pAVar13->l).vx.field_0.m128[0];
              uVar7 = *(undefined8 *)((long)&(pAVar13->l).vx.field_0 + 4);
              fVar79 = (float)((ulong)uVar7 >> 0x20);
              local_178 = (float)uVar7;
              if (((((fVar77 != 1.0) || (NAN(fVar77))) || (local_178 != 0.0)) ||
                  ((NAN(local_178) || (fVar79 != 0.0)))) || (NAN(fVar79))) {
LAB_00189918:
                uVar7 = *(undefined8 *)(lVar72 + -0x30 + lVar59);
                fVar103 = (float)uVar7;
                fVar111 = (float)((ulong)uVar7 >> 0x20);
                iVar74 = -(uint)(fVar103 != 1.0);
                iVar76 = -(uint)(fVar111 != 0.0);
                auVar87._4_4_ = iVar76;
                auVar87._0_4_ = iVar74;
                auVar87._8_4_ = iVar76;
                auVar87._12_4_ = iVar76;
                auVar86._8_8_ = auVar87._8_8_;
                auVar86._4_4_ = iVar74;
                auVar86._0_4_ = iVar74;
                uVar73 = movmskpd(uVar73,auVar86);
                uVar68 = (ulong)uVar73;
                fVar77 = *(float *)(lVar72 + -0x28 + lVar59);
                if ((uVar73 & 1) == 0) {
                  bVar67 = (byte)uVar73 >> 1;
                  uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67);
                  uVar68 = (ulong)uVar73;
                  if (((bVar67 == 0) && (fVar77 == 0.0)) && (!NAN(fVar77))) {
                    pfVar1 = (float *)(lVar72 + -0x24 + lVar59);
                    auVar47._4_4_ = -(uint)(pfVar1[1] != 0.0);
                    auVar47._0_4_ = -(uint)(*pfVar1 != 0.0);
                    auVar47._8_4_ = -(uint)(pfVar1[2] != 1.0);
                    auVar47._12_4_ = -(uint)(pfVar1[3] != 0.0);
                    uVar73 = movmskps(uVar73,auVar47);
                    uVar68 = (ulong)uVar73;
                    if ((((bVar56 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                       ((uVar73 & 4) == 0)) {
                      bVar67 = ((byte)uVar73 & 8) >> 3;
                      uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67);
                      uVar68 = (ulong)uVar73;
                      if (bVar67 == 0) {
                        pfVar1 = (float *)(lVar72 + -0x14 + lVar59);
                        auVar48._4_4_ = -(uint)(pfVar1[1] != 0.0);
                        auVar48._0_4_ = -(uint)(*pfVar1 != 0.0);
                        auVar48._8_4_ = -(uint)(pfVar1[2] != 0.0);
                        auVar48._12_4_ = -(uint)(pfVar1[3] != 1.0);
                        uVar73 = movmskps(uVar73,auVar48);
                        uVar68 = (ulong)uVar73;
                        if ((((bVar56 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                           ((uVar73 & 4) == 0)) {
                          bVar67 = ((byte)uVar73 & 8) >> 3;
                          uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67);
                          uVar68 = (ulong)uVar73;
                          if (bVar67 == 0) {
                            pfVar1 = (float *)(lVar72 + -4 + lVar59);
                            auVar49._4_4_ = -(uint)(pfVar1[1] != 0.0);
                            auVar49._0_4_ = -(uint)(*pfVar1 != 0.0);
                            auVar49._8_4_ = -(uint)(pfVar1[2] != 0.0);
                            auVar49._12_4_ = -(uint)(pfVar1[3] != 0.0);
                            uVar73 = movmskps(uVar73,auVar49);
                            uVar68 = (ulong)uVar73;
                            if ((((((bVar56 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                                 ((uVar73 & 4) == 0)) &&
                                (bVar67 = ((byte)uVar73 & 8) >> 3,
                                uVar68 = (ulong)CONCAT31((int3)(uVar73 >> 8),bVar67), bVar67 == 0))
                               && ((bVar56 == 0 ||
                                   ((fVar101 = *(float *)(lVar72 + 0xc + lVar59), fVar101 == 1.0 &&
                                    (!NAN(fVar101))))))) {
                              fVar113 = (pAVar13->l).vx.field_0.m128[0];
                              local_178 = (pAVar13->l).vx.field_0.m128[1];
                              fVar79 = (pAVar13->l).vx.field_0.m128[2];
                              fVar77 = (pAVar13->l).vx.field_0.m128[3];
                              fVar101 = (pAVar13->l).vy.field_0.m128[0];
                              fVar126 = *(float *)((long)&(pAVar13->l).vy.field_0 + 4);
                              fVar127 = *(float *)((long)&(pAVar13->l).vy.field_0 + 8);
                              fVar103 = *(float *)((long)&(pAVar13->l).vy.field_0 + 0xc);
                              fVar78 = (pAVar13->l).vz.field_0.m128[0];
                              fVar128 = *(float *)((long)&(pAVar13->l).vz.field_0 + 4);
                              fVar106 = *(float *)((long)&(pAVar13->l).vz.field_0 + 8);
                              fVar118 = *(float *)((long)&(pAVar13->l).vz.field_0 + 0xc);
                              fVar111 = (pAVar13->p).field_0.m128[0];
                              fVar122 = *(float *)((long)&(pAVar13->p).field_0 + 4);
                              fVar92 = *(float *)((long)&(pAVar13->p).field_0 + 8);
                              fVar107 = *(float *)((long)&(pAVar13->p).field_0 + 0xc);
                              local_138.l.vy.field_0._8_1_ = bVar10;
                              goto LAB_0018a35f;
                            }
                          }
                        }
                      }
                    }
                  }
                }
                if ((bVar10 == false) && (bVar56 == 0)) {
                  fVar139 = (pAVar13->l).vx.field_0.m128[0];
                  fVar93 = (pAVar13->l).vx.field_0.m128[1];
                  fVar94 = (pAVar13->l).vx.field_0.m128[2];
                  fVar95 = (pAVar13->l).vx.field_0.m128[3];
                  fVar96 = (pAVar13->l).vy.field_0.m128[0];
                  fVar97 = *(float *)((long)&(pAVar13->l).vy.field_0 + 4);
                  fVar98 = *(float *)((long)&(pAVar13->l).vy.field_0 + 8);
                  fVar99 = *(float *)((long)&(pAVar13->l).vy.field_0 + 0xc);
                  fVar132 = (pAVar13->l).vz.field_0.m128[0];
                  fVar100 = *(float *)((long)&(pAVar13->l).vz.field_0 + 4);
                  fVar102 = *(float *)((long)&(pAVar13->l).vz.field_0 + 8);
                  fVar137 = *(float *)((long)&(pAVar13->l).vz.field_0 + 0xc);
                  fVar113 = fVar103 * fVar139 + fVar111 * fVar96 + fVar77 * fVar132;
                  local_178 = fVar103 * fVar93 + fVar111 * fVar97 + fVar77 * fVar100;
                  fVar79 = fVar103 * fVar94 + fVar111 * fVar98 + fVar77 * fVar102;
                  fVar6 = *(float *)(lVar72 + -0x20 + lVar59);
                  fVar129 = *(float *)(lVar72 + -0x1c + lVar59);
                  fVar130 = *(float *)(lVar72 + -0x18 + lVar59);
                  fVar118 = *(float *)(lVar72 + -0x10 + lVar59);
                  fVar101 = fVar6 * fVar139 + fVar129 * fVar96 + fVar130 * fVar132;
                  fVar126 = fVar6 * fVar93 + fVar129 * fVar97 + fVar130 * fVar100;
                  fVar122 = *(float *)(lVar72 + -0xc + lVar59);
                  fVar92 = *(float *)(lVar72 + -8 + lVar59);
                  fVar78 = fVar118 * fVar139 + fVar122 * fVar96 + fVar92 * fVar132;
                  fVar128 = fVar118 * fVar93 + fVar122 * fVar97 + fVar92 * fVar100;
                  fVar106 = fVar118 * fVar94 + fVar122 * fVar98 + fVar92 * fVar102;
                  fVar107 = *(float *)(lVar72 + lVar59);
                  fVar127 = *(float *)(lVar72 + 4 + lVar59);
                  fVar136 = *(float *)(lVar72 + 8 + lVar59);
                  fVar118 = fVar118 * fVar95 + fVar122 * fVar99 + fVar92 * fVar137;
                  fVar77 = fVar103 * fVar95 + fVar111 * fVar99 + fVar77 * fVar137;
                  fVar111 = fVar107 * fVar139 + fVar127 * fVar96 + fVar136 * fVar132 +
                            (pAVar13->p).field_0.m128[0];
                  fVar122 = fVar107 * fVar93 + fVar127 * fVar97 + fVar136 * fVar100 +
                            *(float *)((long)&(pAVar13->p).field_0 + 4);
                  fVar92 = fVar107 * fVar94 + fVar127 * fVar98 + fVar136 * fVar102 +
                           *(float *)((long)&(pAVar13->p).field_0 + 8);
                  fVar107 = fVar107 * fVar95 + fVar127 * fVar99 + fVar136 * fVar137 +
                            *(float *)((long)&(pAVar13->p).field_0 + 0xc);
                  fVar127 = fVar6 * fVar94 + fVar129 * fVar98 + fVar130 * fVar102;
                  fVar103 = fVar6 * fVar95 + fVar129 * fVar99 + fVar130 * fVar137;
                }
                else if ((bVar10 == false) || (bVar56 == 0)) {
                  if ((bVar10 == false) || (bVar56 != 0)) {
                    if ((local_178 != 0.0) ||
                       ((((NAN(local_178) || (fVar79 != 0.0)) || (NAN(fVar79))) ||
                        (uVar7 = *(undefined8 *)&(pAVar13->l).vz.field_0,
                        auVar30._4_4_ = -(uint)((pAVar13->l).vy.field_0.m128[0] != 0.0),
                        auVar30._0_4_ =
                             -(uint)(*(float *)((long)&(pAVar13->l).vy.field_0 + 8) != 0.0),
                        auVar30._8_4_ = -(uint)((float)uVar7 != 0.0),
                        auVar30._12_4_ = -(uint)((float)((ulong)uVar7 >> 0x20) != 0.0),
                        uVar57 = movmskps((int)CONCAT71((int7)((ulong)uVar60 >> 8),bVar56),auVar30),
                        (char)uVar57 != '\0')))) {
                      poVar62 = std::operator<<((ostream *)&std::cout,
                                                "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                               );
                      std::endl<char,std::char_traits<char>>(poVar62);
                      uVar68 = extraout_RDX_14;
                    }
                    pfVar2 = (float *)(lVar72 + -0x30 + lVar59);
                    fVar77 = pfVar2[3];
                    pfVar3 = (float *)(lVar72 + -0x20 + lVar59);
                    fVar101 = *pfVar3;
                    fVar103 = pfVar3[3];
                    pfVar4 = (float *)(lVar72 + -0x10 + lVar59);
                    fVar78 = *pfVar4;
                    fVar128 = pfVar4[1];
                    fVar118 = pfVar4[3];
                    pfVar1 = (float *)(lVar72 + lVar59);
                    fVar111 = *pfVar1;
                    fVar122 = pfVar1[1];
                    fVar92 = pfVar1[2];
                    fVar107 = pfVar1[3];
                    uVar60 = *(undefined8 *)&(pAVar13->p).field_0;
                    fVar113 = (pAVar13->l).vx.field_0.m128[0] * *pfVar2;
                    local_178 = pfVar2[1] + (float)uVar60;
                    fVar79 = pfVar2[2] + (float)((ulong)uVar60 >> 0x20);
                    fVar127 = pfVar3[2] + *(float *)((long)&(pAVar13->p).field_0 + 8);
                    fVar126 = pfVar3[1] * *(float *)((long)&(pAVar13->l).vy.field_0 + 4);
                    fVar106 = pfVar4[2] * *(float *)((long)&(pAVar13->l).vz.field_0 + 8);
                    local_138.l.vy.field_0._8_1_ = 1;
                  }
                  else {
                    local_d8 = ZEXT416(*(uint *)((long)&(pAVar13->p).field_0 + 0xc));
                    local_b8 = ZEXT416((uint)(pAVar13->l).vx.field_0.m128[3]);
                    local_a8 = ZEXT416(*(uint *)((long)&(pAVar13->l).vy.field_0 + 0xc));
                    local_e8 = ZEXT416(*(uint *)((long)&(pAVar13->l).vz.field_0 + 0xc));
                    local_138.p.field_0.m128[0] = (pAVar13->l).vy.field_0.m128[0];
                    local_138.p.field_0.m128[1] = *(float *)((long)&(pAVar13->l).vy.field_0 + 4);
                    fStack_c0 = *(float *)((long)&(pAVar13->l).vy.field_0 + 8);
                    local_138.p.field_0.m128[3] = *(float *)((long)&(pAVar13->l).vy.field_0 + 0xc);
                    local_f8 = (pAVar13->l).vz.field_0.m128[0];
                    fStack_f4 = *(float *)((long)&(pAVar13->l).vz.field_0 + 4);
                    fStack_f0 = *(float *)((long)&(pAVar13->l).vz.field_0 + 8);
                    fStack_ec = *(float *)((long)&(pAVar13->l).vz.field_0 + 0xc);
                    local_88 = (pAVar13->l).vx.field_0.m128[0];
                    fStack_7c = (pAVar13->l).vx.field_0.m128[1];
                    pfVar1 = (float *)(lVar72 + -0x30 + lVar59);
                    fVar77 = *pfVar1;
                    fVar101 = pfVar1[1];
                    fVar103 = pfVar1[2];
                    pfVar1 = (float *)(lVar72 + -0x20 + lVar59);
                    fVar78 = *pfVar1;
                    fVar128 = pfVar1[1];
                    fVar118 = pfVar1[2];
                    puVar5 = (undefined8 *)(lVar72 + -0x10 + lVar59);
                    local_138.l.vz.field_0._0_8_ = *puVar5;
                    local_138.l.vz.field_0._8_8_ = puVar5[1];
                    pfVar1 = (float *)(lVar72 + lVar59);
                    fVar111 = *pfVar1;
                    fVar122 = pfVar1[1];
                    fVar92 = pfVar1[2];
                    fVar113 = fVar77 * local_88 +
                              fVar101 * local_138.p.field_0.m128[0] + fVar103 * local_f8;
                    fVar107 = fVar77 * 0.0 +
                              fVar101 * local_138.p.field_0.m128[1] + fVar103 * fStack_f4;
                    fVar103 = fVar77 * 0.0 + fVar101 * 0.0 + fVar103 * fStack_f0;
                    fVar101 = fVar78 * local_88 +
                              fVar128 * local_138.p.field_0.m128[0] + fVar118 * local_f8;
                    fVar126 = fVar78 * 0.0 +
                              fVar128 * local_138.p.field_0.m128[1] + fVar118 * fStack_f4;
                    fVar77 = fVar78 * 0.0 + fVar128 * 0.0 + fVar118 * fStack_f0;
                    local_138.p.field_0.m128[2] = 0.0;
                    fStack_84 = 0.0;
                    fStack_80 = 0.0;
                    local_98._0_4_ =
                         fVar111 * local_88 +
                         fVar122 * local_138.p.field_0.m128[0] + fVar92 * local_f8 +
                         (pAVar13->p).field_0.m128[0];
                    local_98._4_4_ =
                         fVar111 * 0.0 + fVar122 * local_138.p.field_0.m128[1] + fVar92 * fStack_f4
                         + *(float *)((long)&(pAVar13->p).field_0 + 4);
                    fStack_90 = fVar111 * 0.0 + fVar122 * 0.0 + fVar92 * fStack_f0 +
                                *(float *)((long)&(pAVar13->p).field_0 + 8);
                    register0x0000128c =
                         fVar111 * fStack_7c +
                         fVar122 * local_138.p.field_0.m128[3] + fVar92 * fStack_ec +
                         *(float *)((long)&(pAVar13->p).field_0 + 0xc);
                    local_c8 = local_138.p.field_0.m128[0];
                    fStack_c4 = local_138.p.field_0.m128[1];
                    fStack_bc = local_138.p.field_0.m128[3];
                    if ((((fVar107 != 0.0) || (NAN(fVar107))) ||
                        ((fVar103 != 0.0 || ((NAN(fVar103) || (fVar77 != 0.0)))))) || (NAN(fVar77)))
                    {
                      poVar62 = std::operator<<((ostream *)&std::cout,
                                                "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                               );
                      std::endl<char,std::char_traits<char>>(poVar62);
                      uVar68 = extraout_RDX_13;
                    }
                    fVar78 = local_88 * local_138.l.vz.field_0.m128[0] +
                             local_138.p.field_0.m128[0] * local_138.l.vz.field_0.m128[1] +
                             local_f8 * local_138.l.vz.field_0.m128[2];
                    fVar128 = fStack_84 * local_138.l.vz.field_0.m128[0] +
                              local_138.p.field_0.m128[1] * local_138.l.vz.field_0.m128[1] +
                              fStack_f4 * local_138.l.vz.field_0.m128[2];
                    fVar106 = fStack_80 * local_138.l.vz.field_0.m128[0] +
                              local_138.p.field_0.m128[2] * local_138.l.vz.field_0.m128[1] +
                              fStack_f0 * local_138.l.vz.field_0.m128[2];
                    local_138.l.vy.field_0._8_1_ = 1;
                    fVar118 = (float)local_e8._0_4_;
                    fVar77 = (float)local_b8._0_4_;
                    fVar111 = (float)local_98._0_4_;
                    fVar122 = (float)local_98._4_4_;
                    fVar92 = fStack_90;
                    fVar107 = (float)local_d8._0_4_;
                    fVar127 = fStack_c0;
                    fVar103 = (float)local_a8._0_4_;
                  }
                }
                else {
                  poVar62 = std::operator<<((ostream *)&std::cout,
                                            "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                           );
                  std::endl<char,std::char_traits<char>>(poVar62);
                  fVar77 = *(float *)((long)&(pAVar13->p).field_0 + 0xc);
                  fVar79 = (pAVar13->l).vx.field_0.m128[3];
                  fVar101 = *(float *)((long)&(pAVar13->l).vy.field_0 + 0xc);
                  fVar103 = *(float *)((long)&(pAVar13->l).vz.field_0 + 0xc);
                  VVar8.field_0 = (pAVar13->l).vx.field_0;
                  fVar78 = (pAVar13->l).vy.field_0.m128[0];
                  fVar128 = *(float *)((long)&(pAVar13->l).vy.field_0 + 4);
                  fVar118 = (pAVar13->l).vz.field_0.m128[0];
                  fVar111 = *(float *)((long)&(pAVar13->l).vz.field_0 + 4);
                  fVar122 = *(float *)((long)&(pAVar13->l).vz.field_0 + 8);
                  fVar130 = fVar79 * fVar101 + fVar77 * fVar103;
                  fVar113 = fVar79 * fVar101 - fVar77 * fVar103;
                  fVar126 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar101 * fVar101 +
                            -fVar103 * fVar103;
                  fVar106 = fVar77 * fVar77 - fVar79 * fVar79;
                  fVar129 = fVar101 * fVar101 + fVar106 + -fVar103 * fVar103;
                  fVar139 = fVar79 * fVar103 - fVar77 * fVar101;
                  fVar92 = fVar77 * fVar101 + fVar79 * fVar103;
                  fVar136 = fVar101 * fVar103 + fVar77 * fVar79;
                  fVar77 = fVar101 * fVar103 - fVar77 * fVar79;
                  fVar107 = (pAVar13->p).field_0.m128[0];
                  fVar127 = *(float *)((long)&(pAVar13->p).field_0 + 4);
                  fVar6 = *(float *)((long)&(pAVar13->p).field_0 + 8);
                  fVar130 = fVar130 + fVar130;
                  fVar139 = fVar139 + fVar139;
                  fVar113 = fVar113 + fVar113;
                  fVar136 = fVar136 + fVar136;
                  fVar92 = fVar92 + fVar92;
                  fVar77 = fVar77 + fVar77;
                  fVar79 = fVar103 * fVar103 + fVar106 + -fVar101 * fVar101;
                  fVar114 = fVar126 * 1.0 + fVar130 * 0.0 + fVar139 * 0.0;
                  fVar116 = fVar126 * 0.0 + fVar130 * 1.0 + fVar139 * 0.0;
                  fVar119 = fVar126 * 0.0 + fVar130 * 0.0 + fVar139 * 1.0;
                  fVar120 = fVar126 * 0.0 + fVar130 * 0.0 + fVar139 * 0.0;
                  fVar108 = fVar113 * 1.0 + fVar129 * 0.0 + fVar136 * 0.0;
                  fVar109 = fVar113 * 0.0 + fVar129 * 1.0 + fVar136 * 0.0;
                  fVar110 = fVar113 * 0.0 + fVar129 * 0.0 + fVar136 * 1.0;
                  fVar112 = fVar113 * 0.0 + fVar129 * 0.0 + fVar136 * 0.0;
                  fVar93 = fVar92 * 1.0 + fVar77 * 0.0 + fVar79 * 0.0;
                  fVar95 = fVar92 * 0.0 + fVar77 * 1.0 + fVar79 * 0.0;
                  fVar97 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 1.0;
                  fVar99 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 0.0;
                  local_168 = VVar8.field_0._4_4_;
                  fStack_164 = VVar8.field_0._8_4_;
                  local_178 = VVar8.field_0._0_4_;
                  fVar131 = local_178 * fVar114 + fVar108 * 0.0 + fVar93 * 0.0;
                  fVar133 = local_178 * fVar116 + fVar109 * 0.0 + fVar95 * 0.0;
                  fVar134 = local_178 * fVar119 + fVar110 * 0.0 + fVar97 * 0.0;
                  fVar135 = local_178 * fVar120 + fVar112 * 0.0 + fVar99 * 0.0;
                  fVar94 = fVar78 * fVar114 + fVar128 * fVar108 + fVar93 * 0.0;
                  fVar96 = fVar78 * fVar116 + fVar128 * fVar109 + fVar95 * 0.0;
                  fVar98 = fVar78 * fVar119 + fVar128 * fVar110 + fVar97 * 0.0;
                  fVar132 = fVar78 * fVar120 + fVar128 * fVar112 + fVar99 * 0.0;
                  fVar129 = fVar118 * fVar114 + fVar111 * fVar108 + fVar122 * fVar93;
                  fVar130 = fVar118 * fVar116 + fVar111 * fVar109 + fVar122 * fVar95;
                  fVar136 = fVar118 * fVar119 + fVar111 * fVar110 + fVar122 * fVar97;
                  fVar139 = fVar118 * fVar120 + fVar111 * fVar112 + fVar122 * fVar99;
                  fVar77 = *(float *)(lVar72 + 0xc + lVar59);
                  fVar79 = *(float *)(lVar72 + -0x24 + lVar59);
                  fVar101 = *(float *)(lVar72 + -0x14 + lVar59);
                  fVar103 = *(float *)(lVar72 + -4 + lVar59);
                  fVar106 = fVar79 * fVar101 + fVar77 * fVar103;
                  fVar113 = fVar79 * fVar101 - fVar77 * fVar103;
                  fVar126 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar101 * fVar101 +
                            -fVar103 * fVar103;
                  fVar128 = fVar77 * fVar77 - fVar79 * fVar79;
                  fVar138 = fVar101 * fVar101 + fVar128 + -fVar103 * fVar103;
                  fVar137 = fVar79 * fVar103 - fVar77 * fVar101;
                  fVar104 = fVar77 * fVar101 + fVar79 * fVar103;
                  fVar140 = fVar101 * fVar103 + fVar77 * fVar79;
                  fVar92 = fVar101 * fVar103 - fVar77 * fVar79;
                  pfVar2 = (float *)(lVar72 + -0x30 + lVar59);
                  fVar77 = *pfVar2;
                  pfVar3 = (float *)(lVar72 + -0x20 + lVar59);
                  fVar79 = *pfVar3;
                  fVar78 = pfVar3[1];
                  fVar123 = fVar103 * fVar103 + fVar128 + -fVar101 * fVar101;
                  pfVar1 = (float *)(lVar72 + -0x10 + lVar59);
                  fVar101 = *pfVar1;
                  fVar103 = pfVar1[1];
                  fVar128 = pfVar1[2];
                  fVar106 = fVar106 + fVar106;
                  fVar137 = fVar137 + fVar137;
                  pfVar1 = (float *)(lVar72 + lVar59);
                  fVar118 = *pfVar1;
                  fVar111 = pfVar1[1];
                  fVar122 = pfVar1[2];
                  fVar100 = fVar126 * 1.0 + fVar106 * 0.0 + fVar137 * 0.0;
                  fVar102 = fVar126 * 0.0 + fVar106 * 1.0 + fVar137 * 0.0;
                  fVar137 = fVar126 * 0.0 + fVar106 * 0.0 + fVar137 * 1.0;
                  fVar113 = fVar113 + fVar113;
                  fVar140 = fVar140 + fVar140;
                  fVar104 = fVar104 + fVar104;
                  fVar92 = fVar92 + fVar92;
                  fVar126 = fVar113 * 1.0 + fVar138 * 0.0 + fVar140 * 0.0;
                  fVar106 = fVar113 * 0.0 + fVar138 * 1.0 + fVar140 * 0.0;
                  fVar113 = fVar113 * 0.0 + fVar138 * 0.0 + fVar140 * 1.0;
                  fVar138 = fVar104 * 1.0 + fVar92 * 0.0 + fVar123 * 0.0;
                  fVar140 = fVar104 * 0.0 + fVar92 * 1.0 + fVar123 * 0.0;
                  fVar92 = fVar104 * 0.0 + fVar92 * 0.0 + fVar123 * 1.0;
                  fVar115 = fVar77 * fVar100 + fVar126 * 0.0 + fVar138 * 0.0;
                  fVar117 = fVar77 * fVar102 + fVar106 * 0.0 + fVar140 * 0.0;
                  fVar77 = fVar77 * fVar137 + fVar113 * 0.0 + fVar92 * 0.0;
                  fVar104 = fVar79 * fVar100 + fVar78 * fVar126 + fVar138 * 0.0;
                  fVar123 = fVar79 * fVar102 + fVar78 * fVar106 + fVar140 * 0.0;
                  fVar105 = fVar79 * fVar137 + fVar78 * fVar113 + fVar92 * 0.0;
                  fVar121 = fVar101 * fVar100 + fVar103 * fVar126 + fVar128 * fVar138;
                  fVar124 = fVar101 * fVar102 + fVar103 * fVar106 + fVar128 * fVar140;
                  fVar125 = fVar101 * fVar137 + fVar103 * fVar113 + fVar128 * fVar92;
                  fVar103 = fVar118 * fVar100 + fVar111 * fVar126 + fVar122 * fVar138 +
                            pfVar2[1] + 0.0;
                  fVar100 = fVar118 * fVar102 + fVar111 * fVar106 + fVar122 * fVar140 +
                            pfVar2[2] + 0.0;
                  fVar102 = fVar118 * fVar137 + fVar111 * fVar113 + fVar122 * fVar92 +
                            pfVar3[2] + 0.0;
                  fVar113 = fVar115 * fVar131 + fVar117 * fVar94 + fVar77 * fVar129;
                  local_178 = fVar115 * fVar133 + fVar117 * fVar96 + fVar77 * fVar130;
                  fVar79 = fVar115 * fVar134 + fVar117 * fVar98 + fVar77 * fVar136;
                  fVar101 = fVar104 * fVar131 + fVar123 * fVar94 + fVar105 * fVar129;
                  fVar126 = fVar104 * fVar133 + fVar123 * fVar96 + fVar105 * fVar130;
                  fVar78 = fVar121 * fVar131 + fVar124 * fVar94 + fVar125 * fVar129;
                  fVar128 = fVar121 * fVar133 + fVar124 * fVar96 + fVar125 * fVar130;
                  fVar106 = fVar121 * fVar134 + fVar124 * fVar98 + fVar125 * fVar136;
                  uVar68 = extraout_RDX_12;
                  fVar118 = fVar121 * fVar135 + fVar124 * fVar132 + fVar125 * fVar139;
                  fVar77 = fVar115 * fVar135 + fVar117 * fVar132 + fVar77 * fVar139;
                  fVar111 = fVar103 * fVar131 + fVar100 * fVar94 + fVar102 * fVar129 +
                            fVar107 * fVar114 + fVar127 * fVar108 + fVar6 * fVar93 + local_168 + 0.0
                  ;
                  fVar122 = fVar103 * fVar133 + fVar100 * fVar96 + fVar102 * fVar130 +
                            fVar107 * fVar116 + fVar127 * fVar109 + fVar6 * fVar95 +
                            fStack_164 + 0.0;
                  fVar92 = fVar103 * fVar134 + fVar100 * fVar98 + fVar102 * fVar136 +
                           fVar107 * fVar119 + fVar127 * fVar110 + fVar6 * fVar97 +
                           *(float *)((long)&(pAVar13->l).vy.field_0 + 8) + 0.0;
                  fVar107 = fVar103 * fVar135 + fVar100 * fVar132 + fVar102 * fVar139 +
                            fVar107 * fVar120 + fVar127 * fVar112 + fVar6 * fVar99 + 0.0;
                  fVar127 = fVar104 * fVar134 + fVar123 * fVar98 + fVar105 * fVar136;
                  fVar103 = fVar104 * fVar135 + fVar123 * fVar132 + fVar105 * fVar139;
                }
              }
              else {
                auVar27._4_4_ = -(uint)((pAVar13->l).vy.field_0.m128[0] != 0.0);
                auVar27._0_4_ = -(uint)((pAVar13->l).vx.field_0.m128[3] != 0.0);
                auVar27._8_4_ = -(uint)(*(float *)((long)&(pAVar13->l).vy.field_0 + 4) != 1.0);
                auVar27._12_4_ = -(uint)(*(float *)((long)&(pAVar13->l).vy.field_0 + 8) != 0.0);
                uVar73 = movmskps(uVar73,auVar27);
                if ((((bVar10 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) ||
                   (((uVar73 & 4) != 0 ||
                    (bVar67 = ((byte)uVar73 & 8) >> 3, uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67)
                    , bVar67 != 0)))) goto LAB_00189918;
                auVar28._4_4_ = -(uint)((pAVar13->l).vz.field_0.m128[0] != 0.0);
                auVar28._0_4_ = -(uint)(*(float *)((long)&(pAVar13->l).vy.field_0 + 0xc) != 0.0);
                auVar28._8_4_ = -(uint)(*(float *)((long)&(pAVar13->l).vz.field_0 + 4) != 0.0);
                auVar28._12_4_ = -(uint)(*(float *)((long)&(pAVar13->l).vz.field_0 + 8) != 1.0);
                uVar73 = movmskps(uVar73,auVar28);
                if (((((bVar10 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) || ((uVar73 & 4) != 0))
                   || (bVar67 = ((byte)uVar73 & 8) >> 3,
                      uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67), bVar67 != 0))
                goto LAB_00189918;
                auVar29._4_4_ = -(uint)((pAVar13->p).field_0.m128[0] != 0.0);
                auVar29._0_4_ = -(uint)(*(float *)((long)&(pAVar13->l).vz.field_0 + 0xc) != 0.0);
                auVar29._8_4_ = -(uint)(*(float *)((long)&(pAVar13->p).field_0 + 4) != 0.0);
                auVar29._12_4_ = -(uint)(*(float *)((long)&(pAVar13->p).field_0 + 8) != 0.0);
                uVar73 = movmskps(uVar73,auVar29);
                if ((((bVar10 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) || ((uVar73 & 4) != 0))
                goto LAB_00189918;
                bVar67 = ((byte)uVar73 & 8) >> 3;
                uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67);
                uVar68 = (ulong)uVar73;
                if ((bVar67 != 0) ||
                   ((bVar10 != false &&
                    ((fVar77 = *(float *)((long)&(pAVar13->p).field_0 + 0xc), fVar77 != 1.0 ||
                     (NAN(fVar77))))))) goto LAB_00189918;
                pfVar1 = (float *)(lVar72 + -0x30 + lVar59);
                fVar113 = *pfVar1;
                local_178 = pfVar1[1];
                fVar79 = pfVar1[2];
                fVar77 = pfVar1[3];
                pfVar1 = (float *)(lVar72 + -0x20 + lVar59);
                fVar101 = *pfVar1;
                fVar126 = pfVar1[1];
                fVar127 = pfVar1[2];
                fVar103 = pfVar1[3];
                pfVar1 = (float *)(lVar72 + -0x10 + lVar59);
                fVar78 = *pfVar1;
                fVar128 = pfVar1[1];
                fVar106 = pfVar1[2];
                fVar118 = pfVar1[3];
                pfVar1 = (float *)(lVar72 + lVar59);
                fVar111 = *pfVar1;
                fVar122 = pfVar1[1];
                fVar92 = pfVar1[2];
                fVar107 = pfVar1[3];
                local_138.l.vy.field_0._8_1_ = bVar56;
              }
LAB_0018a35f:
              pfVar1 = (float *)((long)&((Vector *)(local_138.l.vy.field_0._0_8_ + -0x30))->field_0
                                + lVar59);
              *pfVar1 = fVar113;
              pfVar1[1] = local_178;
              pfVar1[2] = fVar79;
              pfVar1[3] = fVar77;
              pfVar1 = (float *)((long)&((Vector *)(local_138.l.vy.field_0._0_8_ + -0x20))->field_0
                                + lVar59);
              *pfVar1 = fVar101;
              pfVar1[1] = fVar126;
              pfVar1[2] = fVar127;
              pfVar1[3] = fVar103;
              pfVar1 = (float *)((long)&((Vector *)(local_138.l.vy.field_0._0_8_ + -0x10))->field_0
                                + lVar59);
              *pfVar1 = fVar78;
              pfVar1[1] = fVar128;
              pfVar1[2] = fVar106;
              pfVar1[3] = fVar118;
              pfVar1 = (float *)(local_138.l.vy.field_0._0_8_ + lVar59);
              *pfVar1 = fVar111;
              pfVar1[1] = fVar122;
              pfVar1[2] = fVar92;
              pfVar1[3] = fVar107;
              lVar59 = lVar59 + 0x40;
              uVar60 = local_138.l.vy.field_0._0_8_;
            }
          }
          else if (puVar71[2] == 1) {
            fVar77 = (pTVar63->time_range).lower;
            fVar79 = (pTVar63->time_range).upper;
            fVar101 = (float)*puVar71;
            fVar103 = (float)((ulong)*puVar71 >> 0x20);
            uVar73 = -(uint)(fVar77 < fVar101);
            uVar75 = -(uint)(fVar79 < fVar103);
            local_148._0_8_ =
                 CONCAT44(~uVar75 & (uint)fVar103,~uVar73 & (uint)fVar77) |
                 CONCAT44((uint)fVar79 & uVar75,(uint)fVar101 & uVar73);
            local_138.l.vy.field_0._0_8_ =
                 (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
            local_138.l.vx.field_0._0_8_ = 0;
            local_138.l.vx.field_0._8_8_ = 0;
            if (sVar12 != 0) {
              local_138.l.vy.field_0._0_8_ = alignedMalloc(sVar12 << 6,0x10);
              uVar68 = extraout_RDX_15;
              local_138.l.vx.field_0._8_8_ = sVar12;
            }
            uVar60 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
            if (pTVar63->quaternion == false) {
              uVar60 = ZEXT48(*(uint *)(puVar71 + 5));
            }
            local_138.l.vy.field_0._8_1_ = (undefined1)uVar60;
            local_138.l.vx.field_0._0_8_ = local_138.l.vx.field_0._8_8_;
            for (uVar69 = 0; uVar73 = (uint)uVar68, uVar69 < (pTVar63->spaces).size_active;
                uVar69 = uVar69 + 1) {
              pAVar13 = (pTVar63->spaces).items;
              pfVar1 = (float *)puVar71[4];
              bVar10 = pTVar63->quaternion;
              bVar56 = *(byte *)(puVar71 + 5);
              local_138.l.vy.field_0._8_1_ = 0;
              fVar77 = *(float *)((long)pAVar13 + lVar59 + -0x30);
              uVar7 = *(undefined8 *)((long)pAVar13 + lVar59 + -0x2c);
              fVar79 = (float)((ulong)uVar7 >> 0x20);
              local_178 = (float)uVar7;
              if (((((fVar77 != 1.0) || (NAN(fVar77))) || (local_178 != 0.0)) ||
                  ((NAN(local_178) || (fVar79 != 0.0)))) || (NAN(fVar79))) {
LAB_0018a552:
                fVar103 = (float)*(undefined8 *)pfVar1;
                fVar111 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
                iVar74 = -(uint)(fVar103 != 1.0);
                iVar76 = -(uint)(fVar111 != 0.0);
                auVar89._4_4_ = iVar76;
                auVar89._0_4_ = iVar74;
                auVar89._8_4_ = iVar76;
                auVar89._12_4_ = iVar76;
                auVar88._8_8_ = auVar89._8_8_;
                auVar88._4_4_ = iVar74;
                auVar88._0_4_ = iVar74;
                uVar73 = movmskpd(uVar73,auVar88);
                uVar68 = (ulong)uVar73;
                fVar77 = pfVar1[2];
                if ((uVar73 & 1) == 0) {
                  bVar67 = (byte)uVar73 >> 1;
                  uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67);
                  uVar68 = (ulong)uVar73;
                  if (((bVar67 == 0) && (fVar77 == 0.0)) && (!NAN(fVar77))) {
                    auVar50._4_4_ = -(uint)(pfVar1[4] != 0.0);
                    auVar50._0_4_ = -(uint)(pfVar1[3] != 0.0);
                    auVar50._8_4_ = -(uint)(pfVar1[5] != 1.0);
                    auVar50._12_4_ = -(uint)(pfVar1[6] != 0.0);
                    uVar73 = movmskps(uVar73,auVar50);
                    uVar68 = (ulong)uVar73;
                    if ((((bVar56 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                       ((uVar73 & 4) == 0)) {
                      bVar67 = ((byte)uVar73 & 8) >> 3;
                      uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67);
                      uVar68 = (ulong)uVar73;
                      if (bVar67 == 0) {
                        auVar51._4_4_ = -(uint)(pfVar1[8] != 0.0);
                        auVar51._0_4_ = -(uint)(pfVar1[7] != 0.0);
                        auVar51._8_4_ = -(uint)(pfVar1[9] != 0.0);
                        auVar51._12_4_ = -(uint)(pfVar1[10] != 1.0);
                        uVar73 = movmskps(uVar73,auVar51);
                        uVar68 = (ulong)uVar73;
                        if ((((bVar56 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                           ((uVar73 & 4) == 0)) {
                          bVar67 = ((byte)uVar73 & 8) >> 3;
                          uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67);
                          uVar68 = (ulong)uVar73;
                          if (bVar67 == 0) {
                            auVar52._4_4_ = -(uint)(pfVar1[0xc] != 0.0);
                            auVar52._0_4_ = -(uint)(pfVar1[0xb] != 0.0);
                            auVar52._8_4_ = -(uint)(pfVar1[0xd] != 0.0);
                            auVar52._12_4_ = -(uint)(pfVar1[0xe] != 0.0);
                            uVar73 = movmskps(uVar73,auVar52);
                            uVar68 = (ulong)uVar73;
                            if (((((bVar56 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                                ((uVar73 & 4) == 0)) &&
                               ((bVar67 = ((byte)uVar73 & 8) >> 3,
                                uVar68 = (ulong)CONCAT31((int3)(uVar73 >> 8),bVar67), bVar67 == 0 &&
                                ((bVar56 == 0 || ((pfVar1[0xf] == 1.0 && (!NAN(pfVar1[0xf])))))))))
                            {
                              pfVar1 = (float *)((long)pAVar13 + lVar59 + -0x30);
                              fVar113 = *pfVar1;
                              local_178 = pfVar1[1];
                              fVar79 = pfVar1[2];
                              fVar77 = pfVar1[3];
                              pfVar1 = (float *)((long)pAVar13 + lVar59 + -0x20);
                              fVar101 = *pfVar1;
                              fVar126 = pfVar1[1];
                              fVar127 = pfVar1[2];
                              fVar103 = pfVar1[3];
                              pfVar1 = (float *)((long)pAVar13 + lVar59 + -0x10);
                              fVar78 = *pfVar1;
                              fVar128 = pfVar1[1];
                              fVar106 = pfVar1[2];
                              fVar118 = pfVar1[3];
                              pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar59);
                              fVar111 = *pfVar1;
                              fVar122 = pfVar1[1];
                              fVar92 = pfVar1[2];
                              fVar107 = pfVar1[3];
                              local_138.l.vy.field_0._8_1_ = bVar10;
                              goto LAB_0018afb1;
                            }
                          }
                        }
                      }
                    }
                  }
                }
                if ((bVar10 == false) && (bVar56 == 0)) {
                  pfVar2 = (float *)((long)pAVar13 + lVar59 + -0x30);
                  fVar139 = *pfVar2;
                  fVar93 = pfVar2[1];
                  fVar94 = pfVar2[2];
                  fVar95 = pfVar2[3];
                  pfVar2 = (float *)((long)pAVar13 + lVar59 + -0x20);
                  fVar96 = *pfVar2;
                  fVar97 = pfVar2[1];
                  fVar98 = pfVar2[2];
                  fVar99 = pfVar2[3];
                  pfVar2 = (float *)((long)pAVar13 + lVar59 + -0x10);
                  fVar132 = *pfVar2;
                  fVar100 = pfVar2[1];
                  fVar102 = pfVar2[2];
                  fVar137 = pfVar2[3];
                  fVar113 = fVar103 * fVar139 + fVar111 * fVar96 + fVar77 * fVar132;
                  local_178 = fVar103 * fVar93 + fVar111 * fVar97 + fVar77 * fVar100;
                  fVar79 = fVar103 * fVar94 + fVar111 * fVar98 + fVar77 * fVar102;
                  fVar6 = pfVar1[4];
                  fVar129 = pfVar1[5];
                  fVar130 = pfVar1[6];
                  fVar118 = pfVar1[8];
                  fVar101 = fVar6 * fVar139 + fVar129 * fVar96 + fVar130 * fVar132;
                  fVar126 = fVar6 * fVar93 + fVar129 * fVar97 + fVar130 * fVar100;
                  fVar122 = pfVar1[9];
                  fVar92 = pfVar1[10];
                  fVar78 = fVar118 * fVar139 + fVar122 * fVar96 + fVar92 * fVar132;
                  fVar128 = fVar118 * fVar93 + fVar122 * fVar97 + fVar92 * fVar100;
                  fVar106 = fVar118 * fVar94 + fVar122 * fVar98 + fVar92 * fVar102;
                  fVar107 = pfVar1[0xc];
                  fVar127 = pfVar1[0xd];
                  fVar136 = pfVar1[0xe];
                  pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar59);
                  fVar118 = fVar118 * fVar95 + fVar122 * fVar99 + fVar92 * fVar137;
                  fVar77 = fVar103 * fVar95 + fVar111 * fVar99 + fVar77 * fVar137;
                  fVar111 = fVar107 * fVar139 + fVar127 * fVar96 + fVar136 * fVar132 + *pfVar1;
                  fVar122 = fVar107 * fVar93 + fVar127 * fVar97 + fVar136 * fVar100 + pfVar1[1];
                  fVar92 = fVar107 * fVar94 + fVar127 * fVar98 + fVar136 * fVar102 + pfVar1[2];
                  fVar107 = fVar107 * fVar95 + fVar127 * fVar99 + fVar136 * fVar137 + pfVar1[3];
                  fVar127 = fVar6 * fVar94 + fVar129 * fVar98 + fVar130 * fVar102;
                  fVar103 = fVar6 * fVar95 + fVar129 * fVar99 + fVar130 * fVar137;
                }
                else if ((bVar10 == false) || (bVar56 == 0)) {
                  if ((bVar10 == false) || (bVar56 != 0)) {
                    if ((local_178 != 0.0) ||
                       ((((NAN(local_178) || (fVar79 != 0.0)) || (NAN(fVar79))) ||
                        (uVar7 = *(undefined8 *)((long)pAVar13 + lVar59 + -0x10),
                        auVar34._4_4_ = -(uint)(*(float *)((long)pAVar13 + lVar59 + -0x20) != 0.0),
                        auVar34._0_4_ = -(uint)(*(float *)((long)pAVar13 + lVar59 + -0x18) != 0.0),
                        auVar34._8_4_ = -(uint)((float)uVar7 != 0.0),
                        auVar34._12_4_ = -(uint)((float)((ulong)uVar7 >> 0x20) != 0.0),
                        uVar57 = movmskps((int)CONCAT71((int7)((ulong)uVar60 >> 8),bVar56),auVar34),
                        (char)uVar57 != '\0')))) {
                      poVar62 = std::operator<<((ostream *)&std::cout,
                                                "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                               );
                      std::endl<char,std::char_traits<char>>(poVar62);
                      uVar68 = extraout_RDX_18;
                    }
                    fVar77 = pfVar1[3];
                    fVar101 = pfVar1[4];
                    fVar103 = pfVar1[7];
                    fVar78 = pfVar1[8];
                    fVar128 = pfVar1[9];
                    fVar118 = pfVar1[0xb];
                    fVar111 = pfVar1[0xc];
                    fVar122 = pfVar1[0xd];
                    fVar92 = pfVar1[0xe];
                    fVar107 = pfVar1[0xf];
                    uVar60 = *(undefined8 *)((long)&(pAVar13->l).vx.field_0 + lVar59);
                    fVar113 = *(float *)((long)pAVar13 + lVar59 + -0x30) * *pfVar1;
                    local_178 = pfVar1[1] + (float)uVar60;
                    fVar79 = pfVar1[2] + (float)((ulong)uVar60 >> 0x20);
                    fVar127 = pfVar1[6] + *(float *)((long)&(pAVar13->l).vx.field_0 + lVar59 + 8);
                    fVar126 = pfVar1[5] * *(float *)((long)pAVar13 + lVar59 + -0x1c);
                    fVar106 = pfVar1[10] * *(float *)((long)pAVar13 + lVar59 + -8);
                    local_138.l.vy.field_0._8_1_ = 1;
                  }
                  else {
                    local_d8 = ZEXT416(*(uint *)((long)&(pAVar13->l).vx.field_0 + lVar59 + 0xc));
                    local_b8 = ZEXT416(*(uint *)((long)pAVar13 + lVar59 + -0x24));
                    local_a8 = ZEXT416(*(uint *)((long)pAVar13 + lVar59 + -0x14));
                    local_e8 = ZEXT416(*(uint *)((long)pAVar13 + lVar59 + -4));
                    pfVar2 = (float *)((long)pAVar13 + lVar59 + -0x20);
                    local_138.p.field_0.m128[0] = *pfVar2;
                    local_138.p.field_0.m128[1] = pfVar2[1];
                    fStack_c0 = pfVar2[2];
                    local_138.p.field_0.m128[3] = pfVar2[3];
                    pfVar2 = (float *)((long)pAVar13 + lVar59 + -0x10);
                    local_f8 = *pfVar2;
                    fStack_f4 = pfVar2[1];
                    fStack_f0 = pfVar2[2];
                    fStack_ec = pfVar2[3];
                    pfVar2 = (float *)((long)pAVar13 + lVar59 + -0x30);
                    local_88 = *pfVar2;
                    fStack_7c = pfVar2[1];
                    fVar77 = *pfVar1;
                    fVar101 = pfVar1[1];
                    fVar103 = pfVar1[2];
                    fVar78 = pfVar1[4];
                    fVar128 = pfVar1[5];
                    fVar118 = pfVar1[6];
                    local_138.l.vz.field_0._0_8_ = *(undefined8 *)(pfVar1 + 8);
                    local_138.l.vz.field_0._8_8_ = *(undefined8 *)(pfVar1 + 10);
                    fVar111 = pfVar1[0xc];
                    fVar122 = pfVar1[0xd];
                    fVar92 = pfVar1[0xe];
                    fVar113 = fVar77 * local_88 +
                              fVar101 * local_138.p.field_0.m128[0] + fVar103 * local_f8;
                    fVar107 = fVar77 * 0.0 +
                              fVar101 * local_138.p.field_0.m128[1] + fVar103 * fStack_f4;
                    fVar103 = fVar77 * 0.0 + fVar101 * 0.0 + fVar103 * fStack_f0;
                    fVar101 = fVar78 * local_88 +
                              fVar128 * local_138.p.field_0.m128[0] + fVar118 * local_f8;
                    fVar126 = fVar78 * 0.0 +
                              fVar128 * local_138.p.field_0.m128[1] + fVar118 * fStack_f4;
                    fVar77 = fVar78 * 0.0 + fVar128 * 0.0 + fVar118 * fStack_f0;
                    local_138.p.field_0.m128[2] = 0.0;
                    fStack_84 = 0.0;
                    fStack_80 = 0.0;
                    pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar59);
                    local_98._0_4_ =
                         fVar111 * local_88 +
                         fVar122 * local_138.p.field_0.m128[0] + fVar92 * local_f8 + *pfVar1;
                    local_98._4_4_ =
                         fVar111 * 0.0 + fVar122 * local_138.p.field_0.m128[1] + fVar92 * fStack_f4
                         + pfVar1[1];
                    fStack_90 = fVar111 * 0.0 + fVar122 * 0.0 + fVar92 * fStack_f0 + pfVar1[2];
                    register0x0000128c =
                         fVar111 * fStack_7c +
                         fVar122 * local_138.p.field_0.m128[3] + fVar92 * fStack_ec + pfVar1[3];
                    local_c8 = local_138.p.field_0.m128[0];
                    fStack_c4 = local_138.p.field_0.m128[1];
                    fStack_bc = local_138.p.field_0.m128[3];
                    if ((((fVar107 != 0.0) || (NAN(fVar107))) ||
                        ((fVar103 != 0.0 || ((NAN(fVar103) || (fVar77 != 0.0)))))) || (NAN(fVar77)))
                    {
                      poVar62 = std::operator<<((ostream *)&std::cout,
                                                "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                               );
                      std::endl<char,std::char_traits<char>>(poVar62);
                      uVar68 = extraout_RDX_17;
                    }
                    fVar78 = local_88 * local_138.l.vz.field_0.m128[0] +
                             local_138.p.field_0.m128[0] * local_138.l.vz.field_0.m128[1] +
                             local_f8 * local_138.l.vz.field_0.m128[2];
                    fVar128 = fStack_84 * local_138.l.vz.field_0.m128[0] +
                              local_138.p.field_0.m128[1] * local_138.l.vz.field_0.m128[1] +
                              fStack_f4 * local_138.l.vz.field_0.m128[2];
                    fVar106 = fStack_80 * local_138.l.vz.field_0.m128[0] +
                              local_138.p.field_0.m128[2] * local_138.l.vz.field_0.m128[1] +
                              fStack_f0 * local_138.l.vz.field_0.m128[2];
                    local_138.l.vy.field_0._8_1_ = 1;
                    fVar118 = (float)local_e8._0_4_;
                    fVar77 = (float)local_b8._0_4_;
                    fVar111 = (float)local_98._0_4_;
                    fVar122 = (float)local_98._4_4_;
                    fVar92 = fStack_90;
                    fVar107 = (float)local_d8._0_4_;
                    fVar127 = fStack_c0;
                    fVar103 = (float)local_a8._0_4_;
                  }
                }
                else {
                  poVar62 = std::operator<<((ostream *)&std::cout,
                                            "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                           );
                  std::endl<char,std::char_traits<char>>(poVar62);
                  fVar77 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar59 + 0xc);
                  fVar79 = *(float *)((long)pAVar13 + lVar59 + -0x24);
                  fVar101 = *(float *)((long)pAVar13 + lVar59 + -0x14);
                  fVar103 = *(float *)((long)pAVar13 + lVar59 + -4);
                  auVar9 = *(undefined1 (*) [16])((long)pAVar13 + lVar59 + -0x30);
                  pfVar2 = (float *)((long)pAVar13 + lVar59 + -0x20);
                  fVar78 = *pfVar2;
                  fVar128 = pfVar2[1];
                  pfVar3 = (float *)((long)pAVar13 + lVar59 + -0x10);
                  fVar118 = *pfVar3;
                  fVar111 = pfVar3[1];
                  fVar122 = pfVar3[2];
                  fVar130 = fVar79 * fVar101 + fVar77 * fVar103;
                  fVar113 = fVar79 * fVar101 - fVar77 * fVar103;
                  fVar126 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar101 * fVar101 +
                            -fVar103 * fVar103;
                  fVar106 = fVar77 * fVar77 - fVar79 * fVar79;
                  fVar129 = fVar101 * fVar101 + fVar106 + -fVar103 * fVar103;
                  fVar139 = fVar79 * fVar103 - fVar77 * fVar101;
                  fVar92 = fVar77 * fVar101 + fVar79 * fVar103;
                  fVar136 = fVar101 * fVar103 + fVar77 * fVar79;
                  fVar77 = fVar101 * fVar103 - fVar77 * fVar79;
                  pfVar3 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar59);
                  fVar107 = *pfVar3;
                  fVar127 = pfVar3[1];
                  fVar6 = pfVar3[2];
                  fVar130 = fVar130 + fVar130;
                  fVar139 = fVar139 + fVar139;
                  fVar113 = fVar113 + fVar113;
                  fVar136 = fVar136 + fVar136;
                  fVar92 = fVar92 + fVar92;
                  fVar77 = fVar77 + fVar77;
                  fVar79 = fVar103 * fVar103 + fVar106 + -fVar101 * fVar101;
                  fVar114 = fVar126 * 1.0 + fVar130 * 0.0 + fVar139 * 0.0;
                  fVar116 = fVar126 * 0.0 + fVar130 * 1.0 + fVar139 * 0.0;
                  fVar119 = fVar126 * 0.0 + fVar130 * 0.0 + fVar139 * 1.0;
                  fVar120 = fVar126 * 0.0 + fVar130 * 0.0 + fVar139 * 0.0;
                  fVar108 = fVar113 * 1.0 + fVar129 * 0.0 + fVar136 * 0.0;
                  fVar109 = fVar113 * 0.0 + fVar129 * 1.0 + fVar136 * 0.0;
                  fVar110 = fVar113 * 0.0 + fVar129 * 0.0 + fVar136 * 1.0;
                  fVar112 = fVar113 * 0.0 + fVar129 * 0.0 + fVar136 * 0.0;
                  fVar93 = fVar92 * 1.0 + fVar77 * 0.0 + fVar79 * 0.0;
                  fVar95 = fVar92 * 0.0 + fVar77 * 1.0 + fVar79 * 0.0;
                  fVar97 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 1.0;
                  fVar99 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 0.0;
                  local_168 = auVar9._4_4_;
                  fStack_164 = auVar9._8_4_;
                  local_178 = auVar9._0_4_;
                  fVar131 = local_178 * fVar114 + fVar108 * 0.0 + fVar93 * 0.0;
                  fVar133 = local_178 * fVar116 + fVar109 * 0.0 + fVar95 * 0.0;
                  fVar134 = local_178 * fVar119 + fVar110 * 0.0 + fVar97 * 0.0;
                  fVar135 = local_178 * fVar120 + fVar112 * 0.0 + fVar99 * 0.0;
                  fVar94 = fVar78 * fVar114 + fVar128 * fVar108 + fVar93 * 0.0;
                  fVar96 = fVar78 * fVar116 + fVar128 * fVar109 + fVar95 * 0.0;
                  fVar98 = fVar78 * fVar119 + fVar128 * fVar110 + fVar97 * 0.0;
                  fVar132 = fVar78 * fVar120 + fVar128 * fVar112 + fVar99 * 0.0;
                  fVar129 = fVar118 * fVar114 + fVar111 * fVar108 + fVar122 * fVar93;
                  fVar130 = fVar118 * fVar116 + fVar111 * fVar109 + fVar122 * fVar95;
                  fVar136 = fVar118 * fVar119 + fVar111 * fVar110 + fVar122 * fVar97;
                  fVar139 = fVar118 * fVar120 + fVar111 * fVar112 + fVar122 * fVar99;
                  fVar77 = pfVar1[0xf];
                  fVar79 = pfVar1[3];
                  fVar101 = pfVar1[7];
                  fVar103 = pfVar1[0xb];
                  fVar106 = fVar79 * fVar101 + fVar77 * fVar103;
                  fVar113 = fVar79 * fVar101 - fVar77 * fVar103;
                  fVar126 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar101 * fVar101 +
                            -fVar103 * fVar103;
                  fVar128 = fVar77 * fVar77 - fVar79 * fVar79;
                  fVar138 = fVar101 * fVar101 + fVar128 + -fVar103 * fVar103;
                  fVar137 = fVar79 * fVar103 - fVar77 * fVar101;
                  fVar104 = fVar77 * fVar101 + fVar79 * fVar103;
                  fVar140 = fVar101 * fVar103 + fVar77 * fVar79;
                  fVar92 = fVar101 * fVar103 - fVar77 * fVar79;
                  fVar77 = *pfVar1;
                  fVar79 = pfVar1[4];
                  fVar78 = pfVar1[5];
                  fVar123 = fVar103 * fVar103 + fVar128 + -fVar101 * fVar101;
                  fVar101 = pfVar1[8];
                  fVar103 = pfVar1[9];
                  fVar128 = pfVar1[10];
                  fVar106 = fVar106 + fVar106;
                  fVar137 = fVar137 + fVar137;
                  fVar118 = pfVar1[0xc];
                  fVar111 = pfVar1[0xd];
                  fVar122 = pfVar1[0xe];
                  fVar100 = fVar126 * 1.0 + fVar106 * 0.0 + fVar137 * 0.0;
                  fVar102 = fVar126 * 0.0 + fVar106 * 1.0 + fVar137 * 0.0;
                  fVar137 = fVar126 * 0.0 + fVar106 * 0.0 + fVar137 * 1.0;
                  fVar113 = fVar113 + fVar113;
                  fVar140 = fVar140 + fVar140;
                  fVar104 = fVar104 + fVar104;
                  fVar92 = fVar92 + fVar92;
                  fVar126 = fVar113 * 1.0 + fVar138 * 0.0 + fVar140 * 0.0;
                  fVar106 = fVar113 * 0.0 + fVar138 * 1.0 + fVar140 * 0.0;
                  fVar113 = fVar113 * 0.0 + fVar138 * 0.0 + fVar140 * 1.0;
                  fVar138 = fVar104 * 1.0 + fVar92 * 0.0 + fVar123 * 0.0;
                  fVar140 = fVar104 * 0.0 + fVar92 * 1.0 + fVar123 * 0.0;
                  fVar92 = fVar104 * 0.0 + fVar92 * 0.0 + fVar123 * 1.0;
                  fVar115 = fVar77 * fVar100 + fVar126 * 0.0 + fVar138 * 0.0;
                  fVar117 = fVar77 * fVar102 + fVar106 * 0.0 + fVar140 * 0.0;
                  fVar77 = fVar77 * fVar137 + fVar113 * 0.0 + fVar92 * 0.0;
                  fVar104 = fVar79 * fVar100 + fVar78 * fVar126 + fVar138 * 0.0;
                  fVar123 = fVar79 * fVar102 + fVar78 * fVar106 + fVar140 * 0.0;
                  fVar105 = fVar79 * fVar137 + fVar78 * fVar113 + fVar92 * 0.0;
                  fVar121 = fVar101 * fVar100 + fVar103 * fVar126 + fVar128 * fVar138;
                  fVar124 = fVar101 * fVar102 + fVar103 * fVar106 + fVar128 * fVar140;
                  fVar125 = fVar101 * fVar137 + fVar103 * fVar113 + fVar128 * fVar92;
                  fVar103 = fVar118 * fVar100 + fVar111 * fVar126 + fVar122 * fVar138 +
                            pfVar1[1] + 0.0;
                  fVar100 = fVar118 * fVar102 + fVar111 * fVar106 + fVar122 * fVar140 +
                            pfVar1[2] + 0.0;
                  fVar102 = fVar118 * fVar137 + fVar111 * fVar113 + fVar122 * fVar92 +
                            pfVar1[6] + 0.0;
                  fVar113 = fVar115 * fVar131 + fVar117 * fVar94 + fVar77 * fVar129;
                  local_178 = fVar115 * fVar133 + fVar117 * fVar96 + fVar77 * fVar130;
                  fVar79 = fVar115 * fVar134 + fVar117 * fVar98 + fVar77 * fVar136;
                  fVar101 = fVar104 * fVar131 + fVar123 * fVar94 + fVar105 * fVar129;
                  fVar126 = fVar104 * fVar133 + fVar123 * fVar96 + fVar105 * fVar130;
                  fVar78 = fVar121 * fVar131 + fVar124 * fVar94 + fVar125 * fVar129;
                  fVar128 = fVar121 * fVar133 + fVar124 * fVar96 + fVar125 * fVar130;
                  fVar106 = fVar121 * fVar134 + fVar124 * fVar98 + fVar125 * fVar136;
                  uVar68 = extraout_RDX_16;
                  fVar118 = fVar121 * fVar135 + fVar124 * fVar132 + fVar125 * fVar139;
                  fVar77 = fVar115 * fVar135 + fVar117 * fVar132 + fVar77 * fVar139;
                  fVar111 = fVar103 * fVar131 + fVar100 * fVar94 + fVar102 * fVar129 +
                            fVar107 * fVar114 + fVar127 * fVar108 + fVar6 * fVar93 + local_168 + 0.0
                  ;
                  fVar122 = fVar103 * fVar133 + fVar100 * fVar96 + fVar102 * fVar130 +
                            fVar107 * fVar116 + fVar127 * fVar109 + fVar6 * fVar95 +
                            fStack_164 + 0.0;
                  fVar92 = fVar103 * fVar134 + fVar100 * fVar98 + fVar102 * fVar136 +
                           fVar107 * fVar119 + fVar127 * fVar110 + fVar6 * fVar97 + pfVar2[2] + 0.0;
                  fVar107 = fVar103 * fVar135 + fVar100 * fVar132 + fVar102 * fVar139 +
                            fVar107 * fVar120 + fVar127 * fVar112 + fVar6 * fVar99 + 0.0;
                  fVar127 = fVar104 * fVar134 + fVar123 * fVar98 + fVar105 * fVar136;
                  fVar103 = fVar104 * fVar135 + fVar123 * fVar132 + fVar105 * fVar139;
                }
              }
              else {
                pfVar2 = (float *)((long)pAVar13 + lVar59 + -0x24);
                auVar31._4_4_ = -(uint)(pfVar2[1] != 0.0);
                auVar31._0_4_ = -(uint)(*pfVar2 != 0.0);
                auVar31._8_4_ = -(uint)(pfVar2[2] != 1.0);
                auVar31._12_4_ = -(uint)(pfVar2[3] != 0.0);
                uVar73 = movmskps(uVar73,auVar31);
                if ((((bVar10 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) ||
                   (((uVar73 & 4) != 0 ||
                    (bVar67 = ((byte)uVar73 & 8) >> 3, uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67)
                    , bVar67 != 0)))) goto LAB_0018a552;
                pfVar2 = (float *)((long)pAVar13 + lVar59 + -0x14);
                auVar32._4_4_ = -(uint)(pfVar2[1] != 0.0);
                auVar32._0_4_ = -(uint)(*pfVar2 != 0.0);
                auVar32._8_4_ = -(uint)(pfVar2[2] != 0.0);
                auVar32._12_4_ = -(uint)(pfVar2[3] != 1.0);
                uVar73 = movmskps(uVar73,auVar32);
                if (((((bVar10 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) || ((uVar73 & 4) != 0))
                   || (bVar67 = ((byte)uVar73 & 8) >> 3,
                      uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67), bVar67 != 0))
                goto LAB_0018a552;
                pfVar2 = (float *)((long)pAVar13 + lVar59 + -4);
                auVar33._4_4_ = -(uint)(pfVar2[1] != 0.0);
                auVar33._0_4_ = -(uint)(*pfVar2 != 0.0);
                auVar33._8_4_ = -(uint)(pfVar2[2] != 0.0);
                auVar33._12_4_ = -(uint)(pfVar2[3] != 0.0);
                uVar73 = movmskps(uVar73,auVar33);
                if ((((bVar10 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) || ((uVar73 & 4) != 0))
                goto LAB_0018a552;
                bVar67 = ((byte)uVar73 & 8) >> 3;
                uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67);
                uVar68 = (ulong)uVar73;
                if ((bVar67 != 0) ||
                   ((bVar10 != false &&
                    ((fVar77 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar59 + 0xc),
                     fVar77 != 1.0 || (NAN(fVar77))))))) goto LAB_0018a552;
                fVar113 = *pfVar1;
                local_178 = pfVar1[1];
                fVar79 = pfVar1[2];
                fVar77 = pfVar1[3];
                fVar101 = pfVar1[4];
                fVar126 = pfVar1[5];
                fVar127 = pfVar1[6];
                fVar103 = pfVar1[7];
                fVar78 = pfVar1[8];
                fVar128 = pfVar1[9];
                fVar106 = pfVar1[10];
                fVar118 = pfVar1[0xb];
                fVar111 = pfVar1[0xc];
                fVar122 = pfVar1[0xd];
                fVar92 = pfVar1[0xe];
                fVar107 = pfVar1[0xf];
                local_138.l.vy.field_0._8_1_ = bVar56;
              }
LAB_0018afb1:
              pfVar1 = (float *)((long)&((Vector *)(local_138.l.vy.field_0._0_8_ + -0x30))->field_0
                                + lVar59);
              *pfVar1 = fVar113;
              pfVar1[1] = local_178;
              pfVar1[2] = fVar79;
              pfVar1[3] = fVar77;
              pfVar1 = (float *)((long)&((Vector *)(local_138.l.vy.field_0._0_8_ + -0x20))->field_0
                                + lVar59);
              *pfVar1 = fVar101;
              pfVar1[1] = fVar126;
              pfVar1[2] = fVar127;
              pfVar1[3] = fVar103;
              pfVar1 = (float *)((long)&((Vector *)(local_138.l.vy.field_0._0_8_ + -0x10))->field_0
                                + lVar59);
              *pfVar1 = fVar78;
              pfVar1[1] = fVar128;
              pfVar1[2] = fVar106;
              pfVar1[3] = fVar118;
              pfVar1 = (float *)(local_138.l.vy.field_0._0_8_ + lVar59);
              *pfVar1 = fVar111;
              pfVar1[1] = fVar122;
              pfVar1[2] = fVar92;
              pfVar1[3] = fVar107;
              lVar59 = lVar59 + 0x40;
              uVar60 = local_138.l.vy.field_0._0_8_;
            }
          }
          else {
            if (sVar12 != puVar71[2]) {
              prVar64 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar64,"number of transformations does not match");
              __cxa_throw(prVar64,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            fVar77 = (pTVar63->time_range).lower;
            fVar79 = (pTVar63->time_range).upper;
            fVar101 = (float)*puVar71;
            fVar103 = (float)((ulong)*puVar71 >> 0x20);
            uVar73 = -(uint)(fVar77 < fVar101);
            uVar75 = -(uint)(fVar79 < fVar103);
            local_148._0_8_ =
                 CONCAT44(~uVar75 & (uint)fVar103,~uVar73 & (uint)fVar77) |
                 CONCAT44((uint)fVar79 & uVar75,(uint)fVar101 & uVar73);
            local_138.l.vy.field_0._0_8_ =
                 (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
            local_138.l.vx.field_0._0_8_ = 0;
            local_138.l.vx.field_0._8_8_ = 0;
            if (sVar12 != 0) {
              local_138.l.vy.field_0._0_8_ = alignedMalloc(sVar12 << 6,0x10);
              uVar68 = extraout_RDX_19;
              local_138.l.vx.field_0._8_8_ = sVar12;
            }
            uVar60 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
            if (pTVar63->quaternion == false) {
              uVar60 = ZEXT48(*(uint *)(puVar71 + 5));
            }
            local_138.l.vy.field_0._8_1_ = (undefined1)uVar60;
            local_138.l.vx.field_0._0_8_ = local_138.l.vx.field_0._8_8_;
            for (uVar69 = 0; uVar73 = (uint)uVar68, uVar69 < (pTVar63->spaces).size_active;
                uVar69 = uVar69 + 1) {
              pAVar13 = (pTVar63->spaces).items;
              lVar72 = puVar71[4];
              bVar10 = pTVar63->quaternion;
              bVar56 = *(byte *)(puVar71 + 5);
              local_138.l.vy.field_0._8_1_ = 0;
              fVar77 = *(float *)((long)pAVar13 + lVar59 + -0x30);
              uVar7 = *(undefined8 *)((long)pAVar13 + lVar59 + -0x2c);
              fVar79 = (float)((ulong)uVar7 >> 0x20);
              local_178 = (float)uVar7;
              if (((((fVar77 != 1.0) || (NAN(fVar77))) || (local_178 != 0.0)) ||
                  ((NAN(local_178) || (fVar79 != 0.0)))) || (NAN(fVar79))) {
LAB_0018b19e:
                uVar7 = *(undefined8 *)(lVar72 + -0x30 + lVar59);
                fVar103 = (float)uVar7;
                fVar111 = (float)((ulong)uVar7 >> 0x20);
                iVar74 = -(uint)(fVar103 != 1.0);
                iVar76 = -(uint)(fVar111 != 0.0);
                auVar91._4_4_ = iVar76;
                auVar91._0_4_ = iVar74;
                auVar91._8_4_ = iVar76;
                auVar91._12_4_ = iVar76;
                auVar90._8_8_ = auVar91._8_8_;
                auVar90._4_4_ = iVar74;
                auVar90._0_4_ = iVar74;
                uVar73 = movmskpd(uVar73,auVar90);
                uVar68 = (ulong)uVar73;
                fVar77 = *(float *)(lVar72 + -0x28 + lVar59);
                if ((uVar73 & 1) == 0) {
                  bVar67 = (byte)uVar73 >> 1;
                  uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67);
                  uVar68 = (ulong)uVar73;
                  if (((bVar67 == 0) && (fVar77 == 0.0)) && (!NAN(fVar77))) {
                    pfVar1 = (float *)(lVar72 + -0x24 + lVar59);
                    auVar53._4_4_ = -(uint)(pfVar1[1] != 0.0);
                    auVar53._0_4_ = -(uint)(*pfVar1 != 0.0);
                    auVar53._8_4_ = -(uint)(pfVar1[2] != 1.0);
                    auVar53._12_4_ = -(uint)(pfVar1[3] != 0.0);
                    uVar73 = movmskps(uVar73,auVar53);
                    uVar68 = (ulong)uVar73;
                    if ((((bVar56 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                       ((uVar73 & 4) == 0)) {
                      bVar67 = ((byte)uVar73 & 8) >> 3;
                      uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67);
                      uVar68 = (ulong)uVar73;
                      if (bVar67 == 0) {
                        pfVar1 = (float *)(lVar72 + -0x14 + lVar59);
                        auVar54._4_4_ = -(uint)(pfVar1[1] != 0.0);
                        auVar54._0_4_ = -(uint)(*pfVar1 != 0.0);
                        auVar54._8_4_ = -(uint)(pfVar1[2] != 0.0);
                        auVar54._12_4_ = -(uint)(pfVar1[3] != 1.0);
                        uVar73 = movmskps(uVar73,auVar54);
                        uVar68 = (ulong)uVar73;
                        if ((((bVar56 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                           ((uVar73 & 4) == 0)) {
                          bVar67 = ((byte)uVar73 & 8) >> 3;
                          uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67);
                          uVar68 = (ulong)uVar73;
                          if (bVar67 == 0) {
                            pfVar1 = (float *)(lVar72 + -4 + lVar59);
                            auVar55._4_4_ = -(uint)(pfVar1[1] != 0.0);
                            auVar55._0_4_ = -(uint)(*pfVar1 != 0.0);
                            auVar55._8_4_ = -(uint)(pfVar1[2] != 0.0);
                            auVar55._12_4_ = -(uint)(pfVar1[3] != 0.0);
                            uVar73 = movmskps(uVar73,auVar55);
                            uVar68 = (ulong)uVar73;
                            if ((((((bVar56 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                                 ((uVar73 & 4) == 0)) &&
                                (bVar67 = ((byte)uVar73 & 8) >> 3,
                                uVar68 = (ulong)CONCAT31((int3)(uVar73 >> 8),bVar67), bVar67 == 0))
                               && ((bVar56 == 0 ||
                                   ((fVar101 = *(float *)(lVar72 + 0xc + lVar59), fVar101 == 1.0 &&
                                    (!NAN(fVar101))))))) {
                              pfVar1 = (float *)((long)pAVar13 + lVar59 + -0x30);
                              fVar113 = *pfVar1;
                              local_178 = pfVar1[1];
                              fVar79 = pfVar1[2];
                              fVar77 = pfVar1[3];
                              pfVar1 = (float *)((long)pAVar13 + lVar59 + -0x20);
                              fVar101 = *pfVar1;
                              fVar126 = pfVar1[1];
                              fVar127 = pfVar1[2];
                              fVar103 = pfVar1[3];
                              pfVar1 = (float *)((long)pAVar13 + lVar59 + -0x10);
                              fVar78 = *pfVar1;
                              fVar128 = pfVar1[1];
                              fVar106 = pfVar1[2];
                              fVar118 = pfVar1[3];
                              pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar59);
                              fVar111 = *pfVar1;
                              fVar122 = pfVar1[1];
                              fVar92 = pfVar1[2];
                              fVar107 = pfVar1[3];
                              local_138.l.vy.field_0._8_1_ = bVar10;
                              goto LAB_0018bc20;
                            }
                          }
                        }
                      }
                    }
                  }
                }
                if ((bVar10 == false) && (bVar56 == 0)) {
                  pfVar1 = (float *)((long)pAVar13 + lVar59 + -0x30);
                  fVar139 = *pfVar1;
                  fVar93 = pfVar1[1];
                  fVar94 = pfVar1[2];
                  fVar95 = pfVar1[3];
                  pfVar1 = (float *)((long)pAVar13 + lVar59 + -0x20);
                  fVar96 = *pfVar1;
                  fVar97 = pfVar1[1];
                  fVar98 = pfVar1[2];
                  fVar99 = pfVar1[3];
                  pfVar1 = (float *)((long)pAVar13 + lVar59 + -0x10);
                  fVar132 = *pfVar1;
                  fVar100 = pfVar1[1];
                  fVar102 = pfVar1[2];
                  fVar137 = pfVar1[3];
                  fVar113 = fVar103 * fVar139 + fVar111 * fVar96 + fVar77 * fVar132;
                  local_178 = fVar103 * fVar93 + fVar111 * fVar97 + fVar77 * fVar100;
                  fVar79 = fVar103 * fVar94 + fVar111 * fVar98 + fVar77 * fVar102;
                  fVar6 = *(float *)(lVar72 + -0x20 + lVar59);
                  fVar129 = *(float *)(lVar72 + -0x1c + lVar59);
                  fVar130 = *(float *)(lVar72 + -0x18 + lVar59);
                  fVar118 = *(float *)(lVar72 + -0x10 + lVar59);
                  fVar101 = fVar6 * fVar139 + fVar129 * fVar96 + fVar130 * fVar132;
                  fVar126 = fVar6 * fVar93 + fVar129 * fVar97 + fVar130 * fVar100;
                  fVar122 = *(float *)(lVar72 + -0xc + lVar59);
                  fVar92 = *(float *)(lVar72 + -8 + lVar59);
                  fVar78 = fVar118 * fVar139 + fVar122 * fVar96 + fVar92 * fVar132;
                  fVar128 = fVar118 * fVar93 + fVar122 * fVar97 + fVar92 * fVar100;
                  fVar106 = fVar118 * fVar94 + fVar122 * fVar98 + fVar92 * fVar102;
                  fVar107 = *(float *)(lVar72 + lVar59);
                  fVar127 = *(float *)(lVar72 + 4 + lVar59);
                  fVar136 = *(float *)(lVar72 + 8 + lVar59);
                  pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar59);
                  fVar118 = fVar118 * fVar95 + fVar122 * fVar99 + fVar92 * fVar137;
                  fVar77 = fVar103 * fVar95 + fVar111 * fVar99 + fVar77 * fVar137;
                  fVar111 = fVar107 * fVar139 + fVar127 * fVar96 + fVar136 * fVar132 + *pfVar1;
                  fVar122 = fVar107 * fVar93 + fVar127 * fVar97 + fVar136 * fVar100 + pfVar1[1];
                  fVar92 = fVar107 * fVar94 + fVar127 * fVar98 + fVar136 * fVar102 + pfVar1[2];
                  fVar107 = fVar107 * fVar95 + fVar127 * fVar99 + fVar136 * fVar137 + pfVar1[3];
                  fVar127 = fVar6 * fVar94 + fVar129 * fVar98 + fVar130 * fVar102;
                  fVar103 = fVar6 * fVar95 + fVar129 * fVar99 + fVar130 * fVar137;
                }
                else if ((bVar10 == false) || (bVar56 == 0)) {
                  if ((bVar10 == false) || (bVar56 != 0)) {
                    if (((local_178 != 0.0) ||
                        (((NAN(local_178) || (fVar79 != 0.0)) || (NAN(fVar79))))) ||
                       (uVar7 = *(undefined8 *)((long)pAVar13 + lVar59 + -0x10),
                       auVar37._4_4_ = -(uint)(*(float *)((long)pAVar13 + lVar59 + -0x20) != 0.0),
                       auVar37._0_4_ = -(uint)(*(float *)((long)pAVar13 + lVar59 + -0x18) != 0.0),
                       auVar37._8_4_ = -(uint)((float)uVar7 != 0.0),
                       auVar37._12_4_ = -(uint)((float)((ulong)uVar7 >> 0x20) != 0.0),
                       uVar57 = movmskps((int)CONCAT71((int7)((ulong)uVar60 >> 8),bVar56),auVar37),
                       (char)uVar57 != '\0')) {
                      poVar62 = std::operator<<((ostream *)&std::cout,
                                                "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                               );
                      std::endl<char,std::char_traits<char>>(poVar62);
                      uVar68 = extraout_RDX_22;
                    }
                    pfVar2 = (float *)(lVar72 + -0x30 + lVar59);
                    fVar77 = pfVar2[3];
                    pfVar3 = (float *)(lVar72 + -0x20 + lVar59);
                    fVar101 = *pfVar3;
                    fVar103 = pfVar3[3];
                    pfVar4 = (float *)(lVar72 + -0x10 + lVar59);
                    fVar78 = *pfVar4;
                    fVar128 = pfVar4[1];
                    fVar118 = pfVar4[3];
                    pfVar1 = (float *)(lVar72 + lVar59);
                    fVar111 = *pfVar1;
                    fVar122 = pfVar1[1];
                    fVar92 = pfVar1[2];
                    fVar107 = pfVar1[3];
                    uVar60 = *(undefined8 *)((long)&(pAVar13->l).vx.field_0 + lVar59);
                    fVar113 = *(float *)((long)pAVar13 + lVar59 + -0x30) * *pfVar2;
                    local_178 = pfVar2[1] + (float)uVar60;
                    fVar79 = pfVar2[2] + (float)((ulong)uVar60 >> 0x20);
                    fVar127 = pfVar3[2] + *(float *)((long)&(pAVar13->l).vx.field_0 + lVar59 + 8);
                    fVar126 = pfVar3[1] * *(float *)((long)pAVar13 + lVar59 + -0x1c);
                    fVar106 = pfVar4[2] * *(float *)((long)pAVar13 + lVar59 + -8);
                    local_138.l.vy.field_0._8_1_ = 1;
                  }
                  else {
                    local_d8 = ZEXT416(*(uint *)((long)&(pAVar13->l).vx.field_0 + lVar59 + 0xc));
                    local_b8 = ZEXT416(*(uint *)((long)pAVar13 + lVar59 + -0x24));
                    local_a8 = ZEXT416(*(uint *)((long)pAVar13 + lVar59 + -0x14));
                    local_e8 = ZEXT416(*(uint *)((long)pAVar13 + lVar59 + -4));
                    pfVar1 = (float *)((long)pAVar13 + lVar59 + -0x20);
                    local_138.p.field_0.m128[0] = *pfVar1;
                    local_138.p.field_0.m128[1] = pfVar1[1];
                    fStack_c0 = pfVar1[2];
                    local_138.p.field_0.m128[3] = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar13 + lVar59 + -0x10);
                    local_f8 = *pfVar1;
                    fStack_f4 = pfVar1[1];
                    fStack_f0 = pfVar1[2];
                    fStack_ec = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar13 + lVar59 + -0x30);
                    local_88 = *pfVar1;
                    fStack_7c = pfVar1[1];
                    pfVar1 = (float *)(lVar72 + -0x30 + lVar59);
                    fVar77 = *pfVar1;
                    fVar101 = pfVar1[1];
                    fVar103 = pfVar1[2];
                    pfVar1 = (float *)(lVar72 + -0x20 + lVar59);
                    fVar78 = *pfVar1;
                    fVar128 = pfVar1[1];
                    fVar118 = pfVar1[2];
                    puVar5 = (undefined8 *)(lVar72 + -0x10 + lVar59);
                    local_138.l.vz.field_0._0_8_ = *puVar5;
                    local_138.l.vz.field_0._8_8_ = puVar5[1];
                    pfVar1 = (float *)(lVar72 + lVar59);
                    fVar111 = *pfVar1;
                    fVar122 = pfVar1[1];
                    fVar92 = pfVar1[2];
                    fVar113 = fVar77 * local_88 +
                              fVar101 * local_138.p.field_0.m128[0] + fVar103 * local_f8;
                    fVar107 = fVar77 * 0.0 +
                              fVar101 * local_138.p.field_0.m128[1] + fVar103 * fStack_f4;
                    fVar103 = fVar77 * 0.0 + fVar101 * 0.0 + fVar103 * fStack_f0;
                    fVar101 = fVar78 * local_88 +
                              fVar128 * local_138.p.field_0.m128[0] + fVar118 * local_f8;
                    fVar126 = fVar78 * 0.0 +
                              fVar128 * local_138.p.field_0.m128[1] + fVar118 * fStack_f4;
                    fVar77 = fVar78 * 0.0 + fVar128 * 0.0 + fVar118 * fStack_f0;
                    local_138.p.field_0.m128[2] = 0.0;
                    fStack_84 = 0.0;
                    fStack_80 = 0.0;
                    pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar59);
                    local_98._0_4_ =
                         fVar111 * local_88 +
                         fVar122 * local_138.p.field_0.m128[0] + fVar92 * local_f8 + *pfVar1;
                    local_98._4_4_ =
                         fVar111 * 0.0 + fVar122 * local_138.p.field_0.m128[1] + fVar92 * fStack_f4
                         + pfVar1[1];
                    fStack_90 = fVar111 * 0.0 + fVar122 * 0.0 + fVar92 * fStack_f0 + pfVar1[2];
                    register0x0000128c =
                         fVar111 * fStack_7c +
                         fVar122 * local_138.p.field_0.m128[3] + fVar92 * fStack_ec + pfVar1[3];
                    local_c8 = local_138.p.field_0.m128[0];
                    fStack_c4 = local_138.p.field_0.m128[1];
                    fStack_bc = local_138.p.field_0.m128[3];
                    if ((((fVar107 != 0.0) || (NAN(fVar107))) ||
                        ((fVar103 != 0.0 || ((NAN(fVar103) || (fVar77 != 0.0)))))) || (NAN(fVar77)))
                    {
                      poVar62 = std::operator<<((ostream *)&std::cout,
                                                "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                               );
                      std::endl<char,std::char_traits<char>>(poVar62);
                      uVar68 = extraout_RDX_21;
                    }
                    fVar78 = local_88 * local_138.l.vz.field_0.m128[0] +
                             local_138.p.field_0.m128[0] * local_138.l.vz.field_0.m128[1] +
                             local_f8 * local_138.l.vz.field_0.m128[2];
                    fVar128 = fStack_84 * local_138.l.vz.field_0.m128[0] +
                              local_138.p.field_0.m128[1] * local_138.l.vz.field_0.m128[1] +
                              fStack_f4 * local_138.l.vz.field_0.m128[2];
                    fVar106 = fStack_80 * local_138.l.vz.field_0.m128[0] +
                              local_138.p.field_0.m128[2] * local_138.l.vz.field_0.m128[1] +
                              fStack_f0 * local_138.l.vz.field_0.m128[2];
                    local_138.l.vy.field_0._8_1_ = 1;
                    fVar118 = (float)local_e8._0_4_;
                    fVar77 = (float)local_b8._0_4_;
                    fVar111 = (float)local_98._0_4_;
                    fVar122 = (float)local_98._4_4_;
                    fVar92 = fStack_90;
                    fVar107 = (float)local_d8._0_4_;
                    fVar127 = fStack_c0;
                    fVar103 = (float)local_a8._0_4_;
                  }
                }
                else {
                  poVar62 = std::operator<<((ostream *)&std::cout,
                                            "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                           );
                  std::endl<char,std::char_traits<char>>(poVar62);
                  fVar77 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar59 + 0xc);
                  fVar79 = *(float *)((long)pAVar13 + lVar59 + -0x24);
                  fVar101 = *(float *)((long)pAVar13 + lVar59 + -0x14);
                  fVar103 = *(float *)((long)pAVar13 + lVar59 + -4);
                  auVar9 = *(undefined1 (*) [16])((long)pAVar13 + lVar59 + -0x30);
                  pfVar2 = (float *)((long)pAVar13 + lVar59 + -0x20);
                  fVar78 = *pfVar2;
                  fVar128 = pfVar2[1];
                  pfVar1 = (float *)((long)pAVar13 + lVar59 + -0x10);
                  fVar118 = *pfVar1;
                  fVar111 = pfVar1[1];
                  fVar122 = pfVar1[2];
                  fVar130 = fVar79 * fVar101 + fVar77 * fVar103;
                  fVar113 = fVar79 * fVar101 - fVar77 * fVar103;
                  fVar126 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar101 * fVar101 +
                            -fVar103 * fVar103;
                  fVar106 = fVar77 * fVar77 - fVar79 * fVar79;
                  fVar129 = fVar101 * fVar101 + fVar106 + -fVar103 * fVar103;
                  fVar139 = fVar79 * fVar103 - fVar77 * fVar101;
                  fVar92 = fVar77 * fVar101 + fVar79 * fVar103;
                  fVar136 = fVar101 * fVar103 + fVar77 * fVar79;
                  fVar77 = fVar101 * fVar103 - fVar77 * fVar79;
                  pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar59);
                  fVar107 = *pfVar1;
                  fVar127 = pfVar1[1];
                  fVar6 = pfVar1[2];
                  fVar130 = fVar130 + fVar130;
                  fVar139 = fVar139 + fVar139;
                  fVar113 = fVar113 + fVar113;
                  fVar136 = fVar136 + fVar136;
                  fVar92 = fVar92 + fVar92;
                  fVar77 = fVar77 + fVar77;
                  fVar79 = fVar103 * fVar103 + fVar106 + -fVar101 * fVar101;
                  fVar114 = fVar126 * 1.0 + fVar130 * 0.0 + fVar139 * 0.0;
                  fVar116 = fVar126 * 0.0 + fVar130 * 1.0 + fVar139 * 0.0;
                  fVar119 = fVar126 * 0.0 + fVar130 * 0.0 + fVar139 * 1.0;
                  fVar120 = fVar126 * 0.0 + fVar130 * 0.0 + fVar139 * 0.0;
                  fVar108 = fVar113 * 1.0 + fVar129 * 0.0 + fVar136 * 0.0;
                  fVar109 = fVar113 * 0.0 + fVar129 * 1.0 + fVar136 * 0.0;
                  fVar110 = fVar113 * 0.0 + fVar129 * 0.0 + fVar136 * 1.0;
                  fVar112 = fVar113 * 0.0 + fVar129 * 0.0 + fVar136 * 0.0;
                  fVar93 = fVar92 * 1.0 + fVar77 * 0.0 + fVar79 * 0.0;
                  fVar95 = fVar92 * 0.0 + fVar77 * 1.0 + fVar79 * 0.0;
                  fVar97 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 1.0;
                  fVar99 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 0.0;
                  local_168 = auVar9._4_4_;
                  fStack_164 = auVar9._8_4_;
                  local_178 = auVar9._0_4_;
                  fVar131 = local_178 * fVar114 + fVar108 * 0.0 + fVar93 * 0.0;
                  fVar133 = local_178 * fVar116 + fVar109 * 0.0 + fVar95 * 0.0;
                  fVar134 = local_178 * fVar119 + fVar110 * 0.0 + fVar97 * 0.0;
                  fVar135 = local_178 * fVar120 + fVar112 * 0.0 + fVar99 * 0.0;
                  fVar94 = fVar78 * fVar114 + fVar128 * fVar108 + fVar93 * 0.0;
                  fVar96 = fVar78 * fVar116 + fVar128 * fVar109 + fVar95 * 0.0;
                  fVar98 = fVar78 * fVar119 + fVar128 * fVar110 + fVar97 * 0.0;
                  fVar132 = fVar78 * fVar120 + fVar128 * fVar112 + fVar99 * 0.0;
                  fVar129 = fVar118 * fVar114 + fVar111 * fVar108 + fVar122 * fVar93;
                  fVar130 = fVar118 * fVar116 + fVar111 * fVar109 + fVar122 * fVar95;
                  fVar136 = fVar118 * fVar119 + fVar111 * fVar110 + fVar122 * fVar97;
                  fVar139 = fVar118 * fVar120 + fVar111 * fVar112 + fVar122 * fVar99;
                  fVar77 = *(float *)(lVar72 + 0xc + lVar59);
                  fVar79 = *(float *)(lVar72 + -0x24 + lVar59);
                  fVar101 = *(float *)(lVar72 + -0x14 + lVar59);
                  fVar103 = *(float *)(lVar72 + -4 + lVar59);
                  fVar106 = fVar79 * fVar101 + fVar77 * fVar103;
                  fVar113 = fVar79 * fVar101 - fVar77 * fVar103;
                  fVar126 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar101 * fVar101 +
                            -fVar103 * fVar103;
                  fVar128 = fVar77 * fVar77 - fVar79 * fVar79;
                  fVar138 = fVar101 * fVar101 + fVar128 + -fVar103 * fVar103;
                  fVar137 = fVar79 * fVar103 - fVar77 * fVar101;
                  fVar104 = fVar77 * fVar101 + fVar79 * fVar103;
                  fVar140 = fVar101 * fVar103 + fVar77 * fVar79;
                  fVar92 = fVar101 * fVar103 - fVar77 * fVar79;
                  pfVar3 = (float *)(lVar72 + -0x30 + lVar59);
                  fVar77 = *pfVar3;
                  pfVar4 = (float *)(lVar72 + -0x20 + lVar59);
                  fVar79 = *pfVar4;
                  fVar78 = pfVar4[1];
                  fVar123 = fVar103 * fVar103 + fVar128 + -fVar101 * fVar101;
                  pfVar1 = (float *)(lVar72 + -0x10 + lVar59);
                  fVar101 = *pfVar1;
                  fVar103 = pfVar1[1];
                  fVar128 = pfVar1[2];
                  fVar106 = fVar106 + fVar106;
                  fVar137 = fVar137 + fVar137;
                  pfVar1 = (float *)(lVar72 + lVar59);
                  fVar118 = *pfVar1;
                  fVar111 = pfVar1[1];
                  fVar122 = pfVar1[2];
                  fVar100 = fVar126 * 1.0 + fVar106 * 0.0 + fVar137 * 0.0;
                  fVar102 = fVar126 * 0.0 + fVar106 * 1.0 + fVar137 * 0.0;
                  fVar137 = fVar126 * 0.0 + fVar106 * 0.0 + fVar137 * 1.0;
                  fVar113 = fVar113 + fVar113;
                  fVar140 = fVar140 + fVar140;
                  fVar104 = fVar104 + fVar104;
                  fVar92 = fVar92 + fVar92;
                  fVar126 = fVar113 * 1.0 + fVar138 * 0.0 + fVar140 * 0.0;
                  fVar106 = fVar113 * 0.0 + fVar138 * 1.0 + fVar140 * 0.0;
                  fVar113 = fVar113 * 0.0 + fVar138 * 0.0 + fVar140 * 1.0;
                  fVar138 = fVar104 * 1.0 + fVar92 * 0.0 + fVar123 * 0.0;
                  fVar140 = fVar104 * 0.0 + fVar92 * 1.0 + fVar123 * 0.0;
                  fVar92 = fVar104 * 0.0 + fVar92 * 0.0 + fVar123 * 1.0;
                  fVar115 = fVar77 * fVar100 + fVar126 * 0.0 + fVar138 * 0.0;
                  fVar117 = fVar77 * fVar102 + fVar106 * 0.0 + fVar140 * 0.0;
                  fVar77 = fVar77 * fVar137 + fVar113 * 0.0 + fVar92 * 0.0;
                  fVar104 = fVar79 * fVar100 + fVar78 * fVar126 + fVar138 * 0.0;
                  fVar123 = fVar79 * fVar102 + fVar78 * fVar106 + fVar140 * 0.0;
                  fVar105 = fVar79 * fVar137 + fVar78 * fVar113 + fVar92 * 0.0;
                  fVar121 = fVar101 * fVar100 + fVar103 * fVar126 + fVar128 * fVar138;
                  fVar124 = fVar101 * fVar102 + fVar103 * fVar106 + fVar128 * fVar140;
                  fVar125 = fVar101 * fVar137 + fVar103 * fVar113 + fVar128 * fVar92;
                  fVar103 = fVar118 * fVar100 + fVar111 * fVar126 + fVar122 * fVar138 +
                            pfVar3[1] + 0.0;
                  fVar100 = fVar118 * fVar102 + fVar111 * fVar106 + fVar122 * fVar140 +
                            pfVar3[2] + 0.0;
                  fVar102 = fVar118 * fVar137 + fVar111 * fVar113 + fVar122 * fVar92 +
                            pfVar4[2] + 0.0;
                  fVar113 = fVar115 * fVar131 + fVar117 * fVar94 + fVar77 * fVar129;
                  local_178 = fVar115 * fVar133 + fVar117 * fVar96 + fVar77 * fVar130;
                  fVar79 = fVar115 * fVar134 + fVar117 * fVar98 + fVar77 * fVar136;
                  fVar101 = fVar104 * fVar131 + fVar123 * fVar94 + fVar105 * fVar129;
                  fVar126 = fVar104 * fVar133 + fVar123 * fVar96 + fVar105 * fVar130;
                  fVar78 = fVar121 * fVar131 + fVar124 * fVar94 + fVar125 * fVar129;
                  fVar128 = fVar121 * fVar133 + fVar124 * fVar96 + fVar125 * fVar130;
                  fVar106 = fVar121 * fVar134 + fVar124 * fVar98 + fVar125 * fVar136;
                  uVar68 = extraout_RDX_20;
                  fVar118 = fVar121 * fVar135 + fVar124 * fVar132 + fVar125 * fVar139;
                  fVar77 = fVar115 * fVar135 + fVar117 * fVar132 + fVar77 * fVar139;
                  fVar111 = fVar103 * fVar131 + fVar100 * fVar94 + fVar102 * fVar129 +
                            fVar107 * fVar114 + fVar127 * fVar108 + fVar6 * fVar93 + local_168 + 0.0
                  ;
                  fVar122 = fVar103 * fVar133 + fVar100 * fVar96 + fVar102 * fVar130 +
                            fVar107 * fVar116 + fVar127 * fVar109 + fVar6 * fVar95 +
                            fStack_164 + 0.0;
                  fVar92 = fVar103 * fVar134 + fVar100 * fVar98 + fVar102 * fVar136 +
                           fVar107 * fVar119 + fVar127 * fVar110 + fVar6 * fVar97 + pfVar2[2] + 0.0;
                  fVar107 = fVar103 * fVar135 + fVar100 * fVar132 + fVar102 * fVar139 +
                            fVar107 * fVar120 + fVar127 * fVar112 + fVar6 * fVar99 + 0.0;
                  fVar127 = fVar104 * fVar134 + fVar123 * fVar98 + fVar105 * fVar136;
                  fVar103 = fVar104 * fVar135 + fVar123 * fVar132 + fVar105 * fVar139;
                }
              }
              else {
                pfVar1 = (float *)((long)pAVar13 + lVar59 + -0x24);
                auVar9._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar9._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar9._8_4_ = -(uint)(pfVar1[2] != 1.0);
                auVar9._12_4_ = -(uint)(pfVar1[3] != 0.0);
                uVar73 = movmskps(uVar73,auVar9);
                if ((((bVar10 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) ||
                   (((uVar73 & 4) != 0 ||
                    (bVar67 = ((byte)uVar73 & 8) >> 3, uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67)
                    , bVar67 != 0)))) goto LAB_0018b19e;
                pfVar1 = (float *)((long)pAVar13 + lVar59 + -0x14);
                auVar35._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar35._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar35._8_4_ = -(uint)(pfVar1[2] != 0.0);
                auVar35._12_4_ = -(uint)(pfVar1[3] != 1.0);
                uVar73 = movmskps(uVar73,auVar35);
                if (((((bVar10 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) || ((uVar73 & 4) != 0))
                   || (bVar67 = ((byte)uVar73 & 8) >> 3,
                      uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67), bVar67 != 0))
                goto LAB_0018b19e;
                pfVar1 = (float *)((long)pAVar13 + lVar59 + -4);
                auVar36._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar36._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar36._8_4_ = -(uint)(pfVar1[2] != 0.0);
                auVar36._12_4_ = -(uint)(pfVar1[3] != 0.0);
                uVar73 = movmskps(uVar73,auVar36);
                if ((((bVar10 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) || ((uVar73 & 4) != 0))
                goto LAB_0018b19e;
                bVar67 = ((byte)uVar73 & 8) >> 3;
                uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67);
                uVar68 = (ulong)uVar73;
                if ((bVar67 != 0) ||
                   ((bVar10 != false &&
                    ((fVar77 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar59 + 0xc),
                     fVar77 != 1.0 || (NAN(fVar77))))))) goto LAB_0018b19e;
                pfVar1 = (float *)(lVar72 + -0x30 + lVar59);
                fVar113 = *pfVar1;
                local_178 = pfVar1[1];
                fVar79 = pfVar1[2];
                fVar77 = pfVar1[3];
                pfVar1 = (float *)(lVar72 + -0x20 + lVar59);
                fVar101 = *pfVar1;
                fVar126 = pfVar1[1];
                fVar127 = pfVar1[2];
                fVar103 = pfVar1[3];
                pfVar1 = (float *)(lVar72 + -0x10 + lVar59);
                fVar78 = *pfVar1;
                fVar128 = pfVar1[1];
                fVar106 = pfVar1[2];
                fVar118 = pfVar1[3];
                pfVar1 = (float *)(lVar72 + lVar59);
                fVar111 = *pfVar1;
                fVar122 = pfVar1[1];
                fVar92 = pfVar1[2];
                fVar107 = pfVar1[3];
                local_138.l.vy.field_0._8_1_ = bVar56;
              }
LAB_0018bc20:
              pfVar1 = (float *)((long)&((Vector *)(local_138.l.vy.field_0._0_8_ + -0x30))->field_0
                                + lVar59);
              *pfVar1 = fVar113;
              pfVar1[1] = local_178;
              pfVar1[2] = fVar79;
              pfVar1[3] = fVar77;
              pfVar1 = (float *)((long)&((Vector *)(local_138.l.vy.field_0._0_8_ + -0x20))->field_0
                                + lVar59);
              *pfVar1 = fVar101;
              pfVar1[1] = fVar126;
              pfVar1[2] = fVar127;
              pfVar1[3] = fVar103;
              pfVar1 = (float *)((long)&((Vector *)(local_138.l.vy.field_0._0_8_ + -0x10))->field_0
                                + lVar59);
              *pfVar1 = fVar78;
              pfVar1[1] = fVar128;
              pfVar1[2] = fVar106;
              pfVar1[3] = fVar118;
              pfVar1 = (float *)(local_138.l.vy.field_0._0_8_ + lVar59);
              *pfVar1 = fVar111;
              pfVar1[1] = fVar122;
              pfVar1[2] = fVar92;
              pfVar1[3] = fVar107;
              lVar59 = lVar59 + 0x40;
              uVar60 = local_138.l.vy.field_0._0_8_;
            }
          }
          std::
          vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
          ::emplace_back<embree::SceneGraph::Transformations>
                    ((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                      *)local_48,(Transformations *)local_148);
          SceneGraph::Transformations::~Transformations((Transformations *)local_148);
          uVar69 = local_58 + 1;
          pTVar66 = (local_78->
                    super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pTVar63 = (local_78->
                    super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        }
        convertInstances(local_60,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                   *)local_68,local_70 + 0x10,
                         (vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                          *)local_48);
        std::
        vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
        ::~vector((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                   *)local_48);
        (**(code **)(*(long *)pRVar70 + 0x18))(pRVar70);
      }
    }
    else {
      (**(code **)(*plVar58 + 0x10))(plVar58);
      local_70 = (Ref<embree::SceneGraph::Node> *)(plVar58 + 0x13);
      uVar69 = 0;
      while( true ) {
        lVar72 = 0x30;
        pTVar66 = (local_78->
                  super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        lVar59 = (long)(local_78->
                       super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar66;
        uVar68 = lVar59 % 0x30;
        if ((ulong)(lVar59 / 0x30) <= uVar69) break;
        pTVar63 = pTVar66 + uVar69;
        sVar12 = pTVar66[uVar69].spaces.size_active;
        local_58 = uVar69;
        if (sVar12 == 1) {
          fVar77 = (pTVar63->time_range).lower;
          fVar79 = (pTVar63->time_range).upper;
          fVar101 = (float)plVar58[0xd];
          fVar103 = (float)((ulong)plVar58[0xd] >> 0x20);
          uVar73 = -(uint)(fVar77 < fVar101);
          uVar75 = -(uint)(fVar79 < fVar103);
          local_148._0_8_ =
               CONCAT44(~uVar75 & (uint)fVar103,~uVar73 & (uint)fVar77) |
               CONCAT44((uint)fVar79 & uVar75,(uint)fVar101 & uVar73);
          sVar12 = plVar58[0xf];
          uVar60 = &local_138;
          local_138.l.vy.field_0._0_8_ = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
          local_138.l.vx.field_0._0_8_ = 0;
          local_138.l.vx.field_0._8_8_ = 0;
          if (sVar12 != 0) {
            uVar60 = alignedMalloc(sVar12 << 6,0x10);
            uVar68 = extraout_RDX;
            local_138.l.vx.field_0._8_8_ = sVar12;
            local_138.l.vy.field_0._0_8_ = uVar60;
          }
          local_138.l.vy.field_0._8_1_ = 0;
          local_138.l.vx.field_0._0_8_ = local_138.l.vx.field_0._8_8_;
          for (uVar69 = 0; uVar73 = (uint)uVar68, uVar69 < (ulong)plVar58[0xf]; uVar69 = uVar69 + 1)
          {
            pAVar13 = (pTVar63->spaces).items;
            lVar59 = plVar58[0x11];
            bVar10 = pTVar63->quaternion;
            uVar65 = (undefined7)((ulong)uVar60 >> 8);
            uVar61 = CONCAT71(uVar65,bVar10);
            bVar56 = *(byte *)(plVar58 + 0x12);
            local_138.l.vy.field_0._8_1_ = 0;
            fVar77 = (pAVar13->l).vx.field_0.m128[0];
            uVar60 = *(undefined8 *)((long)&(pAVar13->l).vx.field_0 + 4);
            fVar79 = (float)((ulong)uVar60 >> 0x20);
            local_178 = (float)uVar60;
            if ((((fVar77 != 1.0) || (NAN(fVar77))) || (local_178 != 0.0)) ||
               (((NAN(local_178) || (fVar79 != 0.0)) || (NAN(fVar79))))) {
LAB_00187349:
              uVar60 = *(undefined8 *)(lVar59 + -0x30 + lVar72);
              fVar101 = (float)uVar60;
              fVar103 = (float)((ulong)uVar60 >> 0x20);
              iVar74 = -(uint)(fVar101 != 1.0);
              iVar76 = -(uint)(fVar103 != 0.0);
              auVar81._4_4_ = iVar76;
              auVar81._0_4_ = iVar74;
              auVar81._8_4_ = iVar76;
              auVar81._12_4_ = iVar76;
              auVar80._8_8_ = auVar81._8_8_;
              auVar80._4_4_ = iVar74;
              auVar80._0_4_ = iVar74;
              uVar73 = movmskpd(uVar73,auVar80);
              fVar77 = *(float *)(lVar59 + -0x28 + lVar72);
              if (((((uVar73 & 1) == 0) && (bVar67 = (byte)uVar73 >> 1, bVar67 == 0)) &&
                  (fVar77 == 0.0)) && (!NAN(fVar77))) {
                pfVar1 = (float *)(lVar59 + -0x24 + lVar72);
                auVar38._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar38._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar38._8_4_ = -(uint)(pfVar1[2] != 1.0);
                auVar38._12_4_ = -(uint)(pfVar1[3] != 0.0);
                uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar67),auVar38);
                if ((((bVar56 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                   (((uVar73 & 4) == 0 && (bVar67 = ((byte)uVar73 & 8) >> 3, bVar67 == 0)))) {
                  pfVar1 = (float *)(lVar59 + -0x14 + lVar72);
                  auVar39._4_4_ = -(uint)(pfVar1[1] != 0.0);
                  auVar39._0_4_ = -(uint)(*pfVar1 != 0.0);
                  auVar39._8_4_ = -(uint)(pfVar1[2] != 0.0);
                  auVar39._12_4_ = -(uint)(pfVar1[3] != 1.0);
                  uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar67),auVar39);
                  if ((((bVar56 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                     (((uVar73 & 4) == 0 && (bVar67 = ((byte)uVar73 & 8) >> 3, bVar67 == 0)))) {
                    pfVar1 = (float *)(lVar59 + -4 + lVar72);
                    auVar40._4_4_ = -(uint)(pfVar1[1] != 0.0);
                    auVar40._0_4_ = -(uint)(*pfVar1 != 0.0);
                    auVar40._8_4_ = -(uint)(pfVar1[2] != 0.0);
                    auVar40._12_4_ = -(uint)(pfVar1[3] != 0.0);
                    uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar67),auVar40);
                    if ((((((bVar56 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                         ((uVar73 & 4) == 0)) &&
                        (bVar67 = ((byte)uVar73 & 8) >> 3,
                        uVar68 = (ulong)CONCAT31((int3)(uVar73 >> 8),bVar67), bVar67 == 0)) &&
                       ((bVar56 == 0 ||
                        ((fVar78 = *(float *)(lVar59 + 0xc + lVar72), fVar78 == 1.0 &&
                         (!NAN(fVar78))))))) {
                      fVar78 = (pAVar13->l).vx.field_0.m128[0];
                      local_178 = (pAVar13->l).vx.field_0.m128[1];
                      fVar79 = (pAVar13->l).vx.field_0.m128[2];
                      fVar128 = (pAVar13->l).vx.field_0.m128[3];
                      fVar77 = (pAVar13->l).vy.field_0.m128[0];
                      fVar118 = *(float *)((long)&(pAVar13->l).vy.field_0 + 4);
                      fVar111 = *(float *)((long)&(pAVar13->l).vy.field_0 + 8);
                      fVar122 = *(float *)((long)&(pAVar13->l).vy.field_0 + 0xc);
                      fVar101 = (pAVar13->l).vz.field_0.m128[0];
                      fVar103 = *(float *)((long)&(pAVar13->l).vz.field_0 + 4);
                      fVar92 = *(float *)((long)&(pAVar13->l).vz.field_0 + 8);
                      fVar107 = *(float *)((long)&(pAVar13->l).vz.field_0 + 0xc);
                      fVar113 = (pAVar13->p).field_0.m128[0];
                      fVar126 = *(float *)((long)&(pAVar13->p).field_0 + 4);
                      fVar127 = *(float *)((long)&(pAVar13->p).field_0 + 8);
                      fVar106 = *(float *)((long)&(pAVar13->p).field_0 + 0xc);
                      local_138.l.vy.field_0._8_1_ = bVar10;
                      goto LAB_00187a67;
                    }
                  }
                }
              }
              uVar68 = uVar61 & 0xffffffff;
              bVar67 = (byte)uVar68 | bVar56;
              uVar68 = CONCAT71((int7)(uVar68 >> 8),bVar67);
              if (bVar67 == 0) {
                fVar127 = (pAVar13->l).vx.field_0.m128[0];
                fVar130 = (pAVar13->l).vx.field_0.m128[1];
                fVar136 = (pAVar13->l).vx.field_0.m128[2];
                fVar139 = (pAVar13->l).vx.field_0.m128[3];
                fVar93 = (pAVar13->l).vy.field_0.m128[0];
                fVar94 = *(float *)((long)&(pAVar13->l).vy.field_0 + 4);
                fVar95 = *(float *)((long)&(pAVar13->l).vy.field_0 + 8);
                fVar96 = *(float *)((long)&(pAVar13->l).vy.field_0 + 0xc);
                fVar97 = (pAVar13->l).vz.field_0.m128[0];
                fVar98 = *(float *)((long)&(pAVar13->l).vz.field_0 + 4);
                fVar99 = *(float *)((long)&(pAVar13->l).vz.field_0 + 8);
                fVar132 = *(float *)((long)&(pAVar13->l).vz.field_0 + 0xc);
                fVar78 = fVar101 * fVar127 + fVar103 * fVar93 + fVar77 * fVar97;
                local_178 = fVar101 * fVar130 + fVar103 * fVar94 + fVar77 * fVar98;
                fVar79 = fVar101 * fVar136 + fVar103 * fVar95 + fVar77 * fVar99;
                fVar128 = fVar101 * fVar139 + fVar103 * fVar96 + fVar77 * fVar132;
                fVar101 = *(float *)(lVar59 + -0x20 + lVar72);
                fVar103 = *(float *)(lVar59 + -0x1c + lVar72);
                fVar122 = *(float *)(lVar59 + -0x18 + lVar72);
                fVar107 = *(float *)(lVar59 + -0x10 + lVar72);
                fVar77 = fVar101 * fVar127 + fVar103 * fVar93 + fVar122 * fVar97;
                fVar118 = fVar101 * fVar130 + fVar103 * fVar94 + fVar122 * fVar98;
                fVar111 = fVar101 * fVar136 + fVar103 * fVar95 + fVar122 * fVar99;
                fVar122 = fVar101 * fVar139 + fVar103 * fVar96 + fVar122 * fVar132;
                fVar113 = *(float *)(lVar59 + -0xc + lVar72);
                fVar126 = *(float *)(lVar59 + -8 + lVar72);
                fVar101 = fVar107 * fVar127 + fVar113 * fVar93 + fVar126 * fVar97;
                fVar103 = fVar107 * fVar130 + fVar113 * fVar94 + fVar126 * fVar98;
                fVar92 = fVar107 * fVar136 + fVar113 * fVar95 + fVar126 * fVar99;
                fVar107 = fVar107 * fVar139 + fVar113 * fVar96 + fVar126 * fVar132;
                fVar106 = *(float *)(lVar59 + lVar72);
                fVar6 = *(float *)(lVar59 + 4 + lVar72);
                fVar129 = *(float *)(lVar59 + 8 + lVar72);
                fVar113 = fVar106 * fVar127 + fVar6 * fVar93 + fVar129 * fVar97 +
                          (pAVar13->p).field_0.m128[0];
                fVar126 = fVar106 * fVar130 + fVar6 * fVar94 + fVar129 * fVar98 +
                          *(float *)((long)&(pAVar13->p).field_0 + 4);
                fVar127 = fVar106 * fVar136 + fVar6 * fVar95 + fVar129 * fVar99 +
                          *(float *)((long)&(pAVar13->p).field_0 + 8);
                fVar106 = fVar106 * fVar139 + fVar6 * fVar96 + fVar129 * fVar132 +
                          *(float *)((long)&(pAVar13->p).field_0 + 0xc);
              }
              else {
                uVar61 = uVar61 & 0xffffffff;
                bVar67 = (byte)uVar61 & bVar56;
                uVar68 = CONCAT71((int7)(uVar61 >> 8),bVar67);
                if (bVar67 == 1) {
                  poVar62 = std::operator<<((ostream *)&std::cout,
                                            "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                           );
                  std::endl<char,std::char_traits<char>>(poVar62);
                  fVar77 = *(float *)((long)&(pAVar13->p).field_0 + 0xc);
                  fVar79 = (pAVar13->l).vx.field_0.m128[3];
                  fVar101 = *(float *)((long)&(pAVar13->l).vy.field_0 + 0xc);
                  fVar103 = *(float *)((long)&(pAVar13->l).vz.field_0 + 0xc);
                  VVar8.field_0 = (pAVar13->l).vx.field_0;
                  fVar78 = (pAVar13->l).vy.field_0.m128[0];
                  fVar128 = *(float *)((long)&(pAVar13->l).vy.field_0 + 4);
                  fVar118 = (pAVar13->l).vz.field_0.m128[0];
                  fVar111 = *(float *)((long)&(pAVar13->l).vz.field_0 + 4);
                  fVar122 = *(float *)((long)&(pAVar13->l).vz.field_0 + 8);
                  fVar130 = fVar79 * fVar101 + fVar77 * fVar103;
                  fVar107 = fVar79 * fVar101 - fVar77 * fVar103;
                  fVar113 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar101 * fVar101 +
                            -fVar103 * fVar103;
                  fVar126 = fVar77 * fVar77 - fVar79 * fVar79;
                  fVar127 = fVar101 * fVar101 + fVar126 + -fVar103 * fVar103;
                  fVar139 = fVar79 * fVar103 - fVar77 * fVar101;
                  fVar92 = fVar77 * fVar101 + fVar79 * fVar103;
                  fVar136 = fVar101 * fVar103 + fVar77 * fVar79;
                  fVar77 = fVar101 * fVar103 - fVar77 * fVar79;
                  fVar106 = (pAVar13->p).field_0.m128[0];
                  fVar6 = *(float *)((long)&(pAVar13->p).field_0 + 4);
                  fVar129 = *(float *)((long)&(pAVar13->p).field_0 + 8);
                  fVar130 = fVar130 + fVar130;
                  fVar139 = fVar139 + fVar139;
                  fVar107 = fVar107 + fVar107;
                  fVar136 = fVar136 + fVar136;
                  fVar92 = fVar92 + fVar92;
                  fVar77 = fVar77 + fVar77;
                  fVar79 = fVar103 * fVar103 + fVar126 + -fVar101 * fVar101;
                  fVar114 = fVar113 * 1.0 + fVar130 * 0.0 + fVar139 * 0.0;
                  fVar116 = fVar113 * 0.0 + fVar130 * 1.0 + fVar139 * 0.0;
                  fVar119 = fVar113 * 0.0 + fVar130 * 0.0 + fVar139 * 1.0;
                  fVar121 = fVar113 * 0.0 + fVar130 * 0.0 + fVar139 * 0.0;
                  fVar108 = fVar107 * 1.0 + fVar127 * 0.0 + fVar136 * 0.0;
                  fVar109 = fVar107 * 0.0 + fVar127 * 1.0 + fVar136 * 0.0;
                  fVar110 = fVar107 * 0.0 + fVar127 * 0.0 + fVar136 * 1.0;
                  fVar112 = fVar107 * 0.0 + fVar127 * 0.0 + fVar136 * 0.0;
                  fVar127 = fVar92 * 1.0 + fVar77 * 0.0 + fVar79 * 0.0;
                  fVar93 = fVar92 * 0.0 + fVar77 * 1.0 + fVar79 * 0.0;
                  fVar95 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 1.0;
                  fVar97 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 0.0;
                  local_168 = VVar8.field_0._4_4_;
                  fStack_164 = VVar8.field_0._8_4_;
                  local_178 = VVar8.field_0._0_4_;
                  fVar131 = local_178 * fVar114 + fVar108 * 0.0 + fVar127 * 0.0;
                  fVar133 = local_178 * fVar116 + fVar109 * 0.0 + fVar93 * 0.0;
                  fVar134 = local_178 * fVar119 + fVar110 * 0.0 + fVar95 * 0.0;
                  fVar135 = local_178 * fVar121 + fVar112 * 0.0 + fVar97 * 0.0;
                  fVar139 = fVar78 * fVar114 + fVar128 * fVar108 + fVar127 * 0.0;
                  fVar94 = fVar78 * fVar116 + fVar128 * fVar109 + fVar93 * 0.0;
                  fVar96 = fVar78 * fVar119 + fVar128 * fVar110 + fVar95 * 0.0;
                  fVar98 = fVar78 * fVar121 + fVar128 * fVar112 + fVar97 * 0.0;
                  fVar113 = fVar118 * fVar114 + fVar111 * fVar108 + fVar122 * fVar127;
                  fVar126 = fVar118 * fVar116 + fVar111 * fVar109 + fVar122 * fVar93;
                  fVar130 = fVar118 * fVar119 + fVar111 * fVar110 + fVar122 * fVar95;
                  fVar136 = fVar118 * fVar121 + fVar111 * fVar112 + fVar122 * fVar97;
                  fVar77 = *(float *)(lVar59 + 0xc + lVar72);
                  fVar79 = *(float *)(lVar59 + -0x24 + lVar72);
                  fVar101 = *(float *)(lVar59 + -0x14 + lVar72);
                  fVar103 = *(float *)(lVar59 + -4 + lVar72);
                  fVar132 = fVar79 * fVar101 + fVar77 * fVar103;
                  fVar107 = fVar79 * fVar101 - fVar77 * fVar103;
                  fVar99 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar101 * fVar101 +
                           -fVar103 * fVar103;
                  fVar128 = fVar77 * fVar77 - fVar79 * fVar79;
                  fVar138 = fVar101 * fVar101 + fVar128 + -fVar103 * fVar103;
                  fVar137 = fVar79 * fVar103 - fVar77 * fVar101;
                  fVar104 = fVar77 * fVar101 + fVar79 * fVar103;
                  fVar140 = fVar101 * fVar103 + fVar77 * fVar79;
                  fVar92 = fVar101 * fVar103 - fVar77 * fVar79;
                  pfVar2 = (float *)(lVar59 + -0x30 + lVar72);
                  fVar77 = *pfVar2;
                  pfVar3 = (float *)(lVar59 + -0x20 + lVar72);
                  fVar79 = *pfVar3;
                  fVar78 = pfVar3[1];
                  fVar123 = fVar103 * fVar103 + fVar128 + -fVar101 * fVar101;
                  pfVar1 = (float *)(lVar59 + -0x10 + lVar72);
                  fVar101 = *pfVar1;
                  fVar103 = pfVar1[1];
                  fVar128 = pfVar1[2];
                  fVar132 = fVar132 + fVar132;
                  fVar137 = fVar137 + fVar137;
                  pfVar1 = (float *)(lVar59 + lVar72);
                  fVar118 = *pfVar1;
                  fVar111 = pfVar1[1];
                  fVar122 = pfVar1[2];
                  fVar100 = fVar99 * 1.0 + fVar132 * 0.0 + fVar137 * 0.0;
                  fVar102 = fVar99 * 0.0 + fVar132 * 1.0 + fVar137 * 0.0;
                  fVar137 = fVar99 * 0.0 + fVar132 * 0.0 + fVar137 * 1.0;
                  fVar107 = fVar107 + fVar107;
                  fVar140 = fVar140 + fVar140;
                  fVar104 = fVar104 + fVar104;
                  fVar92 = fVar92 + fVar92;
                  fVar99 = fVar107 * 1.0 + fVar138 * 0.0 + fVar140 * 0.0;
                  fVar132 = fVar107 * 0.0 + fVar138 * 1.0 + fVar140 * 0.0;
                  fVar107 = fVar107 * 0.0 + fVar138 * 0.0 + fVar140 * 1.0;
                  fVar138 = fVar104 * 1.0 + fVar92 * 0.0 + fVar123 * 0.0;
                  fVar140 = fVar104 * 0.0 + fVar92 * 1.0 + fVar123 * 0.0;
                  fVar92 = fVar104 * 0.0 + fVar92 * 0.0 + fVar123 * 1.0;
                  fVar115 = fVar77 * fVar100 + fVar99 * 0.0 + fVar138 * 0.0;
                  fVar117 = fVar77 * fVar102 + fVar132 * 0.0 + fVar140 * 0.0;
                  fVar120 = fVar77 * fVar137 + fVar107 * 0.0 + fVar92 * 0.0;
                  fVar104 = fVar79 * fVar100 + fVar78 * fVar99 + fVar138 * 0.0;
                  fVar123 = fVar79 * fVar102 + fVar78 * fVar132 + fVar140 * 0.0;
                  fVar105 = fVar79 * fVar137 + fVar78 * fVar107 + fVar92 * 0.0;
                  fVar124 = fVar101 * fVar100 + fVar103 * fVar99 + fVar128 * fVar138;
                  fVar125 = fVar101 * fVar102 + fVar103 * fVar132 + fVar128 * fVar140;
                  fVar128 = fVar101 * fVar137 + fVar103 * fVar107 + fVar128 * fVar92;
                  fVar99 = fVar118 * fVar100 + fVar111 * fVar99 + fVar122 * fVar138 +
                           pfVar2[1] + 0.0;
                  fVar132 = fVar118 * fVar102 + fVar111 * fVar132 + fVar122 * fVar140 +
                            pfVar2[2] + 0.0;
                  fVar111 = fVar118 * fVar137 + fVar111 * fVar107 + fVar122 * fVar92 +
                            pfVar3[2] + 0.0;
                  fVar78 = fVar115 * fVar131 + fVar117 * fVar139 + fVar120 * fVar113;
                  local_178 = fVar115 * fVar133 + fVar117 * fVar94 + fVar120 * fVar126;
                  fVar79 = fVar115 * fVar134 + fVar117 * fVar96 + fVar120 * fVar130;
                  fVar77 = fVar104 * fVar131 + fVar123 * fVar139 + fVar105 * fVar113;
                  fVar118 = fVar104 * fVar133 + fVar123 * fVar94 + fVar105 * fVar126;
                  fVar101 = fVar124 * fVar131 + fVar125 * fVar139 + fVar128 * fVar113;
                  fVar103 = fVar124 * fVar133 + fVar125 * fVar94 + fVar128 * fVar126;
                  fVar92 = fVar124 * fVar134 + fVar125 * fVar96 + fVar128 * fVar130;
                  uVar68 = extraout_RDX_00;
                  fVar107 = fVar124 * fVar135 + fVar125 * fVar98 + fVar128 * fVar136;
                  fVar128 = fVar115 * fVar135 + fVar117 * fVar98 + fVar120 * fVar136;
                  fVar113 = fVar99 * fVar131 + fVar132 * fVar139 + fVar111 * fVar113 +
                            fVar106 * fVar114 + fVar6 * fVar108 + fVar129 * fVar127 +
                            local_168 + 0.0;
                  fVar126 = fVar99 * fVar133 + fVar132 * fVar94 + fVar111 * fVar126 +
                            fVar106 * fVar116 + fVar6 * fVar109 + fVar129 * fVar93 +
                            fStack_164 + 0.0;
                  fVar127 = fVar99 * fVar134 + fVar132 * fVar96 + fVar111 * fVar130 +
                            fVar106 * fVar119 + fVar6 * fVar110 + fVar129 * fVar95 +
                            *(float *)((long)&(pAVar13->l).vy.field_0 + 8) + 0.0;
                  fVar106 = fVar99 * fVar135 + fVar132 * fVar98 + fVar111 * fVar136 +
                            fVar106 * fVar121 + fVar6 * fVar112 + fVar129 * fVar97 + 0.0;
                  fVar111 = fVar104 * fVar134 + fVar123 * fVar96 + fVar105 * fVar130;
                  fVar122 = fVar104 * fVar135 + fVar123 * fVar98 + fVar105 * fVar136;
                }
                else {
                  bVar56 = bVar10 ^ 1U | bVar56;
                  if (bVar56 == 0) {
                    local_d8 = ZEXT416(*(uint *)((long)&(pAVar13->p).field_0 + 0xc));
                    local_b8 = ZEXT416((uint)(pAVar13->l).vx.field_0.m128[3]);
                    local_a8 = ZEXT416(*(uint *)((long)&(pAVar13->l).vy.field_0 + 0xc));
                    local_e8 = ZEXT416(*(uint *)((long)&(pAVar13->l).vz.field_0 + 0xc));
                    local_138.p.field_0.m128[0] = (pAVar13->l).vy.field_0.m128[0];
                    local_138.p.field_0.m128[1] = *(float *)((long)&(pAVar13->l).vy.field_0 + 4);
                    fStack_c0 = *(float *)((long)&(pAVar13->l).vy.field_0 + 8);
                    local_138.p.field_0.m128[3] = *(float *)((long)&(pAVar13->l).vy.field_0 + 0xc);
                    local_f8 = (pAVar13->l).vz.field_0.m128[0];
                    fStack_f4 = *(float *)((long)&(pAVar13->l).vz.field_0 + 4);
                    fStack_f0 = *(float *)((long)&(pAVar13->l).vz.field_0 + 8);
                    fStack_ec = *(float *)((long)&(pAVar13->l).vz.field_0 + 0xc);
                    local_88 = (pAVar13->l).vx.field_0.m128[0];
                    fStack_7c = (pAVar13->l).vx.field_0.m128[1];
                    pfVar1 = (float *)(lVar59 + -0x30 + lVar72);
                    fVar77 = *pfVar1;
                    fVar101 = pfVar1[1];
                    fVar103 = pfVar1[2];
                    pfVar1 = (float *)(lVar59 + -0x20 + lVar72);
                    fVar128 = *pfVar1;
                    fVar111 = pfVar1[1];
                    fVar122 = pfVar1[2];
                    puVar71 = (undefined8 *)(lVar59 + -0x10 + lVar72);
                    local_138.l.vz.field_0._0_8_ = *puVar71;
                    local_138.l.vz.field_0._8_8_ = puVar71[1];
                    pfVar1 = (float *)(lVar59 + lVar72);
                    fVar92 = *pfVar1;
                    fVar107 = pfVar1[1];
                    fVar113 = pfVar1[2];
                    fVar78 = fVar77 * local_88 +
                             fVar101 * local_138.p.field_0.m128[0] + fVar103 * local_f8;
                    fVar126 = fVar77 * 0.0 +
                              fVar101 * local_138.p.field_0.m128[1] + fVar103 * fStack_f4;
                    fVar103 = fVar77 * 0.0 + fVar101 * 0.0 + fVar103 * fStack_f0;
                    fVar77 = fVar128 * local_88 +
                             fVar111 * local_138.p.field_0.m128[0] + fVar122 * local_f8;
                    fVar118 = fVar128 * 0.0 +
                              fVar111 * local_138.p.field_0.m128[1] + fVar122 * fStack_f4;
                    fVar101 = fVar128 * 0.0 + fVar111 * 0.0 + fVar122 * fStack_f0;
                    local_138.p.field_0.m128[2] = 0.0;
                    fStack_84 = 0.0;
                    fStack_80 = 0.0;
                    local_98._0_4_ =
                         fVar92 * local_88 +
                         fVar107 * local_138.p.field_0.m128[0] + fVar113 * local_f8 +
                         (pAVar13->p).field_0.m128[0];
                    local_98._4_4_ =
                         fVar92 * 0.0 + fVar107 * local_138.p.field_0.m128[1] + fVar113 * fStack_f4
                         + *(float *)((long)&(pAVar13->p).field_0 + 4);
                    fStack_90 = fVar92 * 0.0 + fVar107 * 0.0 + fVar113 * fStack_f0 +
                                *(float *)((long)&(pAVar13->p).field_0 + 8);
                    register0x0000128c =
                         fVar92 * fStack_7c +
                         fVar107 * local_138.p.field_0.m128[3] + fVar113 * fStack_ec +
                         *(float *)((long)&(pAVar13->p).field_0 + 0xc);
                    local_c8 = local_138.p.field_0.m128[0];
                    fStack_c4 = local_138.p.field_0.m128[1];
                    fStack_bc = local_138.p.field_0.m128[3];
                    if (((fVar126 != 0.0) || (NAN(fVar126))) ||
                       ((fVar103 != 0.0 || (((NAN(fVar103) || (fVar101 != 0.0)) || (NAN(fVar101)))))
                       )) {
                      poVar62 = std::operator<<((ostream *)&std::cout,
                                                "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                               );
                      std::endl<char,std::char_traits<char>>(poVar62);
                      uVar68 = extraout_RDX_02;
                    }
                    fVar101 = local_88 * local_138.l.vz.field_0.m128[0] +
                              local_138.p.field_0.m128[0] * local_138.l.vz.field_0.m128[1] +
                              local_f8 * local_138.l.vz.field_0.m128[2];
                    fVar103 = fStack_84 * local_138.l.vz.field_0.m128[0] +
                              local_138.p.field_0.m128[1] * local_138.l.vz.field_0.m128[1] +
                              fStack_f4 * local_138.l.vz.field_0.m128[2];
                    fVar92 = fStack_80 * local_138.l.vz.field_0.m128[0] +
                             local_138.p.field_0.m128[2] * local_138.l.vz.field_0.m128[1] +
                             fStack_f0 * local_138.l.vz.field_0.m128[2];
                    local_138.l.vy.field_0._8_1_ = 1;
                    fVar107 = (float)local_e8._0_4_;
                    fVar128 = (float)local_b8._0_4_;
                    fVar113 = (float)local_98._0_4_;
                    fVar126 = (float)local_98._4_4_;
                    fVar127 = fStack_90;
                    fVar106 = (float)local_d8._0_4_;
                    fVar111 = fStack_c0;
                    fVar122 = (float)local_a8._0_4_;
                  }
                  else {
                    if (((local_178 != 0.0) || (NAN(local_178))) ||
                       ((fVar79 != 0.0 ||
                        ((NAN(fVar79) ||
                         (uVar60 = *(undefined8 *)&(pAVar13->l).vz.field_0,
                         auVar18._4_4_ = -(uint)((pAVar13->l).vy.field_0.m128[0] != 0.0),
                         auVar18._0_4_ =
                              -(uint)(*(float *)((long)&(pAVar13->l).vy.field_0 + 8) != 0.0),
                         auVar18._8_4_ = -(uint)((float)uVar60 != 0.0),
                         auVar18._12_4_ = -(uint)((float)((ulong)uVar60 >> 0x20) != 0.0),
                         uVar57 = movmskps((int)CONCAT71(uVar65,bVar56),auVar18),
                         (char)uVar57 != '\0')))))) {
                      poVar62 = std::operator<<((ostream *)&std::cout,
                                                "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                               );
                      std::endl<char,std::char_traits<char>>(poVar62);
                      uVar68 = extraout_RDX_01;
                    }
                    pfVar2 = (float *)(lVar59 + -0x30 + lVar72);
                    pfVar3 = (float *)(lVar59 + -0x20 + lVar72);
                    fVar77 = *pfVar3;
                    pfVar4 = (float *)(lVar59 + -0x10 + lVar72);
                    fVar101 = *pfVar4;
                    fVar103 = pfVar4[1];
                    pfVar1 = (float *)(lVar59 + lVar72);
                    uVar60 = *(undefined8 *)&(pAVar13->p).field_0;
                    fVar78 = (pAVar13->l).vx.field_0.m128[0] * *pfVar2;
                    local_178 = pfVar2[1] + (float)uVar60;
                    fVar79 = pfVar2[2] + (float)((ulong)uVar60 >> 0x20);
                    fVar118 = pfVar3[1] * *(float *)((long)&(pAVar13->l).vy.field_0 + 4);
                    fVar92 = pfVar4[2] * *(float *)((long)&(pAVar13->l).vz.field_0 + 8);
                    local_138.l.vy.field_0._8_1_ = 1;
                    fVar107 = pfVar4[3];
                    fVar128 = pfVar2[3];
                    fVar113 = *pfVar1;
                    fVar126 = pfVar1[1];
                    fVar127 = pfVar1[2];
                    fVar106 = pfVar1[3];
                    fVar111 = pfVar3[2] + *(float *)((long)&(pAVar13->p).field_0 + 8);
                    fVar122 = pfVar3[3];
                  }
                }
              }
            }
            else {
              auVar15._4_4_ = -(uint)((pAVar13->l).vy.field_0.m128[0] != 0.0);
              auVar15._0_4_ = -(uint)((pAVar13->l).vx.field_0.m128[3] != 0.0);
              auVar15._8_4_ = -(uint)(*(float *)((long)&(pAVar13->l).vy.field_0 + 4) != 1.0);
              auVar15._12_4_ = -(uint)(*(float *)((long)&(pAVar13->l).vy.field_0 + 8) != 0.0);
              uVar73 = movmskps(uVar73,auVar15);
              if ((((bVar10 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) ||
                 (((uVar73 & 4) != 0 ||
                  (bVar67 = ((byte)uVar73 & 8) >> 3, uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67),
                  bVar67 != 0)))) goto LAB_00187349;
              auVar16._4_4_ = -(uint)((pAVar13->l).vz.field_0.m128[0] != 0.0);
              auVar16._0_4_ = -(uint)(*(float *)((long)&(pAVar13->l).vy.field_0 + 0xc) != 0.0);
              auVar16._8_4_ = -(uint)(*(float *)((long)&(pAVar13->l).vz.field_0 + 4) != 0.0);
              auVar16._12_4_ = -(uint)(*(float *)((long)&(pAVar13->l).vz.field_0 + 8) != 1.0);
              uVar73 = movmskps(uVar73,auVar16);
              if (((((bVar10 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) || ((uVar73 & 4) != 0))
                 || (bVar67 = ((byte)uVar73 & 8) >> 3, uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67)
                    , bVar67 != 0)) goto LAB_00187349;
              auVar17._4_4_ = -(uint)((pAVar13->p).field_0.m128[0] != 0.0);
              auVar17._0_4_ = -(uint)(*(float *)((long)&(pAVar13->l).vz.field_0 + 0xc) != 0.0);
              auVar17._8_4_ = -(uint)(*(float *)((long)&(pAVar13->p).field_0 + 4) != 0.0);
              auVar17._12_4_ = -(uint)(*(float *)((long)&(pAVar13->p).field_0 + 8) != 0.0);
              uVar73 = movmskps(uVar73,auVar17);
              if ((((bVar10 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) || ((uVar73 & 4) != 0))
              goto LAB_00187349;
              bVar67 = ((byte)uVar73 & 8) >> 3;
              uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67);
              uVar68 = (ulong)uVar73;
              if ((bVar67 != 0) ||
                 ((bVar10 != false &&
                  ((fVar77 = *(float *)((long)&(pAVar13->p).field_0 + 0xc), fVar77 != 1.0 ||
                   (NAN(fVar77))))))) goto LAB_00187349;
              pfVar1 = (float *)(lVar59 + -0x30 + lVar72);
              fVar78 = *pfVar1;
              local_178 = pfVar1[1];
              fVar79 = pfVar1[2];
              fVar128 = pfVar1[3];
              pfVar1 = (float *)(lVar59 + -0x20 + lVar72);
              fVar77 = *pfVar1;
              fVar118 = pfVar1[1];
              fVar111 = pfVar1[2];
              fVar122 = pfVar1[3];
              pfVar1 = (float *)(lVar59 + -0x10 + lVar72);
              fVar101 = *pfVar1;
              fVar103 = pfVar1[1];
              fVar92 = pfVar1[2];
              fVar107 = pfVar1[3];
              pfVar1 = (float *)(lVar59 + lVar72);
              fVar113 = *pfVar1;
              fVar126 = pfVar1[1];
              fVar127 = pfVar1[2];
              fVar106 = pfVar1[3];
              local_138.l.vy.field_0._8_1_ = bVar56;
            }
LAB_00187a67:
            pfVar1 = (float *)((long)&((Vector *)(local_138.l.vy.field_0._0_8_ + -0x30))->field_0 +
                              lVar72);
            *pfVar1 = fVar78;
            pfVar1[1] = local_178;
            pfVar1[2] = fVar79;
            pfVar1[3] = fVar128;
            pfVar1 = (float *)((long)&((Vector *)(local_138.l.vy.field_0._0_8_ + -0x20))->field_0 +
                              lVar72);
            *pfVar1 = fVar77;
            pfVar1[1] = fVar118;
            pfVar1[2] = fVar111;
            pfVar1[3] = fVar122;
            pfVar1 = (float *)((long)&((Vector *)(local_138.l.vy.field_0._0_8_ + -0x10))->field_0 +
                              lVar72);
            *pfVar1 = fVar101;
            pfVar1[1] = fVar103;
            pfVar1[2] = fVar92;
            pfVar1[3] = fVar107;
            pfVar1 = (float *)(local_138.l.vy.field_0._0_8_ + lVar72);
            *pfVar1 = fVar113;
            pfVar1[1] = fVar126;
            pfVar1[2] = fVar127;
            pfVar1[3] = fVar106;
            lVar72 = lVar72 + 0x40;
            uVar60 = local_138.l.vy.field_0._0_8_;
          }
        }
        else if (plVar58[0xf] == 1) {
          fVar77 = (pTVar63->time_range).lower;
          fVar79 = (pTVar63->time_range).upper;
          fVar101 = (float)plVar58[0xd];
          fVar103 = (float)((ulong)plVar58[0xd] >> 0x20);
          uVar73 = -(uint)(fVar77 < fVar101);
          uVar75 = -(uint)(fVar79 < fVar103);
          local_148._0_8_ =
               CONCAT44(~uVar75 & (uint)fVar103,~uVar73 & (uint)fVar77) |
               CONCAT44((uint)fVar79 & uVar75,(uint)fVar101 & uVar73);
          local_138.l.vy.field_0._0_8_ = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
          local_138.l.vx.field_0._0_8_ = 0;
          local_138.l.vx.field_0._8_8_ = 0;
          if (sVar12 != 0) {
            local_138.l.vy.field_0._0_8_ = alignedMalloc(sVar12 << 6,0x10);
            uVar68 = extraout_RDX_03;
            local_138.l.vx.field_0._8_8_ = sVar12;
          }
          uVar60 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
          if (pTVar63->quaternion == false) {
            uVar60 = ZEXT48(*(uint *)(plVar58 + 0x12));
          }
          local_138.l.vy.field_0._8_1_ = (undefined1)uVar60;
          local_138.l.vx.field_0._0_8_ = local_138.l.vx.field_0._8_8_;
          for (uVar69 = 0; uVar73 = (uint)uVar68, uVar69 < (pTVar63->spaces).size_active;
              uVar69 = uVar69 + 1) {
            pAVar13 = (pTVar63->spaces).items;
            pfVar1 = (float *)plVar58[0x11];
            bVar10 = pTVar63->quaternion;
            uVar65 = (undefined7)((ulong)uVar60 >> 8);
            uVar61 = CONCAT71(uVar65,bVar10);
            bVar56 = *(byte *)(plVar58 + 0x12);
            local_138.l.vy.field_0._8_1_ = 0;
            fVar77 = *(float *)((long)pAVar13 + lVar72 + -0x30);
            uVar60 = *(undefined8 *)((long)pAVar13 + lVar72 + -0x2c);
            fVar79 = (float)((ulong)uVar60 >> 0x20);
            local_178 = (float)uVar60;
            if (((((fVar77 != 1.0) || (NAN(fVar77))) || (local_178 != 0.0)) ||
                ((NAN(local_178) || (fVar79 != 0.0)))) || (NAN(fVar79))) {
LAB_00187f87:
              fVar101 = (float)*(undefined8 *)pfVar1;
              fVar103 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
              iVar74 = -(uint)(fVar101 != 1.0);
              iVar76 = -(uint)(fVar103 != 0.0);
              auVar83._4_4_ = iVar76;
              auVar83._0_4_ = iVar74;
              auVar83._8_4_ = iVar76;
              auVar83._12_4_ = iVar76;
              auVar82._8_8_ = auVar83._8_8_;
              auVar82._4_4_ = iVar74;
              auVar82._0_4_ = iVar74;
              uVar73 = movmskpd(uVar73,auVar82);
              fVar77 = pfVar1[2];
              if (((((uVar73 & 1) == 0) && (bVar67 = (byte)uVar73 >> 1, bVar67 == 0)) &&
                  (fVar77 == 0.0)) && (!NAN(fVar77))) {
                auVar41._4_4_ = -(uint)(pfVar1[4] != 0.0);
                auVar41._0_4_ = -(uint)(pfVar1[3] != 0.0);
                auVar41._8_4_ = -(uint)(pfVar1[5] != 1.0);
                auVar41._12_4_ = -(uint)(pfVar1[6] != 0.0);
                uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar67),auVar41);
                if ((((bVar56 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                   (((uVar73 & 4) == 0 && (bVar67 = ((byte)uVar73 & 8) >> 3, bVar67 == 0)))) {
                  auVar42._4_4_ = -(uint)(pfVar1[8] != 0.0);
                  auVar42._0_4_ = -(uint)(pfVar1[7] != 0.0);
                  auVar42._8_4_ = -(uint)(pfVar1[9] != 0.0);
                  auVar42._12_4_ = -(uint)(pfVar1[10] != 1.0);
                  uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar67),auVar42);
                  if ((((bVar56 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                     (((uVar73 & 4) == 0 && (bVar67 = ((byte)uVar73 & 8) >> 3, bVar67 == 0)))) {
                    auVar43._4_4_ = -(uint)(pfVar1[0xc] != 0.0);
                    auVar43._0_4_ = -(uint)(pfVar1[0xb] != 0.0);
                    auVar43._8_4_ = -(uint)(pfVar1[0xd] != 0.0);
                    auVar43._12_4_ = -(uint)(pfVar1[0xe] != 0.0);
                    uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar67),auVar43);
                    if ((((((bVar56 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                         ((uVar73 & 4) == 0)) &&
                        (bVar67 = ((byte)uVar73 & 8) >> 3,
                        uVar68 = (ulong)CONCAT31((int3)(uVar73 >> 8),bVar67), bVar67 == 0)) &&
                       ((bVar56 == 0 || ((pfVar1[0xf] == 1.0 && (!NAN(pfVar1[0xf]))))))) {
                      pfVar1 = (float *)((long)pAVar13 + lVar72 + -0x30);
                      fVar78 = *pfVar1;
                      local_178 = pfVar1[1];
                      fVar79 = pfVar1[2];
                      fVar128 = pfVar1[3];
                      pfVar1 = (float *)((long)pAVar13 + lVar72 + -0x20);
                      fVar77 = *pfVar1;
                      fVar118 = pfVar1[1];
                      fVar111 = pfVar1[2];
                      fVar122 = pfVar1[3];
                      pfVar1 = (float *)((long)pAVar13 + lVar72 + -0x10);
                      fVar101 = *pfVar1;
                      fVar103 = pfVar1[1];
                      fVar92 = pfVar1[2];
                      fVar107 = pfVar1[3];
                      pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar72);
                      fVar113 = *pfVar1;
                      fVar126 = pfVar1[1];
                      fVar127 = pfVar1[2];
                      fVar106 = pfVar1[3];
                      local_138.l.vy.field_0._8_1_ = bVar10;
                      goto LAB_001886a3;
                    }
                  }
                }
              }
              uVar68 = uVar61 & 0xffffffff;
              bVar67 = (byte)uVar68 | bVar56;
              uVar68 = CONCAT71((int7)(uVar68 >> 8),bVar67);
              if (bVar67 == 0) {
                pfVar2 = (float *)((long)pAVar13 + lVar72 + -0x30);
                fVar127 = *pfVar2;
                fVar130 = pfVar2[1];
                fVar136 = pfVar2[2];
                fVar139 = pfVar2[3];
                pfVar2 = (float *)((long)pAVar13 + lVar72 + -0x20);
                fVar93 = *pfVar2;
                fVar94 = pfVar2[1];
                fVar95 = pfVar2[2];
                fVar96 = pfVar2[3];
                pfVar2 = (float *)((long)pAVar13 + lVar72 + -0x10);
                fVar97 = *pfVar2;
                fVar98 = pfVar2[1];
                fVar99 = pfVar2[2];
                fVar132 = pfVar2[3];
                fVar78 = fVar101 * fVar127 + fVar103 * fVar93 + fVar77 * fVar97;
                local_178 = fVar101 * fVar130 + fVar103 * fVar94 + fVar77 * fVar98;
                fVar79 = fVar101 * fVar136 + fVar103 * fVar95 + fVar77 * fVar99;
                fVar128 = fVar101 * fVar139 + fVar103 * fVar96 + fVar77 * fVar132;
                fVar101 = pfVar1[4];
                fVar103 = pfVar1[5];
                fVar122 = pfVar1[6];
                fVar107 = pfVar1[8];
                fVar77 = fVar101 * fVar127 + fVar103 * fVar93 + fVar122 * fVar97;
                fVar118 = fVar101 * fVar130 + fVar103 * fVar94 + fVar122 * fVar98;
                fVar111 = fVar101 * fVar136 + fVar103 * fVar95 + fVar122 * fVar99;
                fVar122 = fVar101 * fVar139 + fVar103 * fVar96 + fVar122 * fVar132;
                fVar113 = pfVar1[9];
                fVar126 = pfVar1[10];
                fVar101 = fVar107 * fVar127 + fVar113 * fVar93 + fVar126 * fVar97;
                fVar103 = fVar107 * fVar130 + fVar113 * fVar94 + fVar126 * fVar98;
                fVar92 = fVar107 * fVar136 + fVar113 * fVar95 + fVar126 * fVar99;
                fVar107 = fVar107 * fVar139 + fVar113 * fVar96 + fVar126 * fVar132;
                fVar106 = pfVar1[0xc];
                fVar6 = pfVar1[0xd];
                fVar129 = pfVar1[0xe];
                pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar72);
                fVar113 = fVar106 * fVar127 + fVar6 * fVar93 + fVar129 * fVar97 + *pfVar1;
                fVar126 = fVar106 * fVar130 + fVar6 * fVar94 + fVar129 * fVar98 + pfVar1[1];
                fVar127 = fVar106 * fVar136 + fVar6 * fVar95 + fVar129 * fVar99 + pfVar1[2];
                fVar106 = fVar106 * fVar139 + fVar6 * fVar96 + fVar129 * fVar132 + pfVar1[3];
              }
              else {
                uVar61 = uVar61 & 0xffffffff;
                bVar67 = (byte)uVar61 & bVar56;
                uVar68 = CONCAT71((int7)(uVar61 >> 8),bVar67);
                if (bVar67 == 1) {
                  poVar62 = std::operator<<((ostream *)&std::cout,
                                            "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                           );
                  std::endl<char,std::char_traits<char>>(poVar62);
                  fVar77 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar72 + 0xc);
                  fVar79 = *(float *)((long)pAVar13 + lVar72 + -0x24);
                  fVar101 = *(float *)((long)pAVar13 + lVar72 + -0x14);
                  fVar103 = *(float *)((long)pAVar13 + lVar72 + -4);
                  auVar9 = *(undefined1 (*) [16])((long)pAVar13 + lVar72 + -0x30);
                  pfVar2 = (float *)((long)pAVar13 + lVar72 + -0x20);
                  fVar78 = *pfVar2;
                  fVar128 = pfVar2[1];
                  pfVar3 = (float *)((long)pAVar13 + lVar72 + -0x10);
                  fVar118 = *pfVar3;
                  fVar111 = pfVar3[1];
                  fVar122 = pfVar3[2];
                  fVar130 = fVar79 * fVar101 + fVar77 * fVar103;
                  fVar107 = fVar79 * fVar101 - fVar77 * fVar103;
                  fVar113 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar101 * fVar101 +
                            -fVar103 * fVar103;
                  fVar126 = fVar77 * fVar77 - fVar79 * fVar79;
                  fVar127 = fVar101 * fVar101 + fVar126 + -fVar103 * fVar103;
                  fVar139 = fVar79 * fVar103 - fVar77 * fVar101;
                  fVar92 = fVar77 * fVar101 + fVar79 * fVar103;
                  fVar136 = fVar101 * fVar103 + fVar77 * fVar79;
                  fVar77 = fVar101 * fVar103 - fVar77 * fVar79;
                  pfVar3 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar72);
                  fVar106 = *pfVar3;
                  fVar6 = pfVar3[1];
                  fVar129 = pfVar3[2];
                  fVar130 = fVar130 + fVar130;
                  fVar139 = fVar139 + fVar139;
                  fVar107 = fVar107 + fVar107;
                  fVar136 = fVar136 + fVar136;
                  fVar92 = fVar92 + fVar92;
                  fVar77 = fVar77 + fVar77;
                  fVar79 = fVar103 * fVar103 + fVar126 + -fVar101 * fVar101;
                  fVar114 = fVar113 * 1.0 + fVar130 * 0.0 + fVar139 * 0.0;
                  fVar116 = fVar113 * 0.0 + fVar130 * 1.0 + fVar139 * 0.0;
                  fVar119 = fVar113 * 0.0 + fVar130 * 0.0 + fVar139 * 1.0;
                  fVar121 = fVar113 * 0.0 + fVar130 * 0.0 + fVar139 * 0.0;
                  fVar108 = fVar107 * 1.0 + fVar127 * 0.0 + fVar136 * 0.0;
                  fVar109 = fVar107 * 0.0 + fVar127 * 1.0 + fVar136 * 0.0;
                  fVar110 = fVar107 * 0.0 + fVar127 * 0.0 + fVar136 * 1.0;
                  fVar112 = fVar107 * 0.0 + fVar127 * 0.0 + fVar136 * 0.0;
                  fVar127 = fVar92 * 1.0 + fVar77 * 0.0 + fVar79 * 0.0;
                  fVar93 = fVar92 * 0.0 + fVar77 * 1.0 + fVar79 * 0.0;
                  fVar95 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 1.0;
                  fVar97 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 0.0;
                  local_168 = auVar9._4_4_;
                  fStack_164 = auVar9._8_4_;
                  local_178 = auVar9._0_4_;
                  fVar131 = local_178 * fVar114 + fVar108 * 0.0 + fVar127 * 0.0;
                  fVar133 = local_178 * fVar116 + fVar109 * 0.0 + fVar93 * 0.0;
                  fVar134 = local_178 * fVar119 + fVar110 * 0.0 + fVar95 * 0.0;
                  fVar135 = local_178 * fVar121 + fVar112 * 0.0 + fVar97 * 0.0;
                  fVar139 = fVar78 * fVar114 + fVar128 * fVar108 + fVar127 * 0.0;
                  fVar94 = fVar78 * fVar116 + fVar128 * fVar109 + fVar93 * 0.0;
                  fVar96 = fVar78 * fVar119 + fVar128 * fVar110 + fVar95 * 0.0;
                  fVar98 = fVar78 * fVar121 + fVar128 * fVar112 + fVar97 * 0.0;
                  fVar113 = fVar118 * fVar114 + fVar111 * fVar108 + fVar122 * fVar127;
                  fVar126 = fVar118 * fVar116 + fVar111 * fVar109 + fVar122 * fVar93;
                  fVar130 = fVar118 * fVar119 + fVar111 * fVar110 + fVar122 * fVar95;
                  fVar136 = fVar118 * fVar121 + fVar111 * fVar112 + fVar122 * fVar97;
                  fVar77 = pfVar1[0xf];
                  fVar79 = pfVar1[3];
                  fVar101 = pfVar1[7];
                  fVar103 = pfVar1[0xb];
                  fVar132 = fVar79 * fVar101 + fVar77 * fVar103;
                  fVar107 = fVar79 * fVar101 - fVar77 * fVar103;
                  fVar99 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar101 * fVar101 +
                           -fVar103 * fVar103;
                  fVar128 = fVar77 * fVar77 - fVar79 * fVar79;
                  fVar138 = fVar101 * fVar101 + fVar128 + -fVar103 * fVar103;
                  fVar137 = fVar79 * fVar103 - fVar77 * fVar101;
                  fVar104 = fVar77 * fVar101 + fVar79 * fVar103;
                  fVar140 = fVar101 * fVar103 + fVar77 * fVar79;
                  fVar92 = fVar101 * fVar103 - fVar77 * fVar79;
                  fVar77 = *pfVar1;
                  fVar79 = pfVar1[4];
                  fVar78 = pfVar1[5];
                  fVar123 = fVar103 * fVar103 + fVar128 + -fVar101 * fVar101;
                  fVar101 = pfVar1[8];
                  fVar103 = pfVar1[9];
                  fVar128 = pfVar1[10];
                  fVar132 = fVar132 + fVar132;
                  fVar137 = fVar137 + fVar137;
                  fVar118 = pfVar1[0xc];
                  fVar111 = pfVar1[0xd];
                  fVar122 = pfVar1[0xe];
                  fVar100 = fVar99 * 1.0 + fVar132 * 0.0 + fVar137 * 0.0;
                  fVar102 = fVar99 * 0.0 + fVar132 * 1.0 + fVar137 * 0.0;
                  fVar137 = fVar99 * 0.0 + fVar132 * 0.0 + fVar137 * 1.0;
                  fVar107 = fVar107 + fVar107;
                  fVar140 = fVar140 + fVar140;
                  fVar104 = fVar104 + fVar104;
                  fVar92 = fVar92 + fVar92;
                  fVar99 = fVar107 * 1.0 + fVar138 * 0.0 + fVar140 * 0.0;
                  fVar132 = fVar107 * 0.0 + fVar138 * 1.0 + fVar140 * 0.0;
                  fVar107 = fVar107 * 0.0 + fVar138 * 0.0 + fVar140 * 1.0;
                  fVar138 = fVar104 * 1.0 + fVar92 * 0.0 + fVar123 * 0.0;
                  fVar140 = fVar104 * 0.0 + fVar92 * 1.0 + fVar123 * 0.0;
                  fVar92 = fVar104 * 0.0 + fVar92 * 0.0 + fVar123 * 1.0;
                  fVar115 = fVar77 * fVar100 + fVar99 * 0.0 + fVar138 * 0.0;
                  fVar117 = fVar77 * fVar102 + fVar132 * 0.0 + fVar140 * 0.0;
                  fVar120 = fVar77 * fVar137 + fVar107 * 0.0 + fVar92 * 0.0;
                  fVar104 = fVar79 * fVar100 + fVar78 * fVar99 + fVar138 * 0.0;
                  fVar123 = fVar79 * fVar102 + fVar78 * fVar132 + fVar140 * 0.0;
                  fVar105 = fVar79 * fVar137 + fVar78 * fVar107 + fVar92 * 0.0;
                  fVar124 = fVar101 * fVar100 + fVar103 * fVar99 + fVar128 * fVar138;
                  fVar125 = fVar101 * fVar102 + fVar103 * fVar132 + fVar128 * fVar140;
                  fVar128 = fVar101 * fVar137 + fVar103 * fVar107 + fVar128 * fVar92;
                  fVar99 = fVar118 * fVar100 + fVar111 * fVar99 + fVar122 * fVar138 +
                           pfVar1[1] + 0.0;
                  fVar132 = fVar118 * fVar102 + fVar111 * fVar132 + fVar122 * fVar140 +
                            pfVar1[2] + 0.0;
                  fVar111 = fVar118 * fVar137 + fVar111 * fVar107 + fVar122 * fVar92 +
                            pfVar1[6] + 0.0;
                  fVar78 = fVar115 * fVar131 + fVar117 * fVar139 + fVar120 * fVar113;
                  local_178 = fVar115 * fVar133 + fVar117 * fVar94 + fVar120 * fVar126;
                  fVar79 = fVar115 * fVar134 + fVar117 * fVar96 + fVar120 * fVar130;
                  fVar77 = fVar104 * fVar131 + fVar123 * fVar139 + fVar105 * fVar113;
                  fVar118 = fVar104 * fVar133 + fVar123 * fVar94 + fVar105 * fVar126;
                  fVar101 = fVar124 * fVar131 + fVar125 * fVar139 + fVar128 * fVar113;
                  fVar103 = fVar124 * fVar133 + fVar125 * fVar94 + fVar128 * fVar126;
                  fVar92 = fVar124 * fVar134 + fVar125 * fVar96 + fVar128 * fVar130;
                  uVar68 = extraout_RDX_04;
                  fVar107 = fVar124 * fVar135 + fVar125 * fVar98 + fVar128 * fVar136;
                  fVar128 = fVar115 * fVar135 + fVar117 * fVar98 + fVar120 * fVar136;
                  fVar113 = fVar99 * fVar131 + fVar132 * fVar139 + fVar111 * fVar113 +
                            fVar106 * fVar114 + fVar6 * fVar108 + fVar129 * fVar127 +
                            local_168 + 0.0;
                  fVar126 = fVar99 * fVar133 + fVar132 * fVar94 + fVar111 * fVar126 +
                            fVar106 * fVar116 + fVar6 * fVar109 + fVar129 * fVar93 +
                            fStack_164 + 0.0;
                  fVar127 = fVar99 * fVar134 + fVar132 * fVar96 + fVar111 * fVar130 +
                            fVar106 * fVar119 + fVar6 * fVar110 + fVar129 * fVar95 + pfVar2[2] + 0.0
                  ;
                  fVar106 = fVar99 * fVar135 + fVar132 * fVar98 + fVar111 * fVar136 +
                            fVar106 * fVar121 + fVar6 * fVar112 + fVar129 * fVar97 + 0.0;
                  fVar111 = fVar104 * fVar134 + fVar123 * fVar96 + fVar105 * fVar130;
                  fVar122 = fVar104 * fVar135 + fVar123 * fVar98 + fVar105 * fVar136;
                }
                else {
                  bVar56 = bVar10 ^ 1U | bVar56;
                  if (bVar56 == 0) {
                    local_d8 = ZEXT416(*(uint *)((long)&(pAVar13->l).vx.field_0 + lVar72 + 0xc));
                    local_b8 = ZEXT416(*(uint *)((long)pAVar13 + lVar72 + -0x24));
                    local_a8 = ZEXT416(*(uint *)((long)pAVar13 + lVar72 + -0x14));
                    local_e8 = ZEXT416(*(uint *)((long)pAVar13 + lVar72 + -4));
                    pfVar2 = (float *)((long)pAVar13 + lVar72 + -0x20);
                    local_138.p.field_0.m128[0] = *pfVar2;
                    local_138.p.field_0.m128[1] = pfVar2[1];
                    fStack_c0 = pfVar2[2];
                    local_138.p.field_0.m128[3] = pfVar2[3];
                    pfVar2 = (float *)((long)pAVar13 + lVar72 + -0x10);
                    local_f8 = *pfVar2;
                    fStack_f4 = pfVar2[1];
                    fStack_f0 = pfVar2[2];
                    fStack_ec = pfVar2[3];
                    pfVar2 = (float *)((long)pAVar13 + lVar72 + -0x30);
                    local_88 = *pfVar2;
                    fStack_7c = pfVar2[1];
                    fVar77 = *pfVar1;
                    fVar101 = pfVar1[1];
                    fVar103 = pfVar1[2];
                    fVar128 = pfVar1[4];
                    fVar111 = pfVar1[5];
                    fVar122 = pfVar1[6];
                    local_138.l.vz.field_0._0_8_ = *(undefined8 *)(pfVar1 + 8);
                    local_138.l.vz.field_0._8_8_ = *(undefined8 *)(pfVar1 + 10);
                    fVar92 = pfVar1[0xc];
                    fVar107 = pfVar1[0xd];
                    fVar113 = pfVar1[0xe];
                    fVar78 = fVar77 * local_88 +
                             fVar101 * local_138.p.field_0.m128[0] + fVar103 * local_f8;
                    fVar126 = fVar77 * 0.0 +
                              fVar101 * local_138.p.field_0.m128[1] + fVar103 * fStack_f4;
                    fVar103 = fVar77 * 0.0 + fVar101 * 0.0 + fVar103 * fStack_f0;
                    fVar77 = fVar128 * local_88 +
                             fVar111 * local_138.p.field_0.m128[0] + fVar122 * local_f8;
                    fVar118 = fVar128 * 0.0 +
                              fVar111 * local_138.p.field_0.m128[1] + fVar122 * fStack_f4;
                    fVar101 = fVar128 * 0.0 + fVar111 * 0.0 + fVar122 * fStack_f0;
                    local_138.p.field_0.m128[2] = 0.0;
                    fStack_84 = 0.0;
                    fStack_80 = 0.0;
                    pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar72);
                    local_98._0_4_ =
                         fVar92 * local_88 +
                         fVar107 * local_138.p.field_0.m128[0] + fVar113 * local_f8 + *pfVar1;
                    local_98._4_4_ =
                         fVar92 * 0.0 + fVar107 * local_138.p.field_0.m128[1] + fVar113 * fStack_f4
                         + pfVar1[1];
                    fStack_90 = fVar92 * 0.0 + fVar107 * 0.0 + fVar113 * fStack_f0 + pfVar1[2];
                    register0x0000128c =
                         fVar92 * fStack_7c +
                         fVar107 * local_138.p.field_0.m128[3] + fVar113 * fStack_ec + pfVar1[3];
                    local_c8 = local_138.p.field_0.m128[0];
                    fStack_c4 = local_138.p.field_0.m128[1];
                    fStack_bc = local_138.p.field_0.m128[3];
                    if (((fVar126 != 0.0) || (NAN(fVar126))) ||
                       ((fVar103 != 0.0 || (((NAN(fVar103) || (fVar101 != 0.0)) || (NAN(fVar101)))))
                       )) {
                      poVar62 = std::operator<<((ostream *)&std::cout,
                                                "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                               );
                      std::endl<char,std::char_traits<char>>(poVar62);
                      uVar68 = extraout_RDX_06;
                    }
                    fVar101 = local_88 * local_138.l.vz.field_0.m128[0] +
                              local_138.p.field_0.m128[0] * local_138.l.vz.field_0.m128[1] +
                              local_f8 * local_138.l.vz.field_0.m128[2];
                    fVar103 = fStack_84 * local_138.l.vz.field_0.m128[0] +
                              local_138.p.field_0.m128[1] * local_138.l.vz.field_0.m128[1] +
                              fStack_f4 * local_138.l.vz.field_0.m128[2];
                    fVar92 = fStack_80 * local_138.l.vz.field_0.m128[0] +
                             local_138.p.field_0.m128[2] * local_138.l.vz.field_0.m128[1] +
                             fStack_f0 * local_138.l.vz.field_0.m128[2];
                    local_138.l.vy.field_0._8_1_ = 1;
                    fVar107 = (float)local_e8._0_4_;
                    fVar128 = (float)local_b8._0_4_;
                    fVar113 = (float)local_98._0_4_;
                    fVar126 = (float)local_98._4_4_;
                    fVar127 = fStack_90;
                    fVar106 = (float)local_d8._0_4_;
                    fVar111 = fStack_c0;
                    fVar122 = (float)local_a8._0_4_;
                  }
                  else {
                    if (((local_178 != 0.0) || (NAN(local_178))) ||
                       ((fVar79 != 0.0 ||
                        ((NAN(fVar79) ||
                         (uVar60 = *(undefined8 *)((long)pAVar13 + lVar72 + -0x10),
                         auVar22._4_4_ = -(uint)(*(float *)((long)pAVar13 + lVar72 + -0x20) != 0.0),
                         auVar22._0_4_ = -(uint)(*(float *)((long)pAVar13 + lVar72 + -0x18) != 0.0),
                         auVar22._8_4_ = -(uint)((float)uVar60 != 0.0),
                         auVar22._12_4_ = -(uint)((float)((ulong)uVar60 >> 0x20) != 0.0),
                         uVar57 = movmskps((int)CONCAT71(uVar65,bVar56),auVar22),
                         (char)uVar57 != '\0')))))) {
                      poVar62 = std::operator<<((ostream *)&std::cout,
                                                "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                               );
                      std::endl<char,std::char_traits<char>>(poVar62);
                      uVar68 = extraout_RDX_05;
                    }
                    fVar77 = pfVar1[4];
                    fVar101 = pfVar1[8];
                    fVar103 = pfVar1[9];
                    uVar60 = *(undefined8 *)((long)&(pAVar13->l).vx.field_0 + lVar72);
                    fVar78 = *(float *)((long)pAVar13 + lVar72 + -0x30) * *pfVar1;
                    local_178 = pfVar1[1] + (float)uVar60;
                    fVar79 = pfVar1[2] + (float)((ulong)uVar60 >> 0x20);
                    fVar118 = pfVar1[5] * *(float *)((long)pAVar13 + lVar72 + -0x1c);
                    fVar92 = pfVar1[10] * *(float *)((long)pAVar13 + lVar72 + -8);
                    local_138.l.vy.field_0._8_1_ = 1;
                    fVar107 = pfVar1[0xb];
                    fVar128 = pfVar1[3];
                    fVar113 = pfVar1[0xc];
                    fVar126 = pfVar1[0xd];
                    fVar127 = pfVar1[0xe];
                    fVar106 = pfVar1[0xf];
                    fVar111 = pfVar1[6] + *(float *)((long)&(pAVar13->l).vx.field_0 + lVar72 + 8);
                    fVar122 = pfVar1[7];
                  }
                }
              }
            }
            else {
              pfVar2 = (float *)((long)pAVar13 + lVar72 + -0x24);
              auVar19._4_4_ = -(uint)(pfVar2[1] != 0.0);
              auVar19._0_4_ = -(uint)(*pfVar2 != 0.0);
              auVar19._8_4_ = -(uint)(pfVar2[2] != 1.0);
              auVar19._12_4_ = -(uint)(pfVar2[3] != 0.0);
              uVar73 = movmskps(uVar73,auVar19);
              if ((((bVar10 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) ||
                 (((uVar73 & 4) != 0 ||
                  (bVar67 = ((byte)uVar73 & 8) >> 3, uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67),
                  bVar67 != 0)))) goto LAB_00187f87;
              pfVar2 = (float *)((long)pAVar13 + lVar72 + -0x14);
              auVar20._4_4_ = -(uint)(pfVar2[1] != 0.0);
              auVar20._0_4_ = -(uint)(*pfVar2 != 0.0);
              auVar20._8_4_ = -(uint)(pfVar2[2] != 0.0);
              auVar20._12_4_ = -(uint)(pfVar2[3] != 1.0);
              uVar73 = movmskps(uVar73,auVar20);
              if (((((bVar10 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) || ((uVar73 & 4) != 0))
                 || (bVar67 = ((byte)uVar73 & 8) >> 3, uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67)
                    , bVar67 != 0)) goto LAB_00187f87;
              pfVar2 = (float *)((long)pAVar13 + lVar72 + -4);
              auVar21._4_4_ = -(uint)(pfVar2[1] != 0.0);
              auVar21._0_4_ = -(uint)(*pfVar2 != 0.0);
              auVar21._8_4_ = -(uint)(pfVar2[2] != 0.0);
              auVar21._12_4_ = -(uint)(pfVar2[3] != 0.0);
              uVar73 = movmskps(uVar73,auVar21);
              if ((((bVar10 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) || ((uVar73 & 4) != 0))
              goto LAB_00187f87;
              bVar67 = ((byte)uVar73 & 8) >> 3;
              uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67);
              uVar68 = (ulong)uVar73;
              if ((bVar67 != 0) ||
                 ((bVar10 != false &&
                  ((fVar77 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar72 + 0xc),
                   fVar77 != 1.0 || (NAN(fVar77))))))) goto LAB_00187f87;
              fVar78 = *pfVar1;
              local_178 = pfVar1[1];
              fVar79 = pfVar1[2];
              fVar128 = pfVar1[3];
              fVar77 = pfVar1[4];
              fVar118 = pfVar1[5];
              fVar111 = pfVar1[6];
              fVar122 = pfVar1[7];
              fVar101 = pfVar1[8];
              fVar103 = pfVar1[9];
              fVar92 = pfVar1[10];
              fVar107 = pfVar1[0xb];
              fVar113 = pfVar1[0xc];
              fVar126 = pfVar1[0xd];
              fVar127 = pfVar1[0xe];
              fVar106 = pfVar1[0xf];
              local_138.l.vy.field_0._8_1_ = bVar56;
            }
LAB_001886a3:
            pfVar1 = (float *)((long)&((Vector *)(local_138.l.vy.field_0._0_8_ + -0x30))->field_0 +
                              lVar72);
            *pfVar1 = fVar78;
            pfVar1[1] = local_178;
            pfVar1[2] = fVar79;
            pfVar1[3] = fVar128;
            pfVar1 = (float *)((long)&((Vector *)(local_138.l.vy.field_0._0_8_ + -0x20))->field_0 +
                              lVar72);
            *pfVar1 = fVar77;
            pfVar1[1] = fVar118;
            pfVar1[2] = fVar111;
            pfVar1[3] = fVar122;
            pfVar1 = (float *)((long)&((Vector *)(local_138.l.vy.field_0._0_8_ + -0x10))->field_0 +
                              lVar72);
            *pfVar1 = fVar101;
            pfVar1[1] = fVar103;
            pfVar1[2] = fVar92;
            pfVar1[3] = fVar107;
            pfVar1 = (float *)(local_138.l.vy.field_0._0_8_ + lVar72);
            *pfVar1 = fVar113;
            pfVar1[1] = fVar126;
            pfVar1[2] = fVar127;
            pfVar1[3] = fVar106;
            lVar72 = lVar72 + 0x40;
            uVar60 = local_138.l.vy.field_0._0_8_;
          }
        }
        else {
          if (sVar12 != plVar58[0xf]) {
            prVar64 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar64,"number of transformations does not match");
            __cxa_throw(prVar64,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          fVar77 = (pTVar63->time_range).lower;
          fVar79 = (pTVar63->time_range).upper;
          fVar101 = (float)plVar58[0xd];
          fVar103 = (float)((ulong)plVar58[0xd] >> 0x20);
          uVar73 = -(uint)(fVar77 < fVar101);
          uVar75 = -(uint)(fVar79 < fVar103);
          local_148._0_8_ =
               CONCAT44(~uVar75 & (uint)fVar103,~uVar73 & (uint)fVar77) |
               CONCAT44((uint)fVar79 & uVar75,(uint)fVar101 & uVar73);
          local_138.l.vy.field_0._0_8_ = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
          local_138.l.vx.field_0._0_8_ = 0;
          local_138.l.vx.field_0._8_8_ = 0;
          if (sVar12 != 0) {
            local_138.l.vy.field_0._0_8_ = alignedMalloc(sVar12 << 6,0x10);
            uVar68 = extraout_RDX_07;
            local_138.l.vx.field_0._8_8_ = sVar12;
          }
          uVar60 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
          if (pTVar63->quaternion == false) {
            uVar60 = ZEXT48(*(uint *)(plVar58 + 0x12));
          }
          local_138.l.vy.field_0._8_1_ = (undefined1)uVar60;
          local_138.l.vx.field_0._0_8_ = local_138.l.vx.field_0._8_8_;
          for (uVar69 = 0; uVar73 = (uint)uVar68, uVar69 < (pTVar63->spaces).size_active;
              uVar69 = uVar69 + 1) {
            pAVar13 = (pTVar63->spaces).items;
            lVar59 = plVar58[0x11];
            bVar10 = pTVar63->quaternion;
            uVar65 = (undefined7)((ulong)uVar60 >> 8);
            uVar61 = CONCAT71(uVar65,bVar10);
            bVar56 = *(byte *)(plVar58 + 0x12);
            local_138.l.vy.field_0._8_1_ = 0;
            fVar77 = *(float *)((long)pAVar13 + lVar72 + -0x30);
            uVar60 = *(undefined8 *)((long)pAVar13 + lVar72 + -0x2c);
            fVar79 = (float)((ulong)uVar60 >> 0x20);
            local_178 = (float)uVar60;
            if ((((fVar77 != 1.0) || (NAN(fVar77))) || (local_178 != 0.0)) ||
               (((NAN(local_178) || (fVar79 != 0.0)) || (NAN(fVar79))))) {
LAB_00188bd7:
              uVar60 = *(undefined8 *)(lVar59 + -0x30 + lVar72);
              fVar101 = (float)uVar60;
              fVar103 = (float)((ulong)uVar60 >> 0x20);
              iVar74 = -(uint)(fVar101 != 1.0);
              iVar76 = -(uint)(fVar103 != 0.0);
              auVar85._4_4_ = iVar76;
              auVar85._0_4_ = iVar74;
              auVar85._8_4_ = iVar76;
              auVar85._12_4_ = iVar76;
              auVar84._8_8_ = auVar85._8_8_;
              auVar84._4_4_ = iVar74;
              auVar84._0_4_ = iVar74;
              uVar73 = movmskpd(uVar73,auVar84);
              fVar77 = *(float *)(lVar59 + -0x28 + lVar72);
              if (((((uVar73 & 1) == 0) && (bVar67 = (byte)uVar73 >> 1, bVar67 == 0)) &&
                  (fVar77 == 0.0)) && (!NAN(fVar77))) {
                pfVar1 = (float *)(lVar59 + -0x24 + lVar72);
                auVar44._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar44._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar44._8_4_ = -(uint)(pfVar1[2] != 1.0);
                auVar44._12_4_ = -(uint)(pfVar1[3] != 0.0);
                uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar67),auVar44);
                if ((((bVar56 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                   (((uVar73 & 4) == 0 && (bVar67 = ((byte)uVar73 & 8) >> 3, bVar67 == 0)))) {
                  pfVar1 = (float *)(lVar59 + -0x14 + lVar72);
                  auVar45._4_4_ = -(uint)(pfVar1[1] != 0.0);
                  auVar45._0_4_ = -(uint)(*pfVar1 != 0.0);
                  auVar45._8_4_ = -(uint)(pfVar1[2] != 0.0);
                  auVar45._12_4_ = -(uint)(pfVar1[3] != 1.0);
                  uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar67),auVar45);
                  if ((((bVar56 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                     (((uVar73 & 4) == 0 && (bVar67 = ((byte)uVar73 & 8) >> 3, bVar67 == 0)))) {
                    pfVar1 = (float *)(lVar59 + -4 + lVar72);
                    auVar46._4_4_ = -(uint)(pfVar1[1] != 0.0);
                    auVar46._0_4_ = -(uint)(*pfVar1 != 0.0);
                    auVar46._8_4_ = -(uint)(pfVar1[2] != 0.0);
                    auVar46._12_4_ = -(uint)(pfVar1[3] != 0.0);
                    uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar67),auVar46);
                    if ((((((bVar56 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                         ((uVar73 & 4) == 0)) &&
                        (bVar67 = ((byte)uVar73 & 8) >> 3,
                        uVar68 = (ulong)CONCAT31((int3)(uVar73 >> 8),bVar67), bVar67 == 0)) &&
                       ((bVar56 == 0 ||
                        ((fVar78 = *(float *)(lVar59 + 0xc + lVar72), fVar78 == 1.0 &&
                         (!NAN(fVar78))))))) {
                      pfVar1 = (float *)((long)pAVar13 + lVar72 + -0x30);
                      fVar78 = *pfVar1;
                      local_178 = pfVar1[1];
                      fVar79 = pfVar1[2];
                      fVar128 = pfVar1[3];
                      pfVar1 = (float *)((long)pAVar13 + lVar72 + -0x20);
                      fVar77 = *pfVar1;
                      fVar118 = pfVar1[1];
                      fVar111 = pfVar1[2];
                      fVar122 = pfVar1[3];
                      pfVar1 = (float *)((long)pAVar13 + lVar72 + -0x10);
                      fVar101 = *pfVar1;
                      fVar103 = pfVar1[1];
                      fVar92 = pfVar1[2];
                      fVar107 = pfVar1[3];
                      pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar72);
                      fVar113 = *pfVar1;
                      fVar126 = pfVar1[1];
                      fVar127 = pfVar1[2];
                      fVar106 = pfVar1[3];
                      local_138.l.vy.field_0._8_1_ = bVar10;
                      goto LAB_0018930a;
                    }
                  }
                }
              }
              uVar68 = uVar61 & 0xffffffff;
              bVar67 = (byte)uVar68 | bVar56;
              uVar68 = CONCAT71((int7)(uVar68 >> 8),bVar67);
              if (bVar67 == 0) {
                pfVar1 = (float *)((long)pAVar13 + lVar72 + -0x30);
                fVar127 = *pfVar1;
                fVar130 = pfVar1[1];
                fVar136 = pfVar1[2];
                fVar139 = pfVar1[3];
                pfVar1 = (float *)((long)pAVar13 + lVar72 + -0x20);
                fVar93 = *pfVar1;
                fVar94 = pfVar1[1];
                fVar95 = pfVar1[2];
                fVar96 = pfVar1[3];
                pfVar1 = (float *)((long)pAVar13 + lVar72 + -0x10);
                fVar97 = *pfVar1;
                fVar98 = pfVar1[1];
                fVar99 = pfVar1[2];
                fVar132 = pfVar1[3];
                fVar78 = fVar101 * fVar127 + fVar103 * fVar93 + fVar77 * fVar97;
                local_178 = fVar101 * fVar130 + fVar103 * fVar94 + fVar77 * fVar98;
                fVar79 = fVar101 * fVar136 + fVar103 * fVar95 + fVar77 * fVar99;
                fVar128 = fVar101 * fVar139 + fVar103 * fVar96 + fVar77 * fVar132;
                fVar101 = *(float *)(lVar59 + -0x20 + lVar72);
                fVar103 = *(float *)(lVar59 + -0x1c + lVar72);
                fVar122 = *(float *)(lVar59 + -0x18 + lVar72);
                fVar107 = *(float *)(lVar59 + -0x10 + lVar72);
                fVar77 = fVar101 * fVar127 + fVar103 * fVar93 + fVar122 * fVar97;
                fVar118 = fVar101 * fVar130 + fVar103 * fVar94 + fVar122 * fVar98;
                fVar111 = fVar101 * fVar136 + fVar103 * fVar95 + fVar122 * fVar99;
                fVar122 = fVar101 * fVar139 + fVar103 * fVar96 + fVar122 * fVar132;
                fVar113 = *(float *)(lVar59 + -0xc + lVar72);
                fVar126 = *(float *)(lVar59 + -8 + lVar72);
                fVar101 = fVar107 * fVar127 + fVar113 * fVar93 + fVar126 * fVar97;
                fVar103 = fVar107 * fVar130 + fVar113 * fVar94 + fVar126 * fVar98;
                fVar92 = fVar107 * fVar136 + fVar113 * fVar95 + fVar126 * fVar99;
                fVar107 = fVar107 * fVar139 + fVar113 * fVar96 + fVar126 * fVar132;
                fVar106 = *(float *)(lVar59 + lVar72);
                fVar6 = *(float *)(lVar59 + 4 + lVar72);
                fVar129 = *(float *)(lVar59 + 8 + lVar72);
                pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar72);
                fVar113 = fVar106 * fVar127 + fVar6 * fVar93 + fVar129 * fVar97 + *pfVar1;
                fVar126 = fVar106 * fVar130 + fVar6 * fVar94 + fVar129 * fVar98 + pfVar1[1];
                fVar127 = fVar106 * fVar136 + fVar6 * fVar95 + fVar129 * fVar99 + pfVar1[2];
                fVar106 = fVar106 * fVar139 + fVar6 * fVar96 + fVar129 * fVar132 + pfVar1[3];
              }
              else {
                uVar61 = uVar61 & 0xffffffff;
                bVar67 = (byte)uVar61 & bVar56;
                uVar68 = CONCAT71((int7)(uVar61 >> 8),bVar67);
                if (bVar67 == 1) {
                  poVar62 = std::operator<<((ostream *)&std::cout,
                                            "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                           );
                  std::endl<char,std::char_traits<char>>(poVar62);
                  fVar77 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar72 + 0xc);
                  fVar79 = *(float *)((long)pAVar13 + lVar72 + -0x24);
                  fVar101 = *(float *)((long)pAVar13 + lVar72 + -0x14);
                  fVar103 = *(float *)((long)pAVar13 + lVar72 + -4);
                  auVar9 = *(undefined1 (*) [16])((long)pAVar13 + lVar72 + -0x30);
                  pfVar2 = (float *)((long)pAVar13 + lVar72 + -0x20);
                  fVar78 = *pfVar2;
                  fVar128 = pfVar2[1];
                  pfVar1 = (float *)((long)pAVar13 + lVar72 + -0x10);
                  fVar118 = *pfVar1;
                  fVar111 = pfVar1[1];
                  fVar122 = pfVar1[2];
                  fVar130 = fVar79 * fVar101 + fVar77 * fVar103;
                  fVar107 = fVar79 * fVar101 - fVar77 * fVar103;
                  fVar113 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar101 * fVar101 +
                            -fVar103 * fVar103;
                  fVar126 = fVar77 * fVar77 - fVar79 * fVar79;
                  fVar127 = fVar101 * fVar101 + fVar126 + -fVar103 * fVar103;
                  fVar139 = fVar79 * fVar103 - fVar77 * fVar101;
                  fVar92 = fVar77 * fVar101 + fVar79 * fVar103;
                  fVar136 = fVar101 * fVar103 + fVar77 * fVar79;
                  fVar77 = fVar101 * fVar103 - fVar77 * fVar79;
                  pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar72);
                  fVar106 = *pfVar1;
                  fVar6 = pfVar1[1];
                  fVar129 = pfVar1[2];
                  fVar130 = fVar130 + fVar130;
                  fVar139 = fVar139 + fVar139;
                  fVar107 = fVar107 + fVar107;
                  fVar136 = fVar136 + fVar136;
                  fVar92 = fVar92 + fVar92;
                  fVar77 = fVar77 + fVar77;
                  fVar79 = fVar103 * fVar103 + fVar126 + -fVar101 * fVar101;
                  fVar114 = fVar113 * 1.0 + fVar130 * 0.0 + fVar139 * 0.0;
                  fVar116 = fVar113 * 0.0 + fVar130 * 1.0 + fVar139 * 0.0;
                  fVar119 = fVar113 * 0.0 + fVar130 * 0.0 + fVar139 * 1.0;
                  fVar121 = fVar113 * 0.0 + fVar130 * 0.0 + fVar139 * 0.0;
                  fVar108 = fVar107 * 1.0 + fVar127 * 0.0 + fVar136 * 0.0;
                  fVar109 = fVar107 * 0.0 + fVar127 * 1.0 + fVar136 * 0.0;
                  fVar110 = fVar107 * 0.0 + fVar127 * 0.0 + fVar136 * 1.0;
                  fVar112 = fVar107 * 0.0 + fVar127 * 0.0 + fVar136 * 0.0;
                  fVar127 = fVar92 * 1.0 + fVar77 * 0.0 + fVar79 * 0.0;
                  fVar93 = fVar92 * 0.0 + fVar77 * 1.0 + fVar79 * 0.0;
                  fVar95 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 1.0;
                  fVar97 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 0.0;
                  local_168 = auVar9._4_4_;
                  fStack_164 = auVar9._8_4_;
                  local_178 = auVar9._0_4_;
                  fVar131 = local_178 * fVar114 + fVar108 * 0.0 + fVar127 * 0.0;
                  fVar133 = local_178 * fVar116 + fVar109 * 0.0 + fVar93 * 0.0;
                  fVar134 = local_178 * fVar119 + fVar110 * 0.0 + fVar95 * 0.0;
                  fVar135 = local_178 * fVar121 + fVar112 * 0.0 + fVar97 * 0.0;
                  fVar139 = fVar78 * fVar114 + fVar128 * fVar108 + fVar127 * 0.0;
                  fVar94 = fVar78 * fVar116 + fVar128 * fVar109 + fVar93 * 0.0;
                  fVar96 = fVar78 * fVar119 + fVar128 * fVar110 + fVar95 * 0.0;
                  fVar98 = fVar78 * fVar121 + fVar128 * fVar112 + fVar97 * 0.0;
                  fVar113 = fVar118 * fVar114 + fVar111 * fVar108 + fVar122 * fVar127;
                  fVar126 = fVar118 * fVar116 + fVar111 * fVar109 + fVar122 * fVar93;
                  fVar130 = fVar118 * fVar119 + fVar111 * fVar110 + fVar122 * fVar95;
                  fVar136 = fVar118 * fVar121 + fVar111 * fVar112 + fVar122 * fVar97;
                  fVar77 = *(float *)(lVar59 + 0xc + lVar72);
                  fVar79 = *(float *)(lVar59 + -0x24 + lVar72);
                  fVar101 = *(float *)(lVar59 + -0x14 + lVar72);
                  fVar103 = *(float *)(lVar59 + -4 + lVar72);
                  fVar132 = fVar79 * fVar101 + fVar77 * fVar103;
                  fVar107 = fVar79 * fVar101 - fVar77 * fVar103;
                  fVar99 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar101 * fVar101 +
                           -fVar103 * fVar103;
                  fVar128 = fVar77 * fVar77 - fVar79 * fVar79;
                  fVar138 = fVar101 * fVar101 + fVar128 + -fVar103 * fVar103;
                  fVar137 = fVar79 * fVar103 - fVar77 * fVar101;
                  fVar104 = fVar77 * fVar101 + fVar79 * fVar103;
                  fVar140 = fVar101 * fVar103 + fVar77 * fVar79;
                  fVar92 = fVar101 * fVar103 - fVar77 * fVar79;
                  pfVar3 = (float *)(lVar59 + -0x30 + lVar72);
                  fVar77 = *pfVar3;
                  pfVar4 = (float *)(lVar59 + -0x20 + lVar72);
                  fVar79 = *pfVar4;
                  fVar78 = pfVar4[1];
                  fVar123 = fVar103 * fVar103 + fVar128 + -fVar101 * fVar101;
                  pfVar1 = (float *)(lVar59 + -0x10 + lVar72);
                  fVar101 = *pfVar1;
                  fVar103 = pfVar1[1];
                  fVar128 = pfVar1[2];
                  fVar132 = fVar132 + fVar132;
                  fVar137 = fVar137 + fVar137;
                  pfVar1 = (float *)(lVar59 + lVar72);
                  fVar118 = *pfVar1;
                  fVar111 = pfVar1[1];
                  fVar122 = pfVar1[2];
                  fVar100 = fVar99 * 1.0 + fVar132 * 0.0 + fVar137 * 0.0;
                  fVar102 = fVar99 * 0.0 + fVar132 * 1.0 + fVar137 * 0.0;
                  fVar137 = fVar99 * 0.0 + fVar132 * 0.0 + fVar137 * 1.0;
                  fVar107 = fVar107 + fVar107;
                  fVar140 = fVar140 + fVar140;
                  fVar104 = fVar104 + fVar104;
                  fVar92 = fVar92 + fVar92;
                  fVar99 = fVar107 * 1.0 + fVar138 * 0.0 + fVar140 * 0.0;
                  fVar132 = fVar107 * 0.0 + fVar138 * 1.0 + fVar140 * 0.0;
                  fVar107 = fVar107 * 0.0 + fVar138 * 0.0 + fVar140 * 1.0;
                  fVar138 = fVar104 * 1.0 + fVar92 * 0.0 + fVar123 * 0.0;
                  fVar140 = fVar104 * 0.0 + fVar92 * 1.0 + fVar123 * 0.0;
                  fVar92 = fVar104 * 0.0 + fVar92 * 0.0 + fVar123 * 1.0;
                  fVar115 = fVar77 * fVar100 + fVar99 * 0.0 + fVar138 * 0.0;
                  fVar117 = fVar77 * fVar102 + fVar132 * 0.0 + fVar140 * 0.0;
                  fVar120 = fVar77 * fVar137 + fVar107 * 0.0 + fVar92 * 0.0;
                  fVar104 = fVar79 * fVar100 + fVar78 * fVar99 + fVar138 * 0.0;
                  fVar123 = fVar79 * fVar102 + fVar78 * fVar132 + fVar140 * 0.0;
                  fVar105 = fVar79 * fVar137 + fVar78 * fVar107 + fVar92 * 0.0;
                  fVar124 = fVar101 * fVar100 + fVar103 * fVar99 + fVar128 * fVar138;
                  fVar125 = fVar101 * fVar102 + fVar103 * fVar132 + fVar128 * fVar140;
                  fVar128 = fVar101 * fVar137 + fVar103 * fVar107 + fVar128 * fVar92;
                  fVar99 = fVar118 * fVar100 + fVar111 * fVar99 + fVar122 * fVar138 +
                           pfVar3[1] + 0.0;
                  fVar132 = fVar118 * fVar102 + fVar111 * fVar132 + fVar122 * fVar140 +
                            pfVar3[2] + 0.0;
                  fVar111 = fVar118 * fVar137 + fVar111 * fVar107 + fVar122 * fVar92 +
                            pfVar4[2] + 0.0;
                  fVar78 = fVar115 * fVar131 + fVar117 * fVar139 + fVar120 * fVar113;
                  local_178 = fVar115 * fVar133 + fVar117 * fVar94 + fVar120 * fVar126;
                  fVar79 = fVar115 * fVar134 + fVar117 * fVar96 + fVar120 * fVar130;
                  fVar77 = fVar104 * fVar131 + fVar123 * fVar139 + fVar105 * fVar113;
                  fVar118 = fVar104 * fVar133 + fVar123 * fVar94 + fVar105 * fVar126;
                  fVar101 = fVar124 * fVar131 + fVar125 * fVar139 + fVar128 * fVar113;
                  fVar103 = fVar124 * fVar133 + fVar125 * fVar94 + fVar128 * fVar126;
                  fVar92 = fVar124 * fVar134 + fVar125 * fVar96 + fVar128 * fVar130;
                  uVar68 = extraout_RDX_08;
                  fVar107 = fVar124 * fVar135 + fVar125 * fVar98 + fVar128 * fVar136;
                  fVar128 = fVar115 * fVar135 + fVar117 * fVar98 + fVar120 * fVar136;
                  fVar113 = fVar99 * fVar131 + fVar132 * fVar139 + fVar111 * fVar113 +
                            fVar106 * fVar114 + fVar6 * fVar108 + fVar129 * fVar127 +
                            local_168 + 0.0;
                  fVar126 = fVar99 * fVar133 + fVar132 * fVar94 + fVar111 * fVar126 +
                            fVar106 * fVar116 + fVar6 * fVar109 + fVar129 * fVar93 +
                            fStack_164 + 0.0;
                  fVar127 = fVar99 * fVar134 + fVar132 * fVar96 + fVar111 * fVar130 +
                            fVar106 * fVar119 + fVar6 * fVar110 + fVar129 * fVar95 + pfVar2[2] + 0.0
                  ;
                  fVar106 = fVar99 * fVar135 + fVar132 * fVar98 + fVar111 * fVar136 +
                            fVar106 * fVar121 + fVar6 * fVar112 + fVar129 * fVar97 + 0.0;
                  fVar111 = fVar104 * fVar134 + fVar123 * fVar96 + fVar105 * fVar130;
                  fVar122 = fVar104 * fVar135 + fVar123 * fVar98 + fVar105 * fVar136;
                }
                else {
                  bVar56 = bVar10 ^ 1U | bVar56;
                  if (bVar56 == 0) {
                    local_d8 = ZEXT416(*(uint *)((long)&(pAVar13->l).vx.field_0 + lVar72 + 0xc));
                    local_b8 = ZEXT416(*(uint *)((long)pAVar13 + lVar72 + -0x24));
                    local_a8 = ZEXT416(*(uint *)((long)pAVar13 + lVar72 + -0x14));
                    local_e8 = ZEXT416(*(uint *)((long)pAVar13 + lVar72 + -4));
                    pfVar1 = (float *)((long)pAVar13 + lVar72 + -0x20);
                    local_138.p.field_0.m128[0] = *pfVar1;
                    local_138.p.field_0.m128[1] = pfVar1[1];
                    fStack_c0 = pfVar1[2];
                    local_138.p.field_0.m128[3] = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar13 + lVar72 + -0x10);
                    local_f8 = *pfVar1;
                    fStack_f4 = pfVar1[1];
                    fStack_f0 = pfVar1[2];
                    fStack_ec = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar13 + lVar72 + -0x30);
                    local_88 = *pfVar1;
                    fStack_7c = pfVar1[1];
                    pfVar1 = (float *)(lVar59 + -0x30 + lVar72);
                    fVar77 = *pfVar1;
                    fVar101 = pfVar1[1];
                    fVar103 = pfVar1[2];
                    pfVar1 = (float *)(lVar59 + -0x20 + lVar72);
                    fVar128 = *pfVar1;
                    fVar111 = pfVar1[1];
                    fVar122 = pfVar1[2];
                    puVar71 = (undefined8 *)(lVar59 + -0x10 + lVar72);
                    local_138.l.vz.field_0._0_8_ = *puVar71;
                    local_138.l.vz.field_0._8_8_ = puVar71[1];
                    pfVar1 = (float *)(lVar59 + lVar72);
                    fVar92 = *pfVar1;
                    fVar107 = pfVar1[1];
                    fVar113 = pfVar1[2];
                    fVar78 = fVar77 * local_88 +
                             fVar101 * local_138.p.field_0.m128[0] + fVar103 * local_f8;
                    fVar126 = fVar77 * 0.0 +
                              fVar101 * local_138.p.field_0.m128[1] + fVar103 * fStack_f4;
                    fVar103 = fVar77 * 0.0 + fVar101 * 0.0 + fVar103 * fStack_f0;
                    fVar77 = fVar128 * local_88 +
                             fVar111 * local_138.p.field_0.m128[0] + fVar122 * local_f8;
                    fVar118 = fVar128 * 0.0 +
                              fVar111 * local_138.p.field_0.m128[1] + fVar122 * fStack_f4;
                    fVar101 = fVar128 * 0.0 + fVar111 * 0.0 + fVar122 * fStack_f0;
                    local_138.p.field_0.m128[2] = 0.0;
                    fStack_84 = 0.0;
                    fStack_80 = 0.0;
                    pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar72);
                    local_98._0_4_ =
                         fVar92 * local_88 +
                         fVar107 * local_138.p.field_0.m128[0] + fVar113 * local_f8 + *pfVar1;
                    local_98._4_4_ =
                         fVar92 * 0.0 + fVar107 * local_138.p.field_0.m128[1] + fVar113 * fStack_f4
                         + pfVar1[1];
                    fStack_90 = fVar92 * 0.0 + fVar107 * 0.0 + fVar113 * fStack_f0 + pfVar1[2];
                    register0x0000128c =
                         fVar92 * fStack_7c +
                         fVar107 * local_138.p.field_0.m128[3] + fVar113 * fStack_ec + pfVar1[3];
                    local_c8 = local_138.p.field_0.m128[0];
                    fStack_c4 = local_138.p.field_0.m128[1];
                    fStack_bc = local_138.p.field_0.m128[3];
                    if (((fVar126 != 0.0) || (NAN(fVar126))) ||
                       ((fVar103 != 0.0 || (((NAN(fVar103) || (fVar101 != 0.0)) || (NAN(fVar101)))))
                       )) {
                      poVar62 = std::operator<<((ostream *)&std::cout,
                                                "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                               );
                      std::endl<char,std::char_traits<char>>(poVar62);
                      uVar68 = extraout_RDX_10;
                    }
                    fVar101 = local_88 * local_138.l.vz.field_0.m128[0] +
                              local_138.p.field_0.m128[0] * local_138.l.vz.field_0.m128[1] +
                              local_f8 * local_138.l.vz.field_0.m128[2];
                    fVar103 = fStack_84 * local_138.l.vz.field_0.m128[0] +
                              local_138.p.field_0.m128[1] * local_138.l.vz.field_0.m128[1] +
                              fStack_f4 * local_138.l.vz.field_0.m128[2];
                    fVar92 = fStack_80 * local_138.l.vz.field_0.m128[0] +
                             local_138.p.field_0.m128[2] * local_138.l.vz.field_0.m128[1] +
                             fStack_f0 * local_138.l.vz.field_0.m128[2];
                    local_138.l.vy.field_0._8_1_ = 1;
                    fVar107 = (float)local_e8._0_4_;
                    fVar128 = (float)local_b8._0_4_;
                    fVar113 = (float)local_98._0_4_;
                    fVar126 = (float)local_98._4_4_;
                    fVar127 = fStack_90;
                    fVar106 = (float)local_d8._0_4_;
                    fVar111 = fStack_c0;
                    fVar122 = (float)local_a8._0_4_;
                  }
                  else {
                    if (((local_178 != 0.0) || (NAN(local_178))) ||
                       ((fVar79 != 0.0 ||
                        ((NAN(fVar79) ||
                         (uVar60 = *(undefined8 *)((long)pAVar13 + lVar72 + -0x10),
                         auVar26._4_4_ = -(uint)(*(float *)((long)pAVar13 + lVar72 + -0x20) != 0.0),
                         auVar26._0_4_ = -(uint)(*(float *)((long)pAVar13 + lVar72 + -0x18) != 0.0),
                         auVar26._8_4_ = -(uint)((float)uVar60 != 0.0),
                         auVar26._12_4_ = -(uint)((float)((ulong)uVar60 >> 0x20) != 0.0),
                         uVar57 = movmskps((int)CONCAT71(uVar65,bVar56),auVar26),
                         (char)uVar57 != '\0')))))) {
                      poVar62 = std::operator<<((ostream *)&std::cout,
                                                "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                               );
                      std::endl<char,std::char_traits<char>>(poVar62);
                      uVar68 = extraout_RDX_09;
                    }
                    pfVar2 = (float *)(lVar59 + -0x30 + lVar72);
                    pfVar3 = (float *)(lVar59 + -0x20 + lVar72);
                    fVar77 = *pfVar3;
                    pfVar4 = (float *)(lVar59 + -0x10 + lVar72);
                    fVar101 = *pfVar4;
                    fVar103 = pfVar4[1];
                    pfVar1 = (float *)(lVar59 + lVar72);
                    uVar60 = *(undefined8 *)((long)&(pAVar13->l).vx.field_0 + lVar72);
                    fVar78 = *(float *)((long)pAVar13 + lVar72 + -0x30) * *pfVar2;
                    local_178 = pfVar2[1] + (float)uVar60;
                    fVar79 = pfVar2[2] + (float)((ulong)uVar60 >> 0x20);
                    fVar118 = pfVar3[1] * *(float *)((long)pAVar13 + lVar72 + -0x1c);
                    fVar92 = pfVar4[2] * *(float *)((long)pAVar13 + lVar72 + -8);
                    local_138.l.vy.field_0._8_1_ = 1;
                    fVar107 = pfVar4[3];
                    fVar128 = pfVar2[3];
                    fVar113 = *pfVar1;
                    fVar126 = pfVar1[1];
                    fVar127 = pfVar1[2];
                    fVar106 = pfVar1[3];
                    fVar111 = pfVar3[2] + *(float *)((long)&(pAVar13->l).vx.field_0 + lVar72 + 8);
                    fVar122 = pfVar3[3];
                  }
                }
              }
            }
            else {
              pfVar1 = (float *)((long)pAVar13 + lVar72 + -0x24);
              auVar23._4_4_ = -(uint)(pfVar1[1] != 0.0);
              auVar23._0_4_ = -(uint)(*pfVar1 != 0.0);
              auVar23._8_4_ = -(uint)(pfVar1[2] != 1.0);
              auVar23._12_4_ = -(uint)(pfVar1[3] != 0.0);
              uVar73 = movmskps(uVar73,auVar23);
              if ((((bVar10 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) ||
                 (((uVar73 & 4) != 0 ||
                  (bVar67 = ((byte)uVar73 & 8) >> 3, uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67),
                  bVar67 != 0)))) goto LAB_00188bd7;
              pfVar1 = (float *)((long)pAVar13 + lVar72 + -0x14);
              auVar24._4_4_ = -(uint)(pfVar1[1] != 0.0);
              auVar24._0_4_ = -(uint)(*pfVar1 != 0.0);
              auVar24._8_4_ = -(uint)(pfVar1[2] != 0.0);
              auVar24._12_4_ = -(uint)(pfVar1[3] != 1.0);
              uVar73 = movmskps(uVar73,auVar24);
              if (((((bVar10 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) || ((uVar73 & 4) != 0))
                 || (bVar67 = ((byte)uVar73 & 8) >> 3, uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67)
                    , bVar67 != 0)) goto LAB_00188bd7;
              pfVar1 = (float *)((long)pAVar13 + lVar72 + -4);
              auVar25._4_4_ = -(uint)(pfVar1[1] != 0.0);
              auVar25._0_4_ = -(uint)(*pfVar1 != 0.0);
              auVar25._8_4_ = -(uint)(pfVar1[2] != 0.0);
              auVar25._12_4_ = -(uint)(pfVar1[3] != 0.0);
              uVar73 = movmskps(uVar73,auVar25);
              if ((((bVar10 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) || ((uVar73 & 4) != 0))
              goto LAB_00188bd7;
              bVar67 = ((byte)uVar73 & 8) >> 3;
              uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar67);
              uVar68 = (ulong)uVar73;
              if ((bVar67 != 0) ||
                 ((bVar10 != false &&
                  ((fVar77 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar72 + 0xc),
                   fVar77 != 1.0 || (NAN(fVar77))))))) goto LAB_00188bd7;
              pfVar1 = (float *)(lVar59 + -0x30 + lVar72);
              fVar78 = *pfVar1;
              local_178 = pfVar1[1];
              fVar79 = pfVar1[2];
              fVar128 = pfVar1[3];
              pfVar1 = (float *)(lVar59 + -0x20 + lVar72);
              fVar77 = *pfVar1;
              fVar118 = pfVar1[1];
              fVar111 = pfVar1[2];
              fVar122 = pfVar1[3];
              pfVar1 = (float *)(lVar59 + -0x10 + lVar72);
              fVar101 = *pfVar1;
              fVar103 = pfVar1[1];
              fVar92 = pfVar1[2];
              fVar107 = pfVar1[3];
              pfVar1 = (float *)(lVar59 + lVar72);
              fVar113 = *pfVar1;
              fVar126 = pfVar1[1];
              fVar127 = pfVar1[2];
              fVar106 = pfVar1[3];
              local_138.l.vy.field_0._8_1_ = bVar56;
            }
LAB_0018930a:
            pfVar1 = (float *)((long)&((Vector *)(local_138.l.vy.field_0._0_8_ + -0x30))->field_0 +
                              lVar72);
            *pfVar1 = fVar78;
            pfVar1[1] = local_178;
            pfVar1[2] = fVar79;
            pfVar1[3] = fVar128;
            pfVar1 = (float *)((long)&((Vector *)(local_138.l.vy.field_0._0_8_ + -0x20))->field_0 +
                              lVar72);
            *pfVar1 = fVar77;
            pfVar1[1] = fVar118;
            pfVar1[2] = fVar111;
            pfVar1[3] = fVar122;
            pfVar1 = (float *)((long)&((Vector *)(local_138.l.vy.field_0._0_8_ + -0x10))->field_0 +
                              lVar72);
            *pfVar1 = fVar101;
            pfVar1[1] = fVar103;
            pfVar1[2] = fVar92;
            pfVar1[3] = fVar107;
            pfVar1 = (float *)(local_138.l.vy.field_0._0_8_ + lVar72);
            *pfVar1 = fVar113;
            pfVar1[1] = fVar126;
            pfVar1[2] = fVar127;
            pfVar1[3] = fVar106;
            lVar72 = lVar72 + 0x40;
            uVar60 = local_138.l.vy.field_0._0_8_;
          }
        }
        convertInstances(local_60,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                   *)local_68,local_70,(Transformations *)local_148);
        SceneGraph::Transformations::~Transformations((Transformations *)local_148);
        uVar69 = local_58 + 1;
      }
      (**(code **)(*plVar58 + 0x18))(plVar58);
    }
  }
  return;
}

Assistant:

void convertInstances(std::vector<Ref<SceneGraph::Node>>& group, const Ref<SceneGraph::Node>& node, const std::vector<SceneGraph::Transformations>& spaces)
    {
      if (node->isClosed()) {
        //if (group.size() % 10000 == 0) std::cout << "." << std::flush;
        group.push_back(new SceneGraph::MultiTransformNode(spaces,lookupGeometries(node)));
      }
      else if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
        for (size_t i = 0; i < spaces.size(); ++i)
          convertInstances(group,xfmNode->child, spaces[i]*xfmNode->spaces);
      }
      else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
        convertInstances(group,xfmNode->child, spaces*xfmNode->spaces);
      }
      else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) {
        for (const auto& child : groupNode->children) convertInstances(group,child,spaces);
      }
    }